

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O3

void compaction_callback_test(bool multi_kv)

{
  undefined1 *puVar1;
  fdb_encryption_key *pfVar2;
  short *psVar3;
  size_t *psVar4;
  fdb_status fVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  fdb_kvs_handle *pfVar9;
  size_t sVar10;
  fdb_kvs_handle *pfVar11;
  size_t sVar12;
  size_t sVar13;
  uint64_t extraout_RAX;
  uint64_t uVar14;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar15;
  __atomic_base<unsigned_long> doc;
  fdb_kvs_handle *pfVar16;
  fdb_kvs_config *kvs_config_00;
  btree *pbVar17;
  fdb_kvs_commit_marker_t *pfVar18;
  fdb_file_info *kvs_config_01;
  fdb_doc **extraout_RDX;
  void *__s2;
  ulong uVar19;
  long lVar20;
  size_t sVar21;
  code *__s;
  list *ptr_handle;
  fdb_kvs_handle **ppfVar22;
  char cVar23;
  uint uVar24;
  fdb_kvs_handle *pfVar25;
  char *pcVar26;
  char *pcVar27;
  fdb_file_info *info;
  undefined7 in_register_00000039;
  fdb_kvs_handle *pfVar28;
  fdb_file_handle *pfVar29;
  fdb_iterator *pfVar30;
  btree *pbVar31;
  undefined1 handle [8];
  btree_kv_ops *pbVar32;
  __atomic_base<unsigned_long> _Var33;
  filemgr *ptr_fhandle;
  fdb_config *pfVar34;
  ulong uVar35;
  btree *pbVar36;
  size_t sVar37;
  fdb_doc **ppfVar38;
  timeval tVar39;
  timeval tVar40;
  fdb_kvs_handle *db;
  cb_args cb_args;
  fdb_file_handle *dbfile;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_config fconfig;
  char bodybuf [256];
  char keybuf [256];
  fdb_kvs_handle *pfStack_18f28;
  undefined1 auStack_18f20 [16];
  undefined1 auStack_18f10 [8];
  undefined1 auStack_18f08 [80];
  ulong uStack_18eb8;
  timeval tStack_18e98;
  fdb_file_info afStack_18e88 [3];
  fdb_file_info afStack_18d88 [3];
  fdb_config fStack_18c88;
  filemgr *pfStack_18b90;
  fdb_kvs_handle *pfStack_18b88;
  fdb_kvs_handle *pfStack_18b80;
  fdb_config *pfStack_18b78;
  fdb_kvs_handle *pfStack_18b70;
  fdb_kvs_handle *pfStack_18b68;
  fdb_file_handle *pfStack_18b58;
  fdb_kvs_handle *pfStack_18b50;
  timeval atStack_18b48 [2];
  timeval tStack_18b28;
  timeval tStack_18b18;
  undefined1 auStack_18b08 [70];
  undefined1 uStack_18ac2;
  undefined8 uStack_18ab8;
  filemgr *pfStack_189f8;
  fdb_kvs_handle *pfStack_189f0;
  fdb_kvs_handle *pfStack_189e8;
  filemgr *pfStack_189e0;
  fdb_kvs_handle *pfStack_189d8;
  fdb_kvs_handle *pfStack_189d0;
  undefined1 auStack_189c0 [8];
  undefined1 auStack_189b8 [8];
  undefined1 auStack_189b0 [8];
  undefined1 auStack_189a8 [16];
  undefined1 auStack_18998 [16];
  fdb_kvs_config fStack_18988;
  atomic<unsigned_long> aStack_18970;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_18968;
  __atomic_base<unsigned_long> _Stack_18960;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_18958;
  undefined1 auStack_18950 [8];
  undefined1 auStack_18948 [16];
  undefined1 auStack_18938 [16];
  atomic<unsigned_long> aStack_18928;
  fdb_open_flags fStack_18914;
  ushort uStack_1890a;
  filemgr *pfStack_18900;
  atomic<unsigned_long> aStack_188c0;
  undefined1 auStack_18840 [16];
  timeval tStack_18830;
  undefined1 auStack_18820 [328];
  char acStack_186d8 [256];
  char acStack_185d8 [256];
  fdb_kvs_handle afStack_184d8 [153];
  fdb_kvs_handle *pfStack_4c10;
  fdb_kvs_handle *pfStack_4c08;
  list *plStack_4c00;
  void *pvStack_4bf8;
  fdb_kvs_config fStack_4bf0;
  fdb_kvs_info fStack_4bd8;
  timeval tStack_4ba8;
  fdb_config fStack_4b98;
  char acStack_4aa0 [256];
  fdb_kvs_handle afStack_49a0 [2];
  fdb_kvs_handle **ppfStack_4478;
  fdb_kvs_handle *pfStack_4470;
  fdb_kvs_handle *pfStack_4468;
  fdb_kvs_config *pfStack_4460;
  fdb_kvs_handle *pfStack_4458;
  fdb_kvs_handle *pfStack_4450;
  undefined1 auStack_4438 [16];
  undefined1 auStack_4428 [32];
  fdb_kvs_handle *pfStack_4408;
  fdb_kvs_config fStack_4400;
  fdb_kvs_info fStack_43e8;
  timeval tStack_43b8;
  char acStack_43a8 [256];
  undefined1 auStack_42a8 [752];
  char acStack_3fb8 [256];
  fdb_kvs_handle fStack_3eb8;
  fdb_doc **ppfStack_3cb0;
  fdb_kvs_handle *pfStack_3ca8;
  undefined1 auStack_3c90 [16];
  fdb_doc *pfStack_3c80;
  fdb_kvs_handle *pfStack_3c78;
  fdb_doc *apfStack_3c70 [11];
  timeval tStack_3c18;
  undefined1 auStack_3c08 [536];
  char acStack_39f0 [256];
  stat sStack_38f0;
  fdb_config fStack_3860;
  fdb_kvs_handle **ppfStack_3768;
  fdb_kvs_handle *pfStack_3760;
  fdb_kvs_handle *pfStack_3758;
  fdb_kvs_handle *pfStack_3750;
  btree *pbStack_3748;
  fdb_kvs_handle *pfStack_3740;
  fdb_kvs_handle *pfStack_3730;
  fdb_kvs_handle *pfStack_3728;
  fdb_file_handle *pfStack_3720;
  fdb_kvs_handle *pfStack_3718;
  undefined1 auStack_3710 [32];
  undefined1 auStack_36f0 [40];
  fdb_file_info fStack_36c8;
  fdb_config fStack_3680;
  btree abStack_3588 [4];
  char acStack_3488 [256];
  char acStack_3388 [264];
  code *pcStack_3280;
  fdb_kvs_handle *pfStack_3278;
  fdb_kvs_handle *pfStack_3270;
  char *pcStack_3268;
  char *pcStack_3260;
  fdb_kvs_handle *pfStack_3258;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_3240;
  fdb_file_handle *pfStack_3238;
  fdb_kvs_handle *pfStack_3230;
  int iStack_3224;
  undefined1 auStack_3220 [64];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_31e0;
  fdb_kvs_config fStack_31b8;
  timeval tStack_31a0;
  char acStack_3190 [256];
  fdb_doc *apfStack_3090 [20];
  undefined1 auStack_2ff0 [520];
  undefined8 uStack_2de8;
  undefined8 uStack_2de0;
  undefined4 uStack_2dcc;
  undefined1 uStack_2dc1;
  undefined1 uStack_2db0;
  undefined8 uStack_2d38;
  size_t sStack_2cf8;
  size_t sStack_2cf0;
  fdb_doc **ppfStack_2ce8;
  char *pcStack_2ce0;
  code *pcStack_2cd8;
  code *pcStack_2cd0;
  fdb_file_handle *pfStack_2cb8;
  fdb_snapshot_info_t *pfStack_2cb0;
  uint64_t uStack_2ca8;
  uint uStack_2c9c;
  fdb_kvs_handle *apfStack_2c98 [4];
  fdb_kvs_config fStack_2c78;
  char acStack_2c60 [8];
  timeval tStack_2c58;
  char acStack_2c48 [256];
  char acStack_2b48 [256];
  char acStack_2a48 [264];
  fdb_config fStack_2940;
  fdb_doc *apfStack_2848 [301];
  fdb_kvs_handle **ppfStack_1ee0;
  btree *pbStack_1ed8;
  fdb_kvs_handle *pfStack_1ed0;
  fdb_kvs_handle *pfStack_1ec8;
  btree *pbStack_1ec0;
  fdb_kvs_handle *pfStack_1eb8;
  fdb_kvs_handle *pfStack_1ea0;
  fdb_iterator *pfStack_1e98;
  fdb_kvs_handle *pfStack_1e90;
  undefined1 auStack_1e88 [16];
  undefined1 auStack_1e78 [40];
  btree bStack_1e50;
  fdb_kvs_info fStack_1e08;
  fdb_config fStack_1dd8;
  char acStack_1ce0 [256];
  fdb_kvs_handle fStack_1be0;
  fdb_kvs_handle **ppfStack_19d8;
  btree *pbStack_19d0;
  fdb_kvs_handle *pfStack_19c8;
  fdb_kvs_config *pfStack_19c0;
  fdb_file_handle **ppfStack_19b8;
  fdb_kvs_handle *pfStack_19b0;
  fdb_kvs_handle *pfStack_19a0;
  fdb_file_handle *pfStack_1998;
  fdb_kvs_config fStack_1990;
  timeval tStack_1978;
  fdb_kvs_info fStack_1968;
  char acStack_1938 [264];
  fdb_config fStack_1830;
  char acStack_1738 [256];
  char acStack_1638 [256];
  fdb_doc *apfStack_1538 [101];
  fdb_kvs_handle **ppfStack_1210;
  btree *pbStack_1208;
  fdb_kvs_handle *pfStack_1200;
  fdb_kvs_handle *pfStack_11f8;
  btree *pbStack_11f0;
  fdb_kvs_handle *pfStack_11e8;
  undefined1 auStack_11d0 [16];
  fdb_kvs_handle *pfStack_11c0;
  fdb_kvs_handle *pfStack_11b8;
  btree_kv_ops *pbStack_11b0;
  undefined1 auStack_11a8 [40];
  docio_handle *pdStack_1180;
  timeval tStack_1148;
  fdb_config fStack_1138;
  btree abStack_1040 [4];
  btree abStack_f40 [14];
  fdb_kvs_handle fStack_c20;
  fdb_kvs_handle **ppfStack_918;
  btree *pbStack_910;
  fdb_kvs_handle *pfStack_908;
  fdb_kvs_handle *pfStack_900;
  btree *pbStack_8f8;
  fdb_kvs_handle *pfStack_8f0;
  fdb_kvs_handle *pfStack_8e0;
  fdb_kvs_handle *pfStack_8d8;
  fdb_doc *pfStack_8d0;
  fdb_kvs_handle *pfStack_8c8;
  fdb_file_handle *pfStack_8c0;
  undefined1 auStack_8b8 [32];
  undefined1 auStack_898 [40];
  fdb_file_info fStack_870;
  char acStack_828 [264];
  fdb_config fStack_720;
  fdb_kvs_handle fStack_628;
  fdb_doc **ppfStack_420;
  btree *pbStack_418;
  fdb_kvs_handle *pfStack_410;
  size_t sStack_408;
  fdb_kvs_handle *pfStack_3f8;
  undefined1 auStack_3e0 [24];
  fdb_kvs_handle *pfStack_3c8;
  btree_kv_ops *pbStack_3c0;
  btree *pbStack_3b8;
  char *pcStack_3b0;
  char *pcStack_3a8;
  code *pcStack_3a0;
  fdb_kvs_handle *local_390;
  undefined8 local_388;
  char acStack_380 [2];
  undefined1 auStack_37e [34];
  uint local_35c;
  undefined1 local_358 [40];
  fdb_config local_330;
  btree local_238 [4];
  char local_138 [264];
  
  pcStack_3a0 = (code *)0x10c327;
  gettimeofday((timeval *)(local_358 + 0x18),(__timezone_ptr_t)0x0);
  pcStack_3a0 = (code *)0x10c32c;
  memleak_start();
  pcStack_3a0 = (code *)0x10c339;
  fdb_get_default_config();
  pcStack_3a0 = (code *)0x10c343;
  fdb_get_default_kvs_config();
  local_330.compaction_cb_ctx = &local_388;
  local_388 = 0;
  _acStack_380 = 0;
  auStack_37e._6_8_ = 0;
  local_330.wal_threshold = 0x400;
  local_330.flags = 1;
  local_330.compaction_cb = compaction_cb;
  local_330.compaction_cb_mask = 0x1b;
  pcStack_3a0 = (code *)0x10c38d;
  local_330.multi_kv_instances = multi_kv;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_3a0 = (code *)0x10c3a4;
  fdb_open((fdb_file_handle **)(auStack_37e + 0x16),"./compact_test1",&local_330);
  local_35c = (uint)CONCAT71(in_register_00000039,multi_kv);
  if (local_35c == 0) {
    pcStack_3a0 = (code *)0x10c3d6;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_37e._22_8_,&local_390,(fdb_kvs_config *)local_358);
  }
  else {
    pcStack_3a0 = (code *)0x10c3c5;
    fdb_kvs_open((fdb_file_handle *)auStack_37e._22_8_,&local_390,"db",(fdb_kvs_config *)local_358);
  }
  auStack_37e._6_8_ = local_390;
  pcVar27 = local_138;
  pbVar32 = (btree_kv_ops *)0x14ce76;
  uVar19 = 0;
  do {
    pcStack_3a0 = (code *)0x10c40c;
    sprintf(pcVar27,"key%04d",uVar19);
    pcStack_3a0 = (code *)0x10c41b;
    sprintf((char *)local_238,"body%04d",uVar19);
    pfVar9 = local_390;
    pcStack_3a0 = (code *)0x10c428;
    pcVar7 = (char *)strlen(pcVar27);
    pcStack_3a0 = (code *)0x10c433;
    sVar8 = strlen((char *)local_238);
    pcStack_3a0 = (code *)0x10c447;
    pbVar17 = local_238;
    pcVar26 = pcVar27;
    pfVar11 = pfVar9;
    fVar5 = fdb_set_kv(pfVar9,pcVar27,(size_t)pcVar7,local_238,sVar8);
    if (fVar5 != FDB_RESULT_SUCCESS) {
      pcStack_3a0 = (code *)0x10c8a0;
      compaction_callback_test();
      goto LAB_0010c8a0;
    }
    uVar24 = (int)uVar19 + 1;
    uVar19 = (ulong)uVar24;
  } while (uVar24 != 1000);
  pcVar26 = (char *)0x0;
  pcStack_3a0 = (code *)0x10c465;
  pfVar11 = (fdb_kvs_handle *)auStack_37e._22_8_;
  fVar5 = fdb_commit((fdb_file_handle *)auStack_37e._22_8_,'\0');
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pcVar26 = "./compact_test2";
    pcStack_3a0 = (code *)0x10c47e;
    pfVar11 = (fdb_kvs_handle *)auStack_37e._22_8_;
    fVar5 = fdb_compact((fdb_file_handle *)auStack_37e._22_8_,"./compact_test2");
    uVar24 = local_35c;
    uVar19 = (ulong)local_35c;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010c8a5;
    if ((int)local_388 != 1000) {
      pcStack_3a0 = (code *)0x10c49e;
      compaction_callback_test();
    }
    pcVar7 = acStack_380;
    if (acStack_380[0] == '\0') {
      pcStack_3a0 = (code *)0x10c4b1;
      compaction_callback_test();
    }
    pcVar27 = acStack_380 + 1;
    if (acStack_380[1] == '\0') {
      pcStack_3a0 = (code *)0x10c4c4;
      compaction_callback_test();
    }
    pbVar32 = (btree_kv_ops *)(acStack_380 + 2);
    if (auStack_37e[0] == '\0') {
      pcStack_3a0 = (code *)0x10c4d8;
      compaction_callback_test();
    }
    pfVar9 = (fdb_kvs_handle *)(auStack_37e + 0x16);
    pcStack_3a0 = (code *)0x10c4e5;
    fdb_close((fdb_file_handle *)auStack_37e._22_8_);
    local_388 = 0;
    _acStack_380 = 0;
    auStack_37e._6_8_ = 0;
    local_330.compaction_cb_mask = 0x19;
    pcStack_3a0 = (code *)0x10c511;
    fdb_open((fdb_file_handle **)pfVar9,"./compact_test2",&local_330);
    cVar23 = (char)uVar24;
    if (cVar23 == '\0') {
      pcStack_3a0 = (code *)0x10c540;
      fdb_kvs_open_default
                ((fdb_file_handle *)auStack_37e._22_8_,&local_390,(fdb_kvs_config *)local_358);
    }
    else {
      pbVar17 = (btree *)local_358;
      pcStack_3a0 = (code *)0x10c52f;
      fdb_kvs_open((fdb_file_handle *)auStack_37e._22_8_,&local_390,"db",(fdb_kvs_config *)pbVar17);
    }
    auStack_37e._6_8_ = local_390;
    pcVar26 = "./compact_test3";
    pcStack_3a0 = (code *)0x10c55b;
    pfVar11 = (fdb_kvs_handle *)auStack_37e._22_8_;
    fVar5 = fdb_compact((fdb_file_handle *)auStack_37e._22_8_,"./compact_test3");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010c8aa;
    if ((int)local_388 != 0) {
      pcStack_3a0 = (code *)0x10c574;
      compaction_callback_test();
    }
    if (acStack_380[0] == '\0') {
      pcStack_3a0 = (code *)0x10c583;
      compaction_callback_test();
    }
    if (acStack_380[1] == '\0') {
      pcStack_3a0 = (code *)0x10c592;
      compaction_callback_test();
    }
    if (auStack_37e[0] == '\0') {
      pcStack_3a0 = (code *)0x10c5a1;
      compaction_callback_test();
    }
    pfVar9 = (fdb_kvs_handle *)(auStack_37e + 0x16);
    pcStack_3a0 = (code *)0x10c5ae;
    fdb_close((fdb_file_handle *)auStack_37e._22_8_);
    local_388 = 0;
    _acStack_380 = 0;
    auStack_37e._6_8_ = 0;
    local_330.compaction_cb_mask = 0x13;
    pcStack_3a0 = (code *)0x10c5da;
    fdb_open((fdb_file_handle **)pfVar9,"./compact_test3",&local_330);
    if (cVar23 == '\0') {
      pcStack_3a0 = (code *)0x10c609;
      fdb_kvs_open_default
                ((fdb_file_handle *)auStack_37e._22_8_,&local_390,(fdb_kvs_config *)local_358);
    }
    else {
      pbVar17 = (btree *)local_358;
      pcStack_3a0 = (code *)0x10c5f8;
      fdb_kvs_open((fdb_file_handle *)auStack_37e._22_8_,&local_390,"db",(fdb_kvs_config *)pbVar17);
    }
    auStack_37e._6_8_ = local_390;
    pcVar26 = "./compact_test4";
    pcStack_3a0 = (code *)0x10c624;
    pfVar11 = (fdb_kvs_handle *)auStack_37e._22_8_;
    fVar5 = fdb_compact((fdb_file_handle *)auStack_37e._22_8_,"./compact_test4");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010c8af;
    if ((int)local_388 != 1000) {
      pcStack_3a0 = (code *)0x10c640;
      compaction_callback_test();
    }
    if (acStack_380[0] == '\0') {
      pcStack_3a0 = (code *)0x10c64f;
      compaction_callback_test();
    }
    if (acStack_380[1] == '\0') {
      pcStack_3a0 = (code *)0x10c65e;
      compaction_callback_test();
    }
    if (auStack_37e[0] == '\x01') {
      pcStack_3a0 = (code *)0x10c66d;
      compaction_callback_test();
    }
    pfVar9 = (fdb_kvs_handle *)(auStack_37e + 0x16);
    pcStack_3a0 = (code *)0x10c67a;
    fdb_close((fdb_file_handle *)auStack_37e._22_8_);
    local_388 = 0;
    _acStack_380 = 0;
    auStack_37e._6_8_ = 0;
    local_330.compaction_cb_mask = 10;
    pcStack_3a0 = (code *)0x10c6a6;
    fdb_open((fdb_file_handle **)pfVar9,"./compact_test4",&local_330);
    if (cVar23 == '\0') {
      pcStack_3a0 = (code *)0x10c6d5;
      fdb_kvs_open_default
                ((fdb_file_handle *)auStack_37e._22_8_,&local_390,(fdb_kvs_config *)local_358);
    }
    else {
      pbVar17 = (btree *)local_358;
      pcStack_3a0 = (code *)0x10c6c4;
      fdb_kvs_open((fdb_file_handle *)auStack_37e._22_8_,&local_390,"db",(fdb_kvs_config *)pbVar17);
    }
    auStack_37e._6_8_ = local_390;
    pcVar26 = "./compact_test5";
    pcStack_3a0 = (code *)0x10c6f0;
    pfVar11 = (fdb_kvs_handle *)auStack_37e._22_8_;
    fVar5 = fdb_compact((fdb_file_handle *)auStack_37e._22_8_,"./compact_test5");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010c8b4;
    if ((int)local_388 != 1000) {
      pcStack_3a0 = (code *)0x10c70c;
      compaction_callback_test();
    }
    if (acStack_380[0] == '\x01') {
      pcStack_3a0 = (code *)0x10c71b;
      compaction_callback_test();
    }
    if (acStack_380[1] == '\x01') {
      pcStack_3a0 = (code *)0x10c72a;
      compaction_callback_test();
    }
    if (auStack_37e[0] == '\0') {
      pcStack_3a0 = (code *)0x10c739;
      compaction_callback_test();
    }
    pfVar9 = (fdb_kvs_handle *)(auStack_37e + 0x16);
    pcStack_3a0 = (code *)0x10c746;
    fdb_close((fdb_file_handle *)auStack_37e._22_8_);
    local_388 = 0;
    _acStack_380 = 0;
    auStack_37e._6_8_ = 0;
    local_330.compaction_cb_mask = 4;
    pcStack_3a0 = (code *)0x10c772;
    fdb_open((fdb_file_handle **)pfVar9,"./compact_test5",&local_330);
    if (cVar23 == '\0') {
      pcStack_3a0 = (code *)0x10c7a1;
      fdb_kvs_open_default
                ((fdb_file_handle *)auStack_37e._22_8_,&local_390,(fdb_kvs_config *)local_358);
    }
    else {
      pbVar17 = (btree *)local_358;
      pcStack_3a0 = (code *)0x10c790;
      fdb_kvs_open((fdb_file_handle *)auStack_37e._22_8_,&local_390,"db",(fdb_kvs_config *)pbVar17);
    }
    auStack_37e._6_8_ = local_390;
    pcVar26 = "./compact_test6";
    pcStack_3a0 = (code *)0x10c7bc;
    pfVar11 = (fdb_kvs_handle *)auStack_37e._22_8_;
    fVar5 = fdb_compact((fdb_file_handle *)auStack_37e._22_8_,"./compact_test6");
    if (fVar5 == FDB_RESULT_SUCCESS) {
      if ((int)local_388 != 0) {
        pcStack_3a0 = (code *)0x10c7d5;
        compaction_callback_test();
      }
      if (local_388._4_4_ == 0 || 1000 < local_388._4_4_) {
        pcStack_3a0 = (code *)0x10c7f4;
        compaction_callback_test();
      }
      if (acStack_380[0] == '\x01') {
        pcStack_3a0 = (code *)0x10c803;
        compaction_callback_test();
      }
      if (acStack_380[1] == '\x01') {
        pcStack_3a0 = (code *)0x10c812;
        compaction_callback_test();
      }
      if (auStack_37e[0] == '\x01') {
        pcStack_3a0 = (code *)0x10c821;
        compaction_callback_test();
      }
      pcStack_3a0 = (code *)0x10c82b;
      fdb_close((fdb_file_handle *)auStack_37e._22_8_);
      pcStack_3a0 = (code *)0x10c830;
      fdb_shutdown();
      pcStack_3a0 = (code *)0x10c835;
      memleak_end();
      if (cVar23 == '\0') {
        if ((compaction_callback_test(bool)::__test_pass & 1) == 0) {
          pcVar27 = "%s PASSED\n";
        }
        else {
          pcVar27 = "%s FAILED\n";
        }
        pcVar7 = "compaction callback function single kv mode test";
      }
      else {
        if ((compaction_callback_test(bool)::__test_pass & 1) == 0) {
          pcVar27 = "%s PASSED\n";
        }
        else {
          pcVar27 = "%s FAILED\n";
        }
        pcVar7 = "compaction callback function multi kv mode test";
      }
      pcStack_3a0 = (code *)0x10c889;
      fprintf(_stderr,pcVar27,pcVar7);
      return;
    }
  }
  else {
LAB_0010c8a0:
    pcStack_3a0 = (code *)0x10c8a5;
    compaction_callback_test();
LAB_0010c8a5:
    pcStack_3a0 = (code *)0x10c8aa;
    compaction_callback_test();
LAB_0010c8aa:
    pcStack_3a0 = (code *)0x10c8af;
    compaction_callback_test();
LAB_0010c8af:
    pcStack_3a0 = (code *)0x10c8b4;
    compaction_callback_test();
LAB_0010c8b4:
    pcStack_3a0 = (code *)0x10c8b9;
    compaction_callback_test();
  }
  pcStack_3a0 = compaction_cb;
  compaction_callback_test();
  pfVar16 = (fdb_kvs_handle *)((ulong)pcVar26 & 0xffffffff);
  pfStack_3f8 = (fdb_kvs_handle *)0x10c8eb;
  pfStack_3c8 = pfVar9;
  pbStack_3c0 = pbVar32;
  pbStack_3b8 = local_238;
  pcStack_3b0 = pcVar7;
  pcStack_3a8 = pcVar27;
  pcStack_3a0 = (code *)uVar19;
  gettimeofday((timeval *)(auStack_3e0 + 8),(__timezone_ptr_t)0x0);
  iVar6 = (int)pcVar26;
  if (iVar6 < 8) {
    if (iVar6 == 1) {
      *(undefined1 *)&(local_390->kvs_config).custom_cmp = 1;
      return;
    }
    if (iVar6 != 2) goto LAB_0010c97b;
    pfVar16 = (fdb_kvs_handle *)
              CONCAT71((int7)((ulong)pfVar16 >> 8),*(undefined1 *)&pbVar17[1].blk_handle);
    *(int *)&local_390->kvs_config = *(int *)&local_390->kvs_config + 1;
    pbVar17 = (btree *)auStack_3e0;
    pfStack_3f8 = (fdb_kvs_handle *)0x10c928;
    fdb_doc_create((fdb_doc **)pbVar17,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    *(size_t *)(auStack_3e0._0_8_ + 0x30) = sVar8;
    pfStack_3f8 = (fdb_kvs_handle *)0x10c939;
    fVar5 = fdb_get_byoffset((fdb_kvs_handle *)(local_390->kvs_config).custom_cmp_param,
                             (fdb_doc *)auStack_3e0._0_8_);
    ppfVar38 = extraout_RDX;
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_3f8 = (fdb_kvs_handle *)0x10c94b;
      fdb_doc_free((fdb_doc *)auStack_3e0._0_8_);
      if (*(char *)(*(long *)&pfVar11->kvs_config + 0xb0) == '\x01') {
        if (*(short *)extraout_RDX == 0x6264) {
          return;
        }
        pfStack_3f8 = (fdb_kvs_handle *)0x10c96a;
        compaction_cb();
        goto LAB_0010c96a;
      }
      if (*(int *)((long)extraout_RDX + 3) == 0x746c7561 && *(int *)extraout_RDX == 0x61666564) {
        return;
      }
      pfStack_3f8 = (fdb_kvs_handle *)0x10c9fc;
      compaction_cb();
      goto LAB_0010c9fc;
    }
  }
  else {
LAB_0010c96a:
    if ((int)pfVar16 == 8) {
      *(undefined1 *)((long)&(local_390->kvs_config).custom_cmp + 2) = 1;
      return;
    }
    if ((int)pfVar16 == 0x10) {
      *(undefined1 *)((long)&(local_390->kvs_config).custom_cmp + 1) = 1;
      return;
    }
LAB_0010c97b:
    puVar1 = &(local_390->kvs_config).field_0x4;
    *(int *)puVar1 = *(int *)puVar1 + 1;
    ppfVar38 = (fdb_doc **)auStack_3e0;
    pfStack_3f8 = (fdb_kvs_handle *)0x10c9a0;
    fdb_doc_create(ppfVar38,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    *(size_t *)(auStack_3e0._0_8_ + 0x30) = sVar8;
    pfStack_3f8 = (fdb_kvs_handle *)0x10c9b0;
    fVar5 = fdb_get_byoffset((fdb_kvs_handle *)(local_390->kvs_config).custom_cmp_param,
                             (fdb_doc *)auStack_3e0._0_8_);
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_3f8 = (fdb_kvs_handle *)0x10c9be;
      fdb_doc_free((fdb_doc *)auStack_3e0._0_8_);
      return;
    }
LAB_0010c9fc:
    pfStack_3f8 = (fdb_kvs_handle *)0x10ca01;
    compaction_cb();
  }
  pfStack_3f8 = (fdb_kvs_handle *)compact_wo_reopen_test;
  compaction_cb();
  pfStack_410 = local_390;
  pfStack_8f0 = (fdb_kvs_handle *)0x10ca23;
  ppfStack_420 = ppfVar38;
  pbStack_418 = pbVar17;
  sStack_408 = sVar8;
  pfStack_3f8 = pfVar16;
  gettimeofday((timeval *)(auStack_898 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_8f0 = (fdb_kvs_handle *)0x10ca28;
  memleak_start();
  pfStack_8f0 = (fdb_kvs_handle *)0x10ca34;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_8f0 = (fdb_kvs_handle *)0x10ca44;
  fdb_get_default_config();
  pfVar9 = (fdb_kvs_handle *)auStack_898;
  pfStack_8f0 = (fdb_kvs_handle *)0x10ca51;
  fdb_get_default_kvs_config();
  fStack_720.buffercache_size = 0x1000000;
  fStack_720.wal_threshold = 0x400;
  fStack_720.flags = 1;
  fStack_720.compaction_threshold = '\0';
  pbVar36 = (btree *)&pfStack_8d0;
  pfStack_8f0 = (fdb_kvs_handle *)0x10ca83;
  fdb_open((fdb_file_handle **)pbVar36,"./compact_test1",&fStack_720);
  ppfVar22 = &pfStack_8d8;
  pfStack_8f0 = (fdb_kvs_handle *)0x10ca96;
  fdb_kvs_open_default((fdb_file_handle *)pfStack_8d0,ppfVar22,(fdb_kvs_config *)pfVar9);
  pfStack_8f0 = (fdb_kvs_handle *)0x10caac;
  fVar5 = fdb_set_log_callback(pfStack_8d8,logCallbackFunc,"compact_wo_reopen_test");
  pfVar11 = local_390;
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfStack_8f0 = (fdb_kvs_handle *)0x10cad0;
    fdb_open(&pfStack_8c0,"./compact_test1",&fStack_720);
    ppfVar22 = &pfStack_8c8;
    pfStack_8f0 = (fdb_kvs_handle *)0x10cae5;
    fdb_kvs_open_default(pfStack_8c0,ppfVar22,(fdb_kvs_config *)auStack_898);
    pfStack_8f0 = (fdb_kvs_handle *)0x10cafb;
    fVar5 = fdb_set_log_callback(pfStack_8c8,logCallbackFunc,"compact_wo_reopen_test");
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pbVar17 = (btree *)0x0;
      uVar19 = 0;
      do {
        pfVar2 = &fStack_628.config.encryption_key;
        pfStack_8f0 = (fdb_kvs_handle *)0x10cb23;
        sprintf((char *)pfVar2,"key%d",uVar19 & 0xffffffff);
        pfStack_8f0 = (fdb_kvs_handle *)0x10cb3b;
        sprintf((char *)&fStack_628,"meta%d",uVar19 & 0xffffffff);
        pfStack_8f0 = (fdb_kvs_handle *)0x10cb53;
        sprintf(acStack_828,"body%d",uVar19 & 0xffffffff);
        pbVar36 = (btree *)(auStack_8b8 + (long)pbVar17);
        pfStack_8f0 = (fdb_kvs_handle *)0x10cb63;
        sVar8 = strlen((char *)pfVar2);
        pfVar16 = &fStack_628;
        pfStack_8f0 = (fdb_kvs_handle *)0x10cb76;
        pfVar9 = (fdb_kvs_handle *)strlen((char *)pfVar16);
        pfStack_8f0 = (fdb_kvs_handle *)0x10cb86;
        sVar10 = strlen(acStack_828);
        pfStack_8f0 = (fdb_kvs_handle *)0x10cbab;
        fdb_doc_create((fdb_doc **)pbVar36,&fStack_628.config.encryption_key,sVar8,pfVar16,
                       (size_t)pfVar9,acStack_828,sVar10);
        pfStack_8f0 = (fdb_kvs_handle *)0x10cbba;
        fdb_set(pfStack_8d8,*(fdb_doc **)(auStack_8b8 + uVar19 * 8));
        uVar19 = uVar19 + 1;
        pbVar17 = (btree *)((long)pbVar17 + 8);
      } while (uVar19 != 3);
      pfVar11 = (fdb_kvs_handle *)0x0;
      ppfVar22 = &pfStack_8e0;
      pfStack_8f0 = (fdb_kvs_handle *)0x10cbfa;
      fdb_doc_create((fdb_doc **)ppfVar22,*(void **)(auStack_8b8._8_8_ + 0x20),
                     *(size_t *)auStack_8b8._8_8_,*(void **)(auStack_8b8._8_8_ + 0x38),
                     *(size_t *)(auStack_8b8._8_8_ + 8),(void *)0x0,0);
      *(bool *)&pfStack_8e0->file = true;
      pfStack_8f0 = (fdb_kvs_handle *)0x10cc0b;
      fdb_set(pfStack_8d8,(fdb_doc *)pfStack_8e0);
      pfStack_8f0 = (fdb_kvs_handle *)0x10cc13;
      fdb_doc_free((fdb_doc *)pfStack_8e0);
      pfStack_8f0 = (fdb_kvs_handle *)0x10cc22;
      fdb_commit((fdb_file_handle *)pfStack_8d0,'\x01');
      pfStack_8f0 = (fdb_kvs_handle *)0x10cc33;
      fdb_compact((fdb_file_handle *)pfStack_8d0,"./compact_test2");
      while( true ) {
        pfStack_8f0 = (fdb_kvs_handle *)0x10cc57;
        fdb_doc_create((fdb_doc **)ppfVar22,
                       (void *)(*(size_t **)(auStack_8b8 + (long)pfVar11 * 8))[4],
                       **(size_t **)(auStack_8b8 + (long)pfVar11 * 8),(void *)0x0,0,(void *)0x0,0);
        pfStack_8f0 = (fdb_kvs_handle *)0x10cc66;
        fVar5 = fdb_get(pfStack_8c8,(fdb_doc *)pfStack_8e0);
        pfVar28 = pfStack_8e0;
        if (pfVar11 != (fdb_kvs_handle *)0x1) break;
        if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010cdb5;
LAB_0010cccc:
        pfStack_8f0 = (fdb_kvs_handle *)0x10ccd4;
        fdb_doc_free((fdb_doc *)pfVar28);
        pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
        pfVar9 = pfVar28;
        if (pfVar11 == (fdb_kvs_handle *)0x3) {
          pfStack_8f0 = (fdb_kvs_handle *)0x10ccf3;
          fdb_get_file_info(pfStack_8c0,&fStack_870);
          pfStack_8f0 = (fdb_kvs_handle *)0x10cd02;
          iVar6 = strcmp("./compact_test2",fStack_870.filename);
          if (iVar6 != 0) {
            pfStack_8f0 = (fdb_kvs_handle *)0x10cd10;
            compact_wo_reopen_test();
          }
          lVar20 = 0;
          do {
            pfStack_8f0 = (fdb_kvs_handle *)0x10cd1c;
            fdb_doc_free(*(fdb_doc **)(auStack_8b8 + lVar20 * 8));
            lVar20 = lVar20 + 1;
          } while (lVar20 != 3);
          pfStack_8f0 = (fdb_kvs_handle *)0x10cd2f;
          fdb_kvs_close(pfStack_8d8);
          pfStack_8f0 = (fdb_kvs_handle *)0x10cd39;
          fdb_kvs_close(pfStack_8c8);
          pfStack_8f0 = (fdb_kvs_handle *)0x10cd43;
          fdb_close((fdb_file_handle *)pfStack_8d0);
          pfStack_8f0 = (fdb_kvs_handle *)0x10cd4d;
          fdb_close(pfStack_8c0);
          pfStack_8f0 = (fdb_kvs_handle *)0x10cd52;
          fdb_shutdown();
          pfStack_8f0 = (fdb_kvs_handle *)0x10cd57;
          memleak_end();
          pcVar27 = "%s PASSED\n";
          if (compact_wo_reopen_test()::__test_pass != '\0') {
            pcVar27 = "%s FAILED\n";
          }
          pfStack_8f0 = (fdb_kvs_handle *)0x10cd88;
          fprintf(_stderr,pcVar27,"compaction without reopen test");
          return;
        }
      }
      if (fVar5 == FDB_RESULT_SUCCESS) {
        pbVar36 = pfStack_8e0->staletree;
        pfVar16 = *(fdb_kvs_handle **)(auStack_8b8 + (long)pfVar11 * 8);
        pbVar17 = pfVar16->staletree;
        pfStack_8f0 = (fdb_kvs_handle *)0x10cca5;
        iVar6 = bcmp(pbVar36,pbVar17,(size_t)(pfStack_8e0->kvs_config).custom_cmp);
        if (iVar6 == 0) {
          pbVar36 = (pfVar28->field_6).seqtree;
          pbVar17 = (pfVar16->field_6).seqtree;
          pfStack_8f0 = (fdb_kvs_handle *)0x10ccc4;
          iVar6 = bcmp(pbVar36,pbVar17,(size_t)(pfVar28->kvs_config).custom_cmp_param);
          if (iVar6 == 0) goto LAB_0010cccc;
          pfStack_8f0 = (fdb_kvs_handle *)0x10cda5;
          compact_wo_reopen_test();
          pfVar9 = pfVar28;
          goto LAB_0010cda5;
        }
      }
      else {
LAB_0010cda5:
        pfVar28 = pfVar9;
        pfStack_8f0 = (fdb_kvs_handle *)0x10cdaa;
        compact_wo_reopen_test();
      }
      pfStack_8f0 = (fdb_kvs_handle *)0x10cdb5;
      compact_wo_reopen_test();
      pfVar9 = pfVar28;
LAB_0010cdb5:
      pfStack_8f0 = (fdb_kvs_handle *)0x10cdba;
      compact_wo_reopen_test();
      goto LAB_0010cdba;
    }
  }
  else {
LAB_0010cdba:
    pfStack_8f0 = (fdb_kvs_handle *)0x10cdbf;
    compact_wo_reopen_test();
  }
  pfStack_8f0 = (fdb_kvs_handle *)compact_with_reopen_test;
  compact_wo_reopen_test();
  pfStack_11e8 = (fdb_kvs_handle *)0x10cde4;
  ppfStack_918 = ppfVar22;
  pbStack_910 = pbVar17;
  pfStack_908 = pfVar11;
  pfStack_900 = pfVar9;
  pbStack_8f8 = pbVar36;
  pfStack_8f0 = pfVar16;
  gettimeofday(&tStack_1148,(__timezone_ptr_t)0x0);
  pfStack_11e8 = (fdb_kvs_handle *)0x10cde9;
  memleak_start();
  pfStack_11e8 = (fdb_kvs_handle *)0x10cdf5;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_11e8 = (fdb_kvs_handle *)0x10ce05;
  fdb_get_default_config();
  pfVar9 = (fdb_kvs_handle *)auStack_11a8;
  pfStack_11e8 = (fdb_kvs_handle *)0x10ce12;
  fdb_get_default_kvs_config();
  fStack_1138.buffercache_size = 0x1000000;
  fStack_1138.wal_threshold = 0x400;
  fStack_1138.flags = 1;
  fStack_1138.compaction_threshold = '\0';
  pbVar36 = (btree *)auStack_11d0;
  pfStack_11e8 = (fdb_kvs_handle *)0x10ce44;
  fdb_open((fdb_file_handle **)pbVar36,"./compact_test1",&fStack_1138);
  ppfVar22 = (fdb_kvs_handle **)(auStack_11d0 + 8);
  pfStack_11e8 = (fdb_kvs_handle *)0x10ce57;
  fdb_kvs_open_default((fdb_file_handle *)auStack_11d0._0_8_,ppfVar22,(fdb_kvs_config *)pfVar9);
  pfStack_11e8 = (fdb_kvs_handle *)0x10ce6d;
  fVar5 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_11d0._8_8_,logCallbackFunc,"compact_with_reopen_test"
                    );
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010d61b;
  pbVar17 = (btree *)0x0;
  uVar19 = 0;
  do {
    pfVar2 = &fStack_c20.config.encryption_key;
    pfStack_11e8 = (fdb_kvs_handle *)0x10ce95;
    sprintf((char *)pfVar2,"key%d",uVar19 & 0xffffffff);
    pfStack_11e8 = (fdb_kvs_handle *)0x10cead;
    sprintf((char *)&fStack_c20,"meta%d",uVar19 & 0xffffffff);
    pfStack_11e8 = (fdb_kvs_handle *)0x10cec5;
    sprintf((char *)abStack_1040,"body%d",uVar19 & 0xffffffff);
    pbVar36 = (btree *)(&abStack_f40[0].ksize + (long)pbVar17);
    pfStack_11e8 = (fdb_kvs_handle *)0x10ced8;
    pfVar11 = (fdb_kvs_handle *)strlen((char *)pfVar2);
    pfVar16 = &fStack_c20;
    pfStack_11e8 = (fdb_kvs_handle *)0x10ceeb;
    sVar8 = strlen((char *)pfVar16);
    pfStack_11e8 = (fdb_kvs_handle *)0x10cefb;
    sVar10 = strlen((char *)abStack_1040);
    pfStack_11e8 = (fdb_kvs_handle *)0x10cf20;
    fdb_doc_create((fdb_doc **)pbVar36,&fStack_c20.config.encryption_key,(size_t)pfVar11,pfVar16,
                   sVar8,abStack_1040,sVar10);
    pfStack_11e8 = (fdb_kvs_handle *)0x10cf32;
    fdb_set((fdb_kvs_handle *)auStack_11d0._8_8_,*(fdb_doc **)(&abStack_f40[0].ksize + uVar19 * 8));
    uVar19 = uVar19 + 1;
    pbVar17 = (btree *)((long)pbVar17 + 8);
  } while (uVar19 != 100);
  pfStack_11e8 = (fdb_kvs_handle *)0x10cf72;
  fdb_doc_create((fdb_doc **)&pfStack_11c0,*(void **)(abStack_f40[0].root_bid + 0x20),
                 *(size_t *)abStack_f40[0].root_bid,*(void **)(abStack_f40[0].root_bid + 0x38),
                 *(size_t *)(abStack_f40[0].root_bid + 8),(void *)0x0,0);
  *(undefined1 *)&pfStack_11c0->file = 1;
  ppfVar22 = (fdb_kvs_handle **)(auStack_11d0 + 8);
  pfStack_11e8 = (fdb_kvs_handle *)0x10cf86;
  fdb_set((fdb_kvs_handle *)auStack_11d0._8_8_,(fdb_doc *)pfStack_11c0);
  pfStack_11e8 = (fdb_kvs_handle *)0x10cf8e;
  fdb_doc_free((fdb_doc *)pfStack_11c0);
  pfVar9 = (fdb_kvs_handle *)auStack_11d0;
  pfStack_11e8 = (fdb_kvs_handle *)0x10cfa0;
  fdb_commit((fdb_file_handle *)auStack_11d0._0_8_,'\x01');
  pfStack_11e8 = (fdb_kvs_handle *)0x10cfaf;
  fdb_compact((fdb_file_handle *)auStack_11d0._0_8_,"./compact_test2");
  pfStack_11e8 = (fdb_kvs_handle *)0x10cfb7;
  fdb_kvs_close((fdb_kvs_handle *)auStack_11d0._8_8_);
  pfStack_11e8 = (fdb_kvs_handle *)0x10cfbf;
  fdb_close((fdb_file_handle *)auStack_11d0._0_8_);
  pfStack_11e8 = (fdb_kvs_handle *)0x10cfcb;
  system("mv  compact_test2 compact_test1 > errorlog.txt");
  pfStack_11e8 = (fdb_kvs_handle *)0x10cfe2;
  fdb_open((fdb_file_handle **)pfVar9,"./compact_test1",&fStack_1138);
  pfStack_11e8 = (fdb_kvs_handle *)0x10cff2;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_11d0._0_8_,ppfVar22,(fdb_kvs_config *)auStack_11a8);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d008;
  fVar5 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_11d0._8_8_,logCallbackFunc,"compact_with_reopen_test"
                    );
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010d620;
  pfVar11 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_11e8 = (fdb_kvs_handle *)0x10d03f;
    fdb_doc_create((fdb_doc **)&pfStack_11c0,
                   (void *)(*(size_t **)(&abStack_f40[0].ksize + (long)pfVar11 * 8))[4],
                   **(size_t **)(&abStack_f40[0].ksize + (long)pfVar11 * 8),(void *)0x0,0,
                   (void *)0x0,0);
    pfStack_11e8 = (fdb_kvs_handle *)0x10d04e;
    fVar5 = fdb_get((fdb_kvs_handle *)auStack_11d0._8_8_,(fdb_doc *)pfStack_11c0);
    pfVar28 = pfStack_11c0;
    if (pfVar11 == (fdb_kvs_handle *)0x1) {
      if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010d616;
    }
    else {
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010d606;
      pbVar36 = pfStack_11c0->staletree;
      pfVar16 = *(fdb_kvs_handle **)(&abStack_f40[0].ksize + (long)pfVar11 * 8);
      pbVar17 = pfVar16->staletree;
      pfStack_11e8 = (fdb_kvs_handle *)0x10d090;
      iVar6 = bcmp(pbVar36,pbVar17,(size_t)(pfStack_11c0->kvs_config).custom_cmp);
      if (iVar6 != 0) goto LAB_0010d60b;
      pbVar36 = (pfVar28->field_6).seqtree;
      pbVar17 = (pfVar16->field_6).seqtree;
      pfStack_11e8 = (fdb_kvs_handle *)0x10d0af;
      iVar6 = bcmp(pbVar36,pbVar17,(size_t)(pfVar28->kvs_config).custom_cmp_param);
      if (iVar6 != 0) goto LAB_0010d5fb;
    }
    pfStack_11e8 = (fdb_kvs_handle *)0x10d0bf;
    fdb_doc_free((fdb_doc *)pfVar28);
    pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
    pfVar9 = pfVar28;
  } while (pfVar11 != (fdb_kvs_handle *)0x64);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d0de;
  fdb_get_file_info((fdb_file_handle *)auStack_11d0._0_8_,(fdb_file_info *)(auStack_11a8 + 0x18));
  pfStack_11e8 = (fdb_kvs_handle *)0x10d0ed;
  iVar6 = strcmp("./compact_test1",(char *)auStack_11a8._24_8_);
  if (iVar6 != 0) {
    pfStack_11e8 = (fdb_kvs_handle *)0x10d0fb;
    compact_with_reopen_test();
  }
  pfVar9 = &fStack_c20;
  pbVar17 = abStack_1040;
  pfVar11 = (fdb_kvs_handle *)0x0;
  uVar19 = 0;
  do {
    pfStack_11e8 = (fdb_kvs_handle *)0x10d123;
    sprintf((char *)pfVar9,"newmeta%d",uVar19 & 0xffffffff);
    pfStack_11e8 = (fdb_kvs_handle *)0x10d13e;
    sprintf((char *)pbVar17,"newbody%d_%s",uVar19 & 0xffffffff,&fStack_c20.bub_ctx.handle);
    pfStack_11e8 = (fdb_kvs_handle *)0x10d151;
    pbVar36 = (btree *)strlen((char *)pfVar9);
    pfStack_11e8 = (fdb_kvs_handle *)0x10d15c;
    sVar8 = strlen((char *)pbVar17);
    pfStack_11e8 = (fdb_kvs_handle *)0x10d170;
    fdb_doc_update((fdb_doc **)(&abStack_f40[0].ksize + (long)pfVar11),pfVar9,(size_t)pbVar36,
                   pbVar17,sVar8);
    pfStack_11e8 = (fdb_kvs_handle *)0x10d182;
    fdb_set((fdb_kvs_handle *)auStack_11d0._8_8_,*(fdb_doc **)(&abStack_f40[0].ksize + uVar19 * 8));
    uVar19 = uVar19 + 1;
    pfVar11 = (fdb_kvs_handle *)((long)pfVar11 + 8);
  } while (uVar19 != 100);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d1ab;
  fdb_open((fdb_file_handle **)&pbStack_11b0,"./compact_test1",&fStack_1138);
  ppfVar22 = &pfStack_11b8;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d1c0;
  fdb_kvs_open_default((fdb_file_handle *)pbStack_11b0,ppfVar22,(fdb_kvs_config *)auStack_11a8);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d1d6;
  fVar5 = fdb_set_log_callback(pfStack_11b8,logCallbackFunc,"compact_with_reopen_test");
  pfVar16 = (fdb_kvs_handle *)0x64;
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010d625;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d1ea;
  fVar5 = fdb_compact((fdb_file_handle *)auStack_11d0._0_8_,(char *)0x0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010d62a;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d1fe;
  fVar5 = fdb_compact((fdb_file_handle *)auStack_11d0._0_8_,(char *)0x0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010d62f;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d212;
  fVar5 = fdb_compact((fdb_file_handle *)auStack_11d0._0_8_,(char *)0x0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010d634;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d224;
  fdb_kvs_close((fdb_kvs_handle *)auStack_11d0._8_8_);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d22e;
  fdb_close((fdb_file_handle *)auStack_11d0._0_8_);
  pfVar11 = (fdb_kvs_handle *)0x0;
  ppfVar22 = &pfStack_11c0;
  pfVar25 = pfVar9;
  do {
    pfStack_11e8 = (fdb_kvs_handle *)0x10d25d;
    fdb_doc_create((fdb_doc **)ppfVar22,
                   (void *)(*(size_t **)(&abStack_f40[0].ksize + (long)pfVar11 * 8))[4],
                   **(size_t **)(&abStack_f40[0].ksize + (long)pfVar11 * 8),(void *)0x0,0,
                   (void *)0x0,0);
    pfStack_11e8 = (fdb_kvs_handle *)0x10d26c;
    fVar5 = fdb_get(pfStack_11b8,(fdb_doc *)pfStack_11c0);
    pfVar9 = pfStack_11c0;
    if (fVar5 != FDB_RESULT_SUCCESS) {
      pfStack_11e8 = (fdb_kvs_handle *)0x10d5ca;
      compact_with_reopen_test();
LAB_0010d5ca:
      pfStack_11e8 = (fdb_kvs_handle *)0x10d5d5;
      compact_with_reopen_test();
LAB_0010d5d5:
      pfStack_11e8 = (fdb_kvs_handle *)0x10d5e0;
      compact_with_reopen_test();
      goto LAB_0010d5e0;
    }
    pbVar36 = pfStack_11c0->staletree;
    pfVar16 = *(fdb_kvs_handle **)(&abStack_f40[0].ksize + (long)pfVar11 * 8);
    pbVar17 = pfVar16->staletree;
    pfStack_11e8 = (fdb_kvs_handle *)0x10d298;
    iVar6 = bcmp(pbVar36,pbVar17,(size_t)(pfStack_11c0->kvs_config).custom_cmp);
    pfVar25 = pfVar9;
    if (iVar6 != 0) goto LAB_0010d5ca;
    pbVar36 = (pfVar9->field_6).seqtree;
    pbVar17 = (pfVar16->field_6).seqtree;
    pfStack_11e8 = (fdb_kvs_handle *)0x10d2b7;
    iVar6 = bcmp(pbVar36,pbVar17,(size_t)(pfVar9->kvs_config).custom_cmp_param);
    if (iVar6 != 0) goto LAB_0010d5d5;
    pfStack_11e8 = (fdb_kvs_handle *)0x10d2c7;
    fdb_doc_free((fdb_doc *)pfVar9);
    pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
  } while (pfVar11 != (fdb_kvs_handle *)0x64);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d2ed;
  fVar5 = fdb_open((fdb_file_handle **)auStack_11d0,"./compact_test1",&fStack_1138);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010d639;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d309;
  fVar5 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_11d0._0_8_,(fdb_kvs_handle **)(auStack_11d0 + 8),
                     (fdb_kvs_config *)auStack_11a8);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010d63e;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d329;
  fVar5 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_11d0._8_8_,logCallbackFunc,"compact_with_reopen_test"
                    );
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010d643;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d343;
  fdb_get_file_info((fdb_file_handle *)auStack_11d0._0_8_,(fdb_file_info *)(auStack_11a8 + 0x18));
  pfStack_11e8 = (fdb_kvs_handle *)0x10d352;
  iVar6 = strcmp("./compact_test1.3",(char *)auStack_11a8._24_8_);
  if (iVar6 != 0) {
    pfStack_11e8 = (fdb_kvs_handle *)0x10d360;
    compact_with_reopen_test();
  }
  pfStack_11e8 = (fdb_kvs_handle *)0x10d36a;
  fdb_kvs_close(pfStack_11b8);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d374;
  fdb_close((fdb_file_handle *)pbStack_11b0);
  pfVar11 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_11e8 = (fdb_kvs_handle *)0x10d3a3;
    fdb_doc_create((fdb_doc **)&pfStack_11c0,
                   (void *)(*(size_t **)(&abStack_f40[0].ksize + (long)pfVar11 * 8))[4],
                   **(size_t **)(&abStack_f40[0].ksize + (long)pfVar11 * 8),(void *)0x0,0,
                   (void *)0x0,0);
    pfStack_11e8 = (fdb_kvs_handle *)0x10d3b2;
    fVar5 = fdb_get((fdb_kvs_handle *)auStack_11d0._8_8_,(fdb_doc *)pfStack_11c0);
    pfVar28 = pfStack_11c0;
    pfVar25 = pfVar9;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010d5e0;
    pbVar36 = pfStack_11c0->staletree;
    pfVar16 = *(fdb_kvs_handle **)(&abStack_f40[0].ksize + (long)pfVar11 * 8);
    pbVar17 = pfVar16->staletree;
    pfStack_11e8 = (fdb_kvs_handle *)0x10d3de;
    iVar6 = bcmp(pbVar36,pbVar17,(size_t)(pfStack_11c0->kvs_config).custom_cmp);
    if (iVar6 != 0) goto LAB_0010d5e5;
    pbVar36 = (pfVar28->field_6).seqtree;
    pbVar17 = (pfVar16->field_6).seqtree;
    pfStack_11e8 = (fdb_kvs_handle *)0x10d3fd;
    iVar6 = bcmp(pbVar36,pbVar17,(size_t)(pfVar28->kvs_config).custom_cmp_param);
    if (iVar6 != 0) goto LAB_0010d5f0;
    pfStack_11e8 = (fdb_kvs_handle *)0x10d40d;
    fdb_doc_free((fdb_doc *)pfVar28);
    pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
    pfVar9 = pfVar28;
  } while (pfVar11 != (fdb_kvs_handle *)0x64);
  ppfVar22 = (fdb_kvs_handle **)auStack_11d0;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d429;
  fdb_compact((fdb_file_handle *)auStack_11d0._0_8_,(char *)0x0);
  pfVar9 = (fdb_kvs_handle *)(auStack_11d0 + 8);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d436;
  fdb_kvs_close((fdb_kvs_handle *)auStack_11d0._8_8_);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d43e;
  fdb_close((fdb_file_handle *)auStack_11d0._0_8_);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d44a;
  system("mv  compact_test1 compact_test.fdb > errorlog.txt");
  pfStack_11e8 = (fdb_kvs_handle *)0x10d461;
  fdb_open((fdb_file_handle **)ppfVar22,"./compact_test.fdb",&fStack_1138);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d471;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_11d0._0_8_,(fdb_kvs_handle **)pfVar9,
             (fdb_kvs_config *)auStack_11a8);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d487;
  fVar5 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_11d0._8_8_,logCallbackFunc,"compact_with_reopen_test"
                    );
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010d648;
  ppfVar22 = (fdb_kvs_handle **)auStack_11d0;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d49e;
  fdb_compact((fdb_file_handle *)auStack_11d0._0_8_,(char *)0x0);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d4a8;
  fdb_kvs_close((fdb_kvs_handle *)auStack_11d0._8_8_);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d4b0;
  fdb_close((fdb_file_handle *)auStack_11d0._0_8_);
  pfStack_11e8 = (fdb_kvs_handle *)0x10d4c7;
  fVar5 = fdb_open((fdb_file_handle **)ppfVar22,"./compact_test.fdb",&fStack_1138);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010d64d;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d4e3;
  fVar5 = fdb_kvs_open_default
                    ((fdb_file_handle *)auStack_11d0._0_8_,(fdb_kvs_handle **)(auStack_11d0 + 8),
                     (fdb_kvs_config *)auStack_11a8);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010d652;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d503;
  fVar5 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_11d0._8_8_,logCallbackFunc,"compact_with_reopen_test"
                    );
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfStack_11e8 = (fdb_kvs_handle *)0x10d51d;
    fdb_get_file_info((fdb_file_handle *)auStack_11d0._0_8_,(fdb_file_info *)(auStack_11a8 + 0x18));
    pfStack_11e8 = (fdb_kvs_handle *)0x10d52c;
    iVar6 = strcmp("./compact_test.fdb",(char *)auStack_11a8._24_8_);
    if (iVar6 != 0) {
      pfStack_11e8 = (fdb_kvs_handle *)0x10d53a;
      compact_with_reopen_test();
    }
    if (pdStack_1180 != (docio_handle *)0x64) {
      pfStack_11e8 = (fdb_kvs_handle *)0x10d54c;
      compact_with_reopen_test();
    }
    lVar20 = 0;
    do {
      pfStack_11e8 = (fdb_kvs_handle *)0x10d55b;
      fdb_doc_free(*(fdb_doc **)(&abStack_f40[0].ksize + lVar20 * 8));
      lVar20 = lVar20 + 1;
    } while (lVar20 != 100);
    pfStack_11e8 = (fdb_kvs_handle *)0x10d56e;
    fdb_kvs_close((fdb_kvs_handle *)auStack_11d0._8_8_);
    pfStack_11e8 = (fdb_kvs_handle *)0x10d578;
    fdb_close((fdb_file_handle *)auStack_11d0._0_8_);
    pfStack_11e8 = (fdb_kvs_handle *)0x10d57d;
    fdb_shutdown();
    pfStack_11e8 = (fdb_kvs_handle *)0x10d582;
    memleak_end();
    pcVar27 = "%s PASSED\n";
    if (compact_with_reopen_test()::__test_pass != '\0') {
      pcVar27 = "%s FAILED\n";
    }
    pfStack_11e8 = (fdb_kvs_handle *)0x10d5b3;
    fprintf(_stderr,pcVar27,"compaction with reopen test");
    return;
  }
  goto LAB_0010d657;
LAB_0010eb2a:
  pfStack_3258 = (fdb_kvs_handle *)0x10eb2f;
  compact_upto_test();
  pcVar26 = pcVar7;
  goto LAB_0010eb2f;
LAB_001108a3:
  pfStack_189d0 = (fdb_kvs_handle *)0x1108ae;
  compaction_daemon_test();
  doc._M_i = _Var33._M_i;
LAB_001108ae:
  _Var33._M_i = doc._M_i;
  pfStack_189d0 = (fdb_kvs_handle *)0x1108b3;
  compaction_daemon_test();
LAB_001108b3:
  pfStack_189d0 = (fdb_kvs_handle *)0x1108be;
  pcVar7 = pcVar27;
  compaction_daemon_test();
  doc._M_i = _Var33._M_i;
LAB_001108be:
  pfVar16 = (fdb_kvs_handle *)auStack_189a8;
  ptr_fhandle = (filemgr *)(auStack_18820 + 0x48);
  pfStack_189d0 = (fdb_kvs_handle *)0x1108c3;
  compaction_daemon_test();
  goto LAB_001108c3;
LAB_00110f58:
  auto_compaction_with_custom_cmp_function();
LAB_00110f5d:
  auto_compaction_with_custom_cmp_function();
LAB_00110f62:
  auto_compaction_with_custom_cmp_function();
  goto LAB_00110f67;
LAB_0010d5e0:
  pfVar28 = pfVar25;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d5e5;
  compact_with_reopen_test();
LAB_0010d5e5:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d5f0;
  compact_with_reopen_test();
LAB_0010d5f0:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d5fb;
  compact_with_reopen_test();
LAB_0010d5fb:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d606;
  compact_with_reopen_test();
  pfVar9 = pfVar28;
LAB_0010d606:
  pfVar28 = pfVar9;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d60b;
  compact_with_reopen_test();
LAB_0010d60b:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d616;
  compact_with_reopen_test();
  pfVar9 = pfVar28;
LAB_0010d616:
  ppfVar22 = &pfStack_11c0;
  pfStack_11e8 = (fdb_kvs_handle *)0x10d61b;
  compact_with_reopen_test();
LAB_0010d61b:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d620;
  compact_with_reopen_test();
LAB_0010d620:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d625;
  compact_with_reopen_test();
LAB_0010d625:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d62a;
  compact_with_reopen_test();
LAB_0010d62a:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d62f;
  compact_with_reopen_test();
LAB_0010d62f:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d634;
  compact_with_reopen_test();
LAB_0010d634:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d639;
  compact_with_reopen_test();
LAB_0010d639:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d63e;
  compact_with_reopen_test();
LAB_0010d63e:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d643;
  compact_with_reopen_test();
LAB_0010d643:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d648;
  compact_with_reopen_test();
LAB_0010d648:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d64d;
  compact_with_reopen_test();
LAB_0010d64d:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d652;
  compact_with_reopen_test();
LAB_0010d652:
  pfStack_11e8 = (fdb_kvs_handle *)0x10d657;
  compact_with_reopen_test();
LAB_0010d657:
  pfStack_11e8 = (fdb_kvs_handle *)compact_reopen_named_kvs;
  compact_with_reopen_test();
  pfStack_19b0 = (fdb_kvs_handle *)0x10d679;
  ppfStack_1210 = ppfVar22;
  pbStack_1208 = pbVar17;
  pfStack_1200 = pfVar11;
  pfStack_11f8 = pfVar9;
  pbStack_11f0 = pbVar36;
  pfStack_11e8 = pfVar16;
  gettimeofday(&tStack_1978,(__timezone_ptr_t)0x0);
  pfStack_19b0 = (fdb_kvs_handle *)0x10d67e;
  memleak_start();
  pfStack_19b0 = (fdb_kvs_handle *)0x10d68a;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_19b0 = (fdb_kvs_handle *)0x10d69a;
  fdb_get_default_config();
  pfStack_19b0 = (fdb_kvs_handle *)0x10d6a7;
  fdb_get_default_kvs_config();
  fStack_1830.wal_threshold = 0x400;
  fStack_1830.flags = 1;
  fStack_1830.compaction_threshold = '\0';
  pfStack_19b0 = (fdb_kvs_handle *)0x10d6d1;
  fdb_open(&pfStack_1998,"./compact_test1",&fStack_1830);
  pfStack_19b0 = (fdb_kvs_handle *)0x10d6eb;
  fdb_kvs_open(pfStack_1998,&pfStack_19a0,"db",&fStack_1990);
  pfStack_19b0 = (fdb_kvs_handle *)0x10d701;
  fVar5 = fdb_set_log_callback(pfStack_19a0,logCallbackFunc,"compact_reopen_named_kvs");
  if (fVar5 == FDB_RESULT_SUCCESS) {
    lVar20 = 0;
    uVar19 = 0;
    do {
      pfStack_19b0 = (fdb_kvs_handle *)0x10d729;
      sprintf(acStack_1638,"key%d",uVar19 & 0xffffffff);
      pfStack_19b0 = (fdb_kvs_handle *)0x10d741;
      sprintf(acStack_1738,"meta%d",uVar19 & 0xffffffff);
      pfStack_19b0 = (fdb_kvs_handle *)0x10d756;
      sprintf(acStack_1938,"body%d",uVar19 & 0xffffffff);
      pfStack_19b0 = (fdb_kvs_handle *)0x10d769;
      sVar8 = strlen(acStack_1638);
      pfStack_19b0 = (fdb_kvs_handle *)0x10d77c;
      sVar10 = strlen(acStack_1738);
      pfStack_19b0 = (fdb_kvs_handle *)0x10d789;
      sVar12 = strlen(acStack_1938);
      pfStack_19b0 = (fdb_kvs_handle *)0x10d7ab;
      fdb_doc_create((fdb_doc **)((long)apfStack_1538 + lVar20),acStack_1638,sVar8,acStack_1738,
                     sVar10,acStack_1938,sVar12);
      pfStack_19b0 = (fdb_kvs_handle *)0x10d7bd;
      fdb_set(pfStack_19a0,apfStack_1538[uVar19]);
      uVar19 = uVar19 + 1;
      lVar20 = lVar20 + 8;
    } while (uVar19 != 100);
    pfStack_19b0 = (fdb_kvs_handle *)0x10d7dd;
    fdb_commit(pfStack_1998,'\0');
    pfStack_19b0 = (fdb_kvs_handle *)0x10d7e7;
    fdb_compact(pfStack_1998,(char *)0x0);
    pfStack_19b0 = (fdb_kvs_handle *)0x10d7fd;
    fdb_get_kvs_info(pfStack_19a0,&fStack_1968);
    lVar20 = (long)(int)fStack_1968.doc_count;
    pfStack_19b0 = (fdb_kvs_handle *)0x10d80a;
    fdb_kvs_close(pfStack_19a0);
    pfStack_19b0 = (fdb_kvs_handle *)0x10d812;
    fdb_close(pfStack_1998);
    pfStack_19b0 = (fdb_kvs_handle *)0x10d829;
    fdb_open(&pfStack_1998,"./compact_test1",&fStack_1830);
    pfStack_19b0 = (fdb_kvs_handle *)0x10d840;
    fdb_kvs_open(pfStack_1998,&pfStack_19a0,"db",&fStack_1990);
    pfStack_19b0 = (fdb_kvs_handle *)0x10d84c;
    fdb_get_kvs_info(pfStack_19a0,&fStack_1968);
    if (lVar20 != CONCAT44(fStack_1968.doc_count._4_4_,(int)fStack_1968.doc_count)) {
      pfStack_19b0 = (fdb_kvs_handle *)0x10d85f;
      compact_reopen_named_kvs();
    }
    pfStack_19b0 = (fdb_kvs_handle *)0x10d869;
    fdb_kvs_close(pfStack_19a0);
    pfStack_19b0 = (fdb_kvs_handle *)0x10d873;
    fdb_close(pfStack_1998);
    lVar20 = 0;
    do {
      pfStack_19b0 = (fdb_kvs_handle *)0x10d882;
      fdb_doc_free(apfStack_1538[lVar20]);
      lVar20 = lVar20 + 1;
    } while (lVar20 != 100);
    pfStack_19b0 = (fdb_kvs_handle *)0x10d890;
    fdb_shutdown();
    pfStack_19b0 = (fdb_kvs_handle *)0x10d895;
    memleak_end();
    pcVar27 = "%s PASSED\n";
    if (compact_reopen_named_kvs()::__test_pass != '\0') {
      pcVar27 = "%s FAILED\n";
    }
    pfStack_19b0 = (fdb_kvs_handle *)0x10d8c6;
    fprintf(_stderr,pcVar27,"compact reopen named kvs");
    return;
  }
  pfStack_19b0 = (fdb_kvs_handle *)compact_reopen_with_iterator;
  compact_reopen_named_kvs();
  pfStack_1eb8 = (fdb_kvs_handle *)0x10d8fa;
  ppfStack_19d8 = &pfStack_19a0;
  pbStack_19d0 = pbVar17;
  pfStack_19c8 = pfVar11;
  pfStack_19c0 = &fStack_1990;
  ppfStack_19b8 = &pfStack_1998;
  pfStack_19b0 = pfVar16;
  gettimeofday((timeval *)(auStack_1e78 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_1eb8 = (fdb_kvs_handle *)0x10d8ff;
  memleak_start();
  pfStack_1e90 = (fdb_kvs_handle *)0x0;
  pfStack_1eb8 = (fdb_kvs_handle *)0x10d914;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_1eb8 = (fdb_kvs_handle *)0x10d924;
  fdb_get_default_config();
  pfVar9 = (fdb_kvs_handle *)auStack_1e78;
  pfStack_1eb8 = (fdb_kvs_handle *)0x10d931;
  fdb_get_default_kvs_config();
  fStack_1dd8.wal_threshold = 0x400;
  fStack_1dd8.flags = 1;
  fStack_1dd8.compaction_threshold = '\0';
  pbVar36 = (btree *)auStack_1e88;
  pfStack_1eb8 = (fdb_kvs_handle *)0x10d95b;
  fdb_open((fdb_file_handle **)pbVar36,"./compact_test1",&fStack_1dd8);
  ppfVar22 = &pfStack_1ea0;
  pfStack_1eb8 = (fdb_kvs_handle *)0x10d975;
  fdb_kvs_open((fdb_file_handle *)auStack_1e88._0_8_,ppfVar22,"db",(fdb_kvs_config *)pfVar9);
  pfStack_1eb8 = (fdb_kvs_handle *)0x10d98b;
  pfVar28 = pfStack_1ea0;
  fVar5 = fdb_set_log_callback(pfStack_1ea0,logCallbackFunc,"compact_reopen_with_iterator");
  uVar24 = (uint)pfVar28;
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pbVar17 = (btree *)0x0;
    uVar19 = 0;
    do {
      pfVar2 = &fStack_1be0.config.encryption_key;
      pfStack_1eb8 = (fdb_kvs_handle *)0x10d9b3;
      sprintf((char *)pfVar2,"key%d",uVar19 & 0xffffffff);
      pfStack_1eb8 = (fdb_kvs_handle *)0x10d9cb;
      sprintf((char *)&fStack_1be0,"meta%d",uVar19 & 0xffffffff);
      pfStack_1eb8 = (fdb_kvs_handle *)0x10d9e3;
      sprintf(acStack_1ce0,"body%d",uVar19 & 0xffffffff);
      pbVar36 = (btree *)(&bStack_1e50.ksize + (long)pbVar17);
      pfStack_1eb8 = (fdb_kvs_handle *)0x10d9f3;
      pfVar11 = (fdb_kvs_handle *)strlen((char *)pfVar2);
      pfVar16 = &fStack_1be0;
      pfStack_1eb8 = (fdb_kvs_handle *)0x10da06;
      pfVar9 = (fdb_kvs_handle *)strlen((char *)pfVar16);
      pfStack_1eb8 = (fdb_kvs_handle *)0x10da16;
      sVar8 = strlen(acStack_1ce0);
      pfStack_1eb8 = (fdb_kvs_handle *)0x10da3b;
      fdb_doc_create((fdb_doc **)pbVar36,&fStack_1be0.config.encryption_key,(size_t)pfVar11,pfVar16,
                     (size_t)pfVar9,acStack_1ce0,sVar8);
      pfStack_1eb8 = (fdb_kvs_handle *)0x10da4a;
      fdb_set(pfStack_1ea0,*(fdb_doc **)(&bStack_1e50.ksize + uVar19 * 8));
      uVar19 = uVar19 + 1;
      pbVar17 = (btree *)((long)pbVar17 + 8);
    } while (uVar19 != 9);
    pfStack_1eb8 = (fdb_kvs_handle *)0x10da67;
    fdb_commit((fdb_file_handle *)auStack_1e88._0_8_,'\0');
    ppfVar22 = (fdb_kvs_handle **)(auStack_1e88 + 8);
    pfStack_1eb8 = (fdb_kvs_handle *)0x10da83;
    fdb_open((fdb_file_handle **)ppfVar22,"./compact_test1",&fStack_1dd8);
    pfStack_1eb8 = (fdb_kvs_handle *)0x10da92;
    pfVar29 = (fdb_file_handle *)auStack_1e88._8_8_;
    fVar5 = fdb_compact((fdb_file_handle *)auStack_1e88._8_8_,"./compact_test2");
    uVar24 = (uint)pfVar29;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010dcb5;
    pfStack_1eb8 = (fdb_kvs_handle *)0x10daa4;
    fdb_close((fdb_file_handle *)auStack_1e88._8_8_);
    pfStack_1eb8 = (fdb_kvs_handle *)0x10dac4;
    pfVar28 = pfStack_1ea0;
    fVar5 = fdb_iterator_init(pfStack_1ea0,&pfStack_1e98,(void *)0x0,0,(void *)0x0,0,0);
    uVar24 = (uint)pfVar28;
    pfVar28 = pfVar9;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010dcba;
    pfVar11 = (fdb_kvs_handle *)0x0;
    ppfVar22 = &pfStack_1e90;
    do {
      pfStack_1eb8 = (fdb_kvs_handle *)0x10dae1;
      fVar5 = fdb_iterator_get(pfStack_1e98,(fdb_doc **)ppfVar22);
      pfVar28 = pfStack_1e90;
      if (fVar5 != FDB_RESULT_SUCCESS) {
LAB_0010dc95:
        pfStack_1eb8 = (fdb_kvs_handle *)0x10dc9a;
        compact_reopen_with_iterator();
LAB_0010dc9a:
        pfStack_1eb8 = (fdb_kvs_handle *)0x10dca5;
        compact_reopen_with_iterator();
LAB_0010dca5:
        pfStack_1eb8 = (fdb_kvs_handle *)0x10dcb0;
        pbVar31 = pbVar17;
        compact_reopen_with_iterator();
        uVar24 = (uint)pbVar31;
        goto LAB_0010dcb0;
      }
      pbVar36 = (btree *)pfStack_1e90->op_stats;
      pfVar16 = *(fdb_kvs_handle **)(&bStack_1e50.ksize + (long)pfVar11 * 8);
      pbVar17 = (btree *)pfVar16->op_stats;
      pfStack_1eb8 = (fdb_kvs_handle *)0x10db09;
      iVar6 = bcmp(pbVar36,pbVar17,*(size_t *)&pfStack_1e90->kvs_config);
      pfVar9 = pfVar28;
      if (iVar6 != 0) {
        pfStack_1eb8 = (fdb_kvs_handle *)0x10dc95;
        compact_reopen_with_iterator();
        goto LAB_0010dc95;
      }
      pbVar36 = pfVar28->staletree;
      pbVar17 = pfVar16->staletree;
      pfStack_1eb8 = (fdb_kvs_handle *)0x10db28;
      iVar6 = bcmp(pbVar36,pbVar17,(size_t)(pfVar28->kvs_config).custom_cmp);
      if (iVar6 != 0) goto LAB_0010dca5;
      pbVar36 = (pfVar28->field_6).seqtree;
      pbVar17 = (pfVar16->field_6).seqtree;
      pfStack_1eb8 = (fdb_kvs_handle *)0x10db47;
      iVar6 = bcmp(pbVar36,pbVar17,(size_t)(pfVar28->kvs_config).custom_cmp_param);
      if (iVar6 != 0) goto LAB_0010dc9a;
      pfStack_1eb8 = (fdb_kvs_handle *)0x10db57;
      fdb_doc_free((fdb_doc *)pfVar28);
      pfStack_1e90 = (fdb_kvs_handle *)0x0;
      pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
      pfStack_1eb8 = (fdb_kvs_handle *)0x10db6d;
      pfVar30 = pfStack_1e98;
      fVar5 = fdb_iterator_next(pfStack_1e98);
      uVar24 = (uint)pfVar30;
    } while (fVar5 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)pfVar11 != 9) goto LAB_0010dcbf;
    pfStack_1eb8 = (fdb_kvs_handle *)0x10db8a;
    fVar5 = fdb_iterator_close(pfStack_1e98);
    uVar24 = (uint)pfStack_1e98;
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_1eb8 = (fdb_kvs_handle *)0x10dbaa;
      fdb_get_kvs_info(pfStack_1ea0,&fStack_1e08);
      lVar20 = (long)(int)fStack_1e08.doc_count;
      pfStack_1eb8 = (fdb_kvs_handle *)0x10dbb6;
      fdb_kvs_close(pfStack_1ea0);
      pfStack_1eb8 = (fdb_kvs_handle *)0x10dbc4;
      fdb_close((fdb_file_handle *)auStack_1e88._0_8_);
      pfStack_1eb8 = (fdb_kvs_handle *)0x10dbdb;
      fdb_open((fdb_file_handle **)auStack_1e88,"./compact_test2",&fStack_1dd8);
      pfStack_1eb8 = (fdb_kvs_handle *)0x10dbf3;
      fdb_kvs_open((fdb_file_handle *)auStack_1e88._0_8_,&pfStack_1ea0,"db",
                   (fdb_kvs_config *)auStack_1e78);
      pfStack_1eb8 = (fdb_kvs_handle *)0x10dbfe;
      fdb_get_kvs_info(pfStack_1ea0,&fStack_1e08);
      if (lVar20 != CONCAT44(fStack_1e08.doc_count._4_4_,(int)fStack_1e08.doc_count)) {
        pfStack_1eb8 = (fdb_kvs_handle *)0x10dc14;
        compact_reopen_with_iterator();
      }
      pfStack_1eb8 = (fdb_kvs_handle *)0x10dc1e;
      fdb_kvs_close(pfStack_1ea0);
      pfStack_1eb8 = (fdb_kvs_handle *)0x10dc28;
      fdb_close((fdb_file_handle *)auStack_1e88._0_8_);
      lVar20 = 0;
      do {
        pfStack_1eb8 = (fdb_kvs_handle *)0x10dc34;
        fdb_doc_free(*(fdb_doc **)(&bStack_1e50.ksize + lVar20 * 8));
        lVar20 = lVar20 + 1;
      } while (lVar20 != 9);
      pfStack_1eb8 = (fdb_kvs_handle *)0x10dc42;
      fdb_shutdown();
      pfStack_1eb8 = (fdb_kvs_handle *)0x10dc47;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (compact_reopen_with_iterator()::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      pfStack_1eb8 = (fdb_kvs_handle *)0x10dc78;
      fprintf(_stderr,pcVar27,"compact reopen with iterator");
      return;
    }
  }
  else {
LAB_0010dcb0:
    pfStack_1eb8 = (fdb_kvs_handle *)0x10dcb5;
    compact_reopen_with_iterator();
LAB_0010dcb5:
    pfStack_1eb8 = (fdb_kvs_handle *)0x10dcba;
    compact_reopen_with_iterator();
    pfVar28 = pfVar9;
LAB_0010dcba:
    pfStack_1eb8 = (fdb_kvs_handle *)0x10dcbf;
    compact_reopen_with_iterator();
LAB_0010dcbf:
    pfStack_1eb8 = (fdb_kvs_handle *)0x10dcc4;
    compact_reopen_with_iterator();
  }
  pfStack_1eb8 = (fdb_kvs_handle *)estimate_space_upto_test;
  compact_reopen_with_iterator();
  pcStack_2cd0 = (code *)0x10dceb;
  ppfStack_1ee0 = ppfVar22;
  pbStack_1ed8 = pbVar17;
  pfStack_1ed0 = pfVar11;
  pfStack_1ec8 = pfVar28;
  pbStack_1ec0 = pbVar36;
  pfStack_1eb8 = pfVar16;
  gettimeofday(&tStack_2c58,(__timezone_ptr_t)0x0);
  pcStack_2cd0 = (code *)0x10dcf0;
  memleak_start();
  pcStack_2cd0 = (code *)0x10dd00;
  fdb_get_default_config();
  pcStack_2cd0 = (code *)0x10dd0a;
  fdb_get_default_kvs_config();
  fStack_2940.buffercache_size = 0;
  fStack_2940.wal_threshold = 0x32;
  fStack_2940.flags = 1;
  fStack_2940.compaction_threshold = '\0';
  fStack_2940.block_reusing_threshold = 0;
  pcStack_2cd0 = (code *)0x10dd38;
  fStack_2940.multi_kv_instances = (bool)(char)uVar24;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_2cd0 = (code *)0x10dd4c;
  fdb_open(&pfStack_2cb8,"./compact_test1",&fStack_2940);
  uStack_2c9c = uVar24;
  if (uVar24 == 0) {
    pcStack_2cd0 = (code *)0x10ddb8;
    fdb_kvs_open_default(pfStack_2cb8,apfStack_2c98,&fStack_2c78);
    sVar21 = 1;
  }
  else {
    ppfVar22 = apfStack_2c98;
    uVar19 = 0;
    do {
      pcStack_2cd0 = (code *)0x10dd7d;
      sprintf(acStack_2c60,"kv%d",uVar19 & 0xffffffff);
      pcStack_2cd0 = (code *)0x10dd90;
      fdb_kvs_open(pfStack_2cb8,ppfVar22,acStack_2c60,&fStack_2c78);
      uVar19 = uVar19 + 1;
      ppfVar22 = ppfVar22 + 1;
    } while (uVar19 != 4);
    sVar21 = 4;
  }
  uVar19 = 0;
  do {
    pcStack_2cd0 = (code *)0x10dddc;
    sprintf(acStack_2a48,"key%d",uVar19 & 0xffffffff);
    pcStack_2cd0 = (code *)0x10ddf5;
    sprintf(acStack_2b48,"meta%d",uVar19 & 0xffffffff);
    pcStack_2cd0 = (code *)0x10de0e;
    sprintf(acStack_2c48,"body%d",uVar19 & 0xffffffff);
    pcStack_2cd0 = (code *)0x10de21;
    sVar8 = strlen(acStack_2a48);
    pcStack_2cd0 = (code *)0x10de34;
    sVar10 = strlen(acStack_2b48);
    pcStack_2cd0 = (code *)0x10de44;
    sVar12 = strlen(acStack_2c48);
    pcStack_2cd0 = (code *)0x10de69;
    fdb_doc_create(apfStack_2848 + uVar19,acStack_2a48,sVar8,acStack_2b48,sVar10,acStack_2c48,sVar12
                  );
    sVar37 = 0;
    do {
      pcStack_2cd0 = (code *)0x10de7a;
      fdb_set(apfStack_2c98[sVar37],apfStack_2848[uVar19]);
      sVar37 = sVar37 + 1;
    } while (sVar21 != sVar37);
    uVar19 = uVar19 + 1;
  } while (uVar19 != 0x4b);
  pcStack_2cd0 = (code *)0x10de9e;
  fdb_commit(pfStack_2cb8,'\x01');
  uVar19 = 0x4b;
  do {
    pcStack_2cd0 = (code *)0x10dec0;
    sprintf(acStack_2a48,"key%d",uVar19 & 0xffffffff);
    pcStack_2cd0 = (code *)0x10ded9;
    sprintf(acStack_2b48,"meta%d",uVar19 & 0xffffffff);
    pcStack_2cd0 = (code *)0x10def2;
    sprintf(acStack_2c48,"body%d",uVar19 & 0xffffffff);
    pcStack_2cd0 = (code *)0x10df05;
    sVar8 = strlen(acStack_2a48);
    pcStack_2cd0 = (code *)0x10df18;
    sVar10 = strlen(acStack_2b48);
    pcStack_2cd0 = (code *)0x10df28;
    sVar12 = strlen(acStack_2c48);
    pcStack_2cd0 = (code *)0x10df4d;
    fdb_doc_create(apfStack_2848 + uVar19,acStack_2a48,sVar8,acStack_2b48,sVar10,acStack_2c48,sVar12
                  );
    sVar37 = 0;
    do {
      pcStack_2cd0 = (code *)0x10df5e;
      fdb_set(apfStack_2c98[sVar37],apfStack_2848[uVar19]);
      sVar37 = sVar37 + 1;
    } while (sVar21 != sVar37);
    uVar19 = uVar19 + 1;
  } while (uVar19 != 0x96);
  lVar20 = 0;
  do {
    sVar37 = 0;
    do {
      pcStack_2cd0 = (code *)0x10df8e;
      fdb_set(apfStack_2c98[sVar37],apfStack_2848[lVar20]);
      sVar37 = sVar37 + 1;
    } while (sVar21 != sVar37);
    lVar20 = lVar20 + 1;
  } while (lVar20 != 0x4b);
  lVar20 = 0;
  do {
    sVar37 = 0;
    do {
      pcStack_2cd0 = (code *)0x10dfb7;
      fdb_set(apfStack_2c98[sVar37],apfStack_2848[lVar20]);
      sVar37 = sVar37 + 1;
    } while (sVar21 != sVar37);
    lVar20 = lVar20 + 1;
  } while (lVar20 != 0x4b);
  pcStack_2cd0 = (code *)0x10dfd4;
  fdb_commit(pfStack_2cb8,'\0');
  uVar19 = 0x96;
  do {
    pcStack_2cd0 = (code *)0x10dff6;
    sprintf(acStack_2a48,"key%d",uVar19 & 0xffffffff);
    pcStack_2cd0 = (code *)0x10e00f;
    sprintf(acStack_2b48,"meta%d",uVar19 & 0xffffffff);
    pcStack_2cd0 = (code *)0x10e028;
    sprintf(acStack_2c48,"body%d",uVar19 & 0xffffffff);
    pcStack_2cd0 = (code *)0x10e03b;
    sVar8 = strlen(acStack_2a48);
    pcStack_2cd0 = (code *)0x10e04e;
    sVar10 = strlen(acStack_2b48);
    pcStack_2cd0 = (code *)0x10e05e;
    sVar12 = strlen(acStack_2c48);
    pcStack_2cd0 = (code *)0x10e083;
    fdb_doc_create(apfStack_2848 + uVar19,acStack_2a48,sVar8,acStack_2b48,sVar10,acStack_2c48,sVar12
                  );
    sVar37 = 0;
    do {
      pcStack_2cd0 = (code *)0x10e094;
      fdb_set(apfStack_2c98[sVar37],apfStack_2848[uVar19]);
      sVar37 = sVar37 + 1;
    } while (sVar21 != sVar37);
    uVar19 = uVar19 + 1;
  } while (uVar19 != 0xe1);
  pcStack_2cd0 = (code *)0x10e0bb;
  fdb_commit(pfStack_2cb8,'\x01');
  uVar19 = 0xe1;
  do {
    pcStack_2cd0 = (code *)0x10e0dd;
    sprintf(acStack_2a48,"key%d",uVar19 & 0xffffffff);
    pcStack_2cd0 = (code *)0x10e0f6;
    sprintf(acStack_2b48,"meta%d",uVar19 & 0xffffffff);
    pcStack_2cd0 = (code *)0x10e10f;
    sprintf(acStack_2c48,"body%d",uVar19 & 0xffffffff);
    ppfVar38 = apfStack_2848 + uVar19;
    pcStack_2cd0 = (code *)0x10e122;
    sVar8 = strlen(acStack_2a48);
    pcStack_2cd0 = (code *)0x10e135;
    sVar10 = strlen(acStack_2b48);
    pcStack_2cd0 = (code *)0x10e145;
    sVar12 = strlen(acStack_2c48);
    pcStack_2cd0 = (code *)0x10e16a;
    fdb_doc_create(ppfVar38,acStack_2a48,sVar8,acStack_2b48,sVar10,acStack_2c48,sVar12);
    sVar37 = 0;
    do {
      pcStack_2cd0 = (code *)0x10e17b;
      fdb_set(apfStack_2c98[sVar37],*ppfVar38);
      sVar37 = sVar37 + 1;
    } while (sVar21 != sVar37);
    uVar19 = uVar19 + 1;
  } while (uVar19 != 300);
  sVar37 = 0;
  pcStack_2cd0 = (code *)0x10e1a2;
  fdb_commit(pfStack_2cb8,'\0');
  do {
    pfVar9 = apfStack_2c98[sVar37];
    pcStack_2cd0 = (code *)0x10e1c0;
    fVar5 = fdb_set_log_callback(pfVar9,logCallbackFunc,"estimate_space_upto_test");
    iVar6 = (int)pfVar9;
    if (fVar5 != FDB_RESULT_SUCCESS) {
      pcStack_2cd0 = (code *)0x10e337;
      estimate_space_upto_test();
      goto LAB_0010e337;
    }
    sVar37 = sVar37 + 1;
  } while (sVar21 != sVar37);
  pcStack_2cd0 = (code *)0x10e1e4;
  pfVar29 = pfStack_2cb8;
  fVar5 = fdb_get_all_snap_markers(pfStack_2cb8,&pfStack_2cb0,&uStack_2ca8);
  iVar6 = (int)pfVar29;
  if (fVar5 == FDB_RESULT_SUCCESS) {
    sVar8 = (size_t)uStack_2c9c;
    cVar23 = (char)uStack_2c9c;
    uVar14 = uStack_2ca8;
    if (cVar23 != '\0') {
      if (uStack_2ca8 != 8) {
        pcStack_2cd0 = (code *)0x10e20a;
        estimate_space_upto_test();
      }
      pcStack_2cd0 = (code *)0x10e21d;
      sVar21 = fdb_estimate_space_used_from(pfStack_2cb8,pfStack_2cb0[1].marker);
      pcStack_2cd0 = (code *)0x10e233;
      sVar13 = fdb_estimate_space_used_from(pfStack_2cb8,pfStack_2cb0[2].marker);
      if (sVar13 <= sVar21) {
        pcStack_2cd0 = (code *)0x10e23d;
        estimate_space_upto_test();
        uVar14 = extraout_RAX;
        goto LAB_0010e23d;
      }
LAB_0010e27f:
      pcStack_2cd0 = (code *)0x10e28e;
      fVar5 = fdb_free_snap_markers(pfStack_2cb0,uStack_2ca8);
      iVar6 = (int)pfStack_2cb0;
      if (fVar5 == FDB_RESULT_SUCCESS) {
        pcStack_2cd0 = (code *)0x10e2a0;
        fdb_close(pfStack_2cb8);
        lVar20 = 0;
        do {
          pcStack_2cd0 = (code *)0x10e2af;
          fdb_doc_free(apfStack_2848[lVar20]);
          lVar20 = lVar20 + 1;
        } while (lVar20 != 300);
        pcStack_2cd0 = (code *)0x10e2c0;
        fdb_shutdown();
        pcStack_2cd0 = (code *)0x10e2c5;
        memleak_end();
        pcVar27 = "single kv mode:";
        if (cVar23 != '\0') {
          pcVar27 = "multiple kv mode:";
        }
        pcStack_2cd0 = (code *)0x10e2f3;
        sprintf(acStack_2c48,"estimate space upto marker in file test %s",pcVar27);
        pcVar27 = "%s PASSED\n";
        if (estimate_space_upto_test(bool)::__test_pass != '\0') {
          pcVar27 = "%s FAILED\n";
        }
        pcStack_2cd0 = (code *)0x10e320;
        fprintf(_stderr,pcVar27,acStack_2c48);
        return;
      }
      goto LAB_0010e33c;
    }
LAB_0010e23d:
    if (uVar14 != 4) {
      pcStack_2cd0 = (code *)0x10e24d;
      estimate_space_upto_test();
    }
    pcStack_2cd0 = (code *)0x10e260;
    sVar21 = fdb_estimate_space_used_from(pfStack_2cb8,pfStack_2cb0[1].marker);
    pcStack_2cd0 = (code *)0x10e276;
    pfVar29 = pfStack_2cb8;
    sVar13 = fdb_estimate_space_used_from(pfStack_2cb8,pfStack_2cb0[2].marker);
    iVar6 = (int)pfVar29;
    if (sVar21 < sVar13) goto LAB_0010e27f;
  }
  else {
LAB_0010e337:
    pcStack_2cd0 = (code *)0x10e33c;
    estimate_space_upto_test();
LAB_0010e33c:
    pcStack_2cd0 = (code *)0x10e341;
    estimate_space_upto_test();
  }
  pcStack_2cd0 = compact_upto_test;
  estimate_space_upto_test();
  pcStack_2cd8 = logCallbackFunc;
  pcStack_2ce0 = "estimate_space_upto_test";
  pfStack_3258 = (fdb_kvs_handle *)0x10e36b;
  sStack_2cf8 = sVar21;
  sStack_2cf0 = sVar37;
  ppfStack_2ce8 = ppfVar38;
  pcStack_2cd0 = (code *)sVar8;
  gettimeofday(&tStack_31a0,(__timezone_ptr_t)0x0);
  pfStack_3258 = (fdb_kvs_handle *)0x10e370;
  memleak_start();
  pfStack_3258 = (fdb_kvs_handle *)0x10e380;
  fdb_get_default_config();
  pfStack_3258 = (fdb_kvs_handle *)0x10e38d;
  fdb_get_default_kvs_config();
  uStack_2de8 = 0;
  uStack_2de0 = 0x400;
  uStack_2dcc = 1;
  uStack_2dc1 = 0;
  uStack_2d38 = 0;
  pfStack_3258 = (fdb_kvs_handle *)0x10e3bb;
  uStack_2db0 = (char)iVar6;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_3258 = (fdb_kvs_handle *)0x10e3cf;
  fdb_open(&pfStack_3238,"./compact_test1",(fdb_config *)(auStack_2ff0 + 0x200));
  iStack_3224 = iVar6;
  if (iVar6 == 0) {
    pfStack_3258 = (fdb_kvs_handle *)0x10e441;
    fdb_kvs_open_default(pfStack_3238,(fdb_kvs_handle **)(auStack_3220 + 0x20),&fStack_31b8);
    uVar24 = 1;
  }
  else {
    ppfVar22 = (fdb_kvs_handle **)(auStack_3220 + 0x20);
    uVar19 = 0;
    do {
      pfStack_3258 = (fdb_kvs_handle *)0x10e403;
      sprintf(auStack_3220,"kv%d",uVar19 & 0xffffffff);
      pfStack_3258 = (fdb_kvs_handle *)0x10e416;
      fdb_kvs_open(pfStack_3238,ppfVar22,auStack_3220,&fStack_31b8);
      uVar19 = uVar19 + 1;
      ppfVar22 = ppfVar22 + 1;
    } while (uVar19 != 4);
    uVar24 = 4;
  }
  pcVar27 = (char *)(ulong)uVar24;
  uVar19 = 0;
  do {
    pfStack_3258 = (fdb_kvs_handle *)0x10e466;
    sprintf(auStack_2ff0 + 0x100,"key%d",uVar19 & 0xffffffff);
    pfStack_3258 = (fdb_kvs_handle *)0x10e47e;
    sprintf(auStack_2ff0,"meta%d",uVar19 & 0xffffffff);
    pfStack_3258 = (fdb_kvs_handle *)0x10e496;
    sprintf(acStack_3190,"body%d",uVar19 & 0xffffffff);
    pfStack_3258 = (fdb_kvs_handle *)0x10e4a9;
    sVar8 = strlen(auStack_2ff0 + 0x100);
    pfStack_3258 = (fdb_kvs_handle *)0x10e4bc;
    sVar10 = strlen(auStack_2ff0);
    pfStack_3258 = (fdb_kvs_handle *)0x10e4cc;
    sVar12 = strlen(acStack_3190);
    pfStack_3258 = (fdb_kvs_handle *)0x10e4f1;
    fdb_doc_create(apfStack_3090 + uVar19,auStack_2ff0 + 0x100,sVar8,auStack_2ff0,sVar10,
                   acStack_3190,sVar12);
    lVar20 = 0;
    do {
      pfStack_3258 = (fdb_kvs_handle *)0x10e501;
      fdb_set(*(fdb_kvs_handle **)(auStack_3220 + lVar20 * 8 + 0x20),apfStack_3090[uVar19]);
      lVar20 = lVar20 + 1;
    } while (pcVar27 != (char *)lVar20);
    uVar19 = uVar19 + 1;
  } while (uVar19 != 5);
  pfStack_3258 = (fdb_kvs_handle *)0x10e525;
  fdb_commit(pfStack_3238,'\x01');
  uVar19 = 5;
  do {
    pfStack_3258 = (fdb_kvs_handle *)0x10e545;
    sprintf(auStack_2ff0 + 0x100,"key%d",uVar19 & 0xffffffff);
    pfStack_3258 = (fdb_kvs_handle *)0x10e55d;
    sprintf(auStack_2ff0,"meta%d",uVar19 & 0xffffffff);
    pfStack_3258 = (fdb_kvs_handle *)0x10e575;
    sprintf(acStack_3190,"body%d",uVar19 & 0xffffffff);
    pfStack_3258 = (fdb_kvs_handle *)0x10e588;
    sVar8 = strlen(auStack_2ff0 + 0x100);
    pfStack_3258 = (fdb_kvs_handle *)0x10e59b;
    sVar10 = strlen(auStack_2ff0);
    pfStack_3258 = (fdb_kvs_handle *)0x10e5ab;
    sVar12 = strlen(acStack_3190);
    pfStack_3258 = (fdb_kvs_handle *)0x10e5d0;
    fdb_doc_create(apfStack_3090 + uVar19,auStack_2ff0 + 0x100,sVar8,auStack_2ff0,sVar10,
                   acStack_3190,sVar12);
    lVar20 = 0;
    do {
      pfStack_3258 = (fdb_kvs_handle *)0x10e5e1;
      fdb_set(*(fdb_kvs_handle **)(auStack_3220 + lVar20 * 8 + 0x20),apfStack_3090[uVar19]);
      lVar20 = lVar20 + 1;
    } while (pcVar27 != (char *)lVar20);
    uVar19 = uVar19 + 1;
  } while (uVar19 != 10);
  pfStack_3258 = (fdb_kvs_handle *)0x10e602;
  fdb_commit(pfStack_3238,'\0');
  uVar19 = 10;
  do {
    pfStack_3258 = (fdb_kvs_handle *)0x10e622;
    sprintf(auStack_2ff0 + 0x100,"key%d",uVar19 & 0xffffffff);
    pfStack_3258 = (fdb_kvs_handle *)0x10e63a;
    sprintf(auStack_2ff0,"meta%d",uVar19 & 0xffffffff);
    pfStack_3258 = (fdb_kvs_handle *)0x10e652;
    sprintf(acStack_3190,"body%d",uVar19 & 0xffffffff);
    pfStack_3258 = (fdb_kvs_handle *)0x10e665;
    sVar8 = strlen(auStack_2ff0 + 0x100);
    pfStack_3258 = (fdb_kvs_handle *)0x10e678;
    sVar10 = strlen(auStack_2ff0);
    pfStack_3258 = (fdb_kvs_handle *)0x10e688;
    sVar12 = strlen(acStack_3190);
    pfStack_3258 = (fdb_kvs_handle *)0x10e6ad;
    fdb_doc_create(apfStack_3090 + uVar19,auStack_2ff0 + 0x100,sVar8,auStack_2ff0,sVar10,
                   acStack_3190,sVar12);
    lVar20 = 0;
    do {
      pfStack_3258 = (fdb_kvs_handle *)0x10e6be;
      fdb_set(*(fdb_kvs_handle **)(auStack_3220 + lVar20 * 8 + 0x20),apfStack_3090[uVar19]);
      lVar20 = lVar20 + 1;
    } while (pcVar27 != (char *)lVar20);
    uVar19 = uVar19 + 1;
  } while (uVar19 != 0xf);
  pfStack_3258 = (fdb_kvs_handle *)0x10e6e2;
  fdb_commit(pfStack_3238,'\x01');
  uVar19 = 0xf;
  do {
    pfStack_3258 = (fdb_kvs_handle *)0x10e702;
    sprintf(auStack_2ff0 + 0x100,"key%d",uVar19 & 0xffffffff);
    pfStack_3258 = (fdb_kvs_handle *)0x10e71a;
    sprintf(auStack_2ff0,"meta%d",uVar19 & 0xffffffff);
    pfStack_3258 = (fdb_kvs_handle *)0x10e732;
    sprintf(acStack_3190,"body%d",uVar19 & 0xffffffff);
    pfStack_3258 = (fdb_kvs_handle *)0x10e745;
    pfVar9 = (fdb_kvs_handle *)strlen(auStack_2ff0 + 0x100);
    doc._M_i = (__int_type_conflict)auStack_2ff0;
    pfStack_3258 = (fdb_kvs_handle *)0x10e758;
    sVar8 = strlen((char *)doc._M_i);
    pfStack_3258 = (fdb_kvs_handle *)0x10e768;
    sVar10 = strlen(acStack_3190);
    pfStack_3258 = (fdb_kvs_handle *)0x10e78d;
    fdb_doc_create(apfStack_3090 + uVar19,auStack_2ff0 + 0x100,(size_t)pfVar9,(void *)doc._M_i,sVar8
                   ,acStack_3190,sVar10);
    lVar20 = 0;
    do {
      pfStack_3258 = (fdb_kvs_handle *)0x10e79e;
      fdb_set(*(fdb_kvs_handle **)(auStack_3220 + lVar20 * 8 + 0x20),apfStack_3090[uVar19]);
      lVar20 = lVar20 + 1;
    } while (pcVar27 != (char *)lVar20);
    uVar19 = uVar19 + 1;
  } while (uVar19 != 0x14);
  pfVar11 = (fdb_kvs_handle *)0x0;
  pfStack_3258 = (fdb_kvs_handle *)0x10e7c2;
  fdb_commit(pfStack_3238,'\0');
  __s = logCallbackFunc;
  pcVar7 = "compact_upto_test";
  do {
    pfStack_3258 = (fdb_kvs_handle *)0x10e7e0;
    fVar5 = fdb_set_log_callback
                      (*(fdb_kvs_handle **)(auStack_3220 + (long)pfVar11 * 8 + 0x20),logCallbackFunc
                       ,"compact_upto_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010eb2a;
    pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
  } while ((fdb_kvs_handle *)pcVar27 != pfVar11);
  pfStack_3258 = (fdb_kvs_handle *)0x10e804;
  fVar5 = fdb_get_all_snap_markers
                    (pfStack_3238,(fdb_snapshot_info_t **)&aStack_3240.seqtree,
                     (uint64_t *)&pfStack_3230);
  pcVar26 = pcVar7;
  if (fVar5 == FDB_RESULT_SUCCESS) {
    if ((char)iStack_3224 == '\0') {
      if (pfStack_3230 != (fdb_kvs_handle *)0x4) {
        pfStack_3258 = (fdb_kvs_handle *)0x10e92b;
        compact_upto_test();
      }
      pfVar11 = (fdb_kvs_handle *)0x1400000000;
      doc._M_i = 0;
      pfVar9 = (fdb_kvs_handle *)0xfffffffb00000000;
      pcVar27 = auStack_3220 + 0x40;
      pcVar26 = (char *)0x0;
      aVar15 = aStack_3240;
      do {
        if (*(long *)((long)&(aVar15.seqtree)->root_bid + doc._M_i) != 1) {
          pfStack_3258 = (fdb_kvs_handle *)0x10e98d;
          compact_upto_test();
          aVar15 = aStack_31e0;
        }
        if (*(long *)(*(long *)((long)&(aVar15.seqtree)->blk_handle + doc._M_i) + 8) !=
            (long)pfVar11 >> 0x20) {
          pfStack_3258 = (fdb_kvs_handle *)0x10e9a2;
          compact_upto_test();
          aVar15 = aStack_31e0;
        }
        pcVar26 = (char *)((long)pcVar26 + 1);
        pfVar11 = (fdb_kvs_handle *)(pfVar11[-0x2762763].config.encryption_key.bytes + 0x14);
        doc._M_i = doc._M_i + 0x18;
      } while (pcVar26 < pfStack_3230);
      __s = (code *)(auStack_3220 + 0x40);
      pfStack_3258 = (fdb_kvs_handle *)0x10e9c4;
      sprintf((char *)__s,"compact_test_compact%d",1);
      pfStack_3258 = (fdb_kvs_handle *)0x10e9da;
      fVar5 = fdb_compact_upto(pfStack_3238,(char *)__s,
                               (fdb_snapshot_marker_t)(aStack_3240.seqtree)->blk_ops);
      if (fVar5 == FDB_RESULT_SUCCESS) {
        pfStack_3258 = (fdb_kvs_handle *)0x10e9fe;
        fVar5 = fdb_snapshot_open((fdb_kvs_handle *)auStack_3220._32_8_,
                                  (fdb_kvs_handle **)(auStack_3220 + 0x18),
                                  (fdb_seqnum_t)(aStack_3240.seqtrie)->btree_blk_ops->blk_alloc_sub)
        ;
        if (fVar5 != FDB_RESULT_SUCCESS) {
          pfStack_3258 = (fdb_kvs_handle *)0x10ea07;
          compact_upto_test();
          goto LAB_0010ea07;
        }
LAB_0010ea64:
        __s = (code *)(auStack_3220 + 0x40);
        pfStack_3258 = (fdb_kvs_handle *)0x10ea6e;
        fdb_kvs_close((fdb_kvs_handle *)auStack_3220._24_8_);
        pfStack_3258 = (fdb_kvs_handle *)0x10ea7d;
        fVar5 = fdb_free_snap_markers
                          ((fdb_snapshot_info_t *)aStack_3240.seqtree,(uint64_t)pfStack_3230);
        if (fVar5 == FDB_RESULT_SUCCESS) {
          pfStack_3258 = (fdb_kvs_handle *)0x10ea8f;
          fdb_close(pfStack_3238);
          lVar20 = 0;
          do {
            pfStack_3258 = (fdb_kvs_handle *)0x10ea9e;
            fdb_doc_free(apfStack_3090[lVar20]);
            lVar20 = lVar20 + 1;
          } while (lVar20 != 0x14);
          pfStack_3258 = (fdb_kvs_handle *)0x10eaac;
          fdb_shutdown();
          pfStack_3258 = (fdb_kvs_handle *)0x10eab1;
          memleak_end();
          pcVar27 = "single kv mode:";
          if ((char)iStack_3224 != '\0') {
            pcVar27 = "multiple kv mode:";
          }
          pfStack_3258 = (fdb_kvs_handle *)0x10eae1;
          sprintf(acStack_3190,"compact upto marker in file test %s",pcVar27);
          pcVar27 = "%s PASSED\n";
          if (compact_upto_test(bool)::__test_pass != '\0') {
            pcVar27 = "%s FAILED\n";
          }
          pfStack_3258 = (fdb_kvs_handle *)0x10eb0e;
          fprintf(_stderr,pcVar27,acStack_3190);
          return;
        }
        goto LAB_0010eb34;
      }
      goto LAB_0010eb39;
    }
    if (pfStack_3230 != (fdb_kvs_handle *)0x8) {
      pfStack_3258 = (fdb_kvs_handle *)0x10e82c;
      compact_upto_test();
    }
    auStack_3220._8_8_ = ZEXT48(uVar24 + 1);
    doc._M_i = (__int_type_conflict)auStack_3220;
    pcVar26 = (char *)0x0;
    do {
      __s = (code *)((long)pcVar26 * 3);
      aVar15 = aStack_3240;
      if ((fdb_custom_cmp_variable)(&(aStack_3240.seqtree)->root_bid)[(long)pcVar26 * 3] !=
          (fdb_custom_cmp_variable)auStack_3220._8_8_) {
        pfStack_3258 = (fdb_kvs_handle *)0x10e911;
        compact_upto_test();
        aVar15 = aStack_31e0;
      }
      pfVar9 = (fdb_kvs_handle *)((long)pcVar26 * -5 + 0x14);
      pfVar18 = (fdb_kvs_commit_marker_t *)(&(aVar15.seqtree)->blk_handle)[(long)pcVar26 * 3];
      pfVar11 = (fdb_kvs_handle *)0x8;
      pcVar7 = (char *)0x0;
      auStack_3220._16_8_ = pcVar26;
      do {
        if (*(fdb_kvs_handle **)(&(pfVar11->kvs_config).create_if_missing + (long)pfVar18) != pfVar9
           ) {
          pfStack_3258 = (fdb_kvs_handle *)0x10e8e2;
          compact_upto_test();
        }
        pfStack_3258 = (fdb_kvs_handle *)0x10e892;
        sprintf((char *)doc._M_i,"kv%d",(ulong)pcVar7 & 0xffffffff);
        pfVar18 = (fdb_kvs_commit_marker_t *)(&(aStack_3240.seqtree)->blk_handle)[(long)pcVar26 * 3]
        ;
        psVar3 = *(short **)((long)&pfVar18[-1].seqnum + (long)pfVar11);
        if ((char)psVar3[1] != auStack_3220[2] || *psVar3 != auStack_3220._0_2_) {
          pfStack_3258 = (fdb_kvs_handle *)0x10eb2a;
          compact_upto_test();
          goto LAB_0010eb2a;
        }
        pcVar7 = pcVar7 + 1;
        pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).custom_cmp_param;
      } while (pcVar27 != pcVar7);
      pcVar26 = (char *)(auStack_3220._16_8_ + 1);
    } while (pcVar26 != pcVar27);
LAB_0010ea07:
    __s = (code *)(auStack_3220 + 0x40);
    pfStack_3258 = (fdb_kvs_handle *)0x10ea22;
    sprintf((char *)__s,"compact_test_compact%d",1);
    pfStack_3258 = (fdb_kvs_handle *)0x10ea38;
    fVar5 = fdb_compact_upto(pfStack_3238,(char *)__s,
                             (fdb_snapshot_marker_t)(aStack_3240.seqtree)->blk_ops);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010eb3e;
    pfStack_3258 = (fdb_kvs_handle *)0x10ea5c;
    fVar5 = fdb_snapshot_open((fdb_kvs_handle *)auStack_3220._40_8_,
                              (fdb_kvs_handle **)(auStack_3220 + 0x18),
                              (fdb_seqnum_t)(aStack_3240.seqtrie)->btree_blk_ops->blk_read);
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_0010ea64;
  }
  else {
LAB_0010eb2f:
    pfStack_3258 = (fdb_kvs_handle *)0x10eb34;
    compact_upto_test();
LAB_0010eb34:
    pfStack_3258 = (fdb_kvs_handle *)0x10eb39;
    compact_upto_test();
LAB_0010eb39:
    pfStack_3258 = (fdb_kvs_handle *)0x10eb3e;
    compact_upto_test();
LAB_0010eb3e:
    pfStack_3258 = (fdb_kvs_handle *)0x10eb43;
    compact_upto_test();
  }
  pfStack_3258 = (fdb_kvs_handle *)auto_recover_compact_ok_test;
  compact_upto_test();
  pfStack_3740 = (fdb_kvs_handle *)0x10eb65;
  pcStack_3280 = __s;
  pfStack_3278 = pfVar11;
  pfStack_3270 = (fdb_kvs_handle *)doc._M_i;
  pcStack_3268 = pcVar27;
  pcStack_3260 = pcVar26;
  pfStack_3258 = pfVar9;
  gettimeofday((timeval *)(auStack_36f0 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_3740 = (fdb_kvs_handle *)0x10eb6a;
  memleak_start();
  pfStack_3740 = (fdb_kvs_handle *)0x10eb76;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_3740 = (fdb_kvs_handle *)0x10eb86;
  fdb_get_default_config();
  pfVar16 = (fdb_kvs_handle *)auStack_36f0;
  pfStack_3740 = (fdb_kvs_handle *)0x10eb93;
  fdb_get_default_kvs_config();
  fStack_3680.buffercache_size = 0x1000000;
  fStack_3680.wal_threshold = 0x400;
  fStack_3680.flags = 1;
  fStack_3680.compaction_threshold = '\0';
  pbVar17 = (btree *)&pfStack_3720;
  pfStack_3740 = (fdb_kvs_handle *)0x10ebc5;
  fdb_open((fdb_file_handle **)pbVar17,"./compact_test1",&fStack_3680);
  ppfVar22 = &pfStack_3730;
  pfStack_3740 = (fdb_kvs_handle *)0x10ebd8;
  fdb_kvs_open_default(pfStack_3720,ppfVar22,(fdb_kvs_config *)pfVar16);
  pfStack_3740 = (fdb_kvs_handle *)0x10ebee;
  fVar5 = fdb_set_log_callback(pfStack_3730,logCallbackFunc,"auto_recover_compact_ok_test");
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfStack_3740 = (fdb_kvs_handle *)0x10ec12;
    fdb_open((fdb_file_handle **)auStack_3710,"./compact_test1",&fStack_3680);
    ppfVar22 = &pfStack_3718;
    pfStack_3740 = (fdb_kvs_handle *)0x10ec27;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_3710._0_8_,ppfVar22,(fdb_kvs_config *)auStack_36f0);
    pfStack_3740 = (fdb_kvs_handle *)0x10ec3d;
    fVar5 = fdb_set_log_callback(pfStack_3718,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010f07d;
    pfStack_3740 = (fdb_kvs_handle *)0x10ec60;
    sprintf(acStack_3388,"key%d",0);
    pfStack_3740 = (fdb_kvs_handle *)0x10ec7b;
    sprintf(acStack_3488,"meta%d",0);
    pbVar17 = abStack_3588;
    pfStack_3740 = (fdb_kvs_handle *)0x10ec96;
    sprintf((char *)pbVar17,"body%d",0);
    pfStack_3740 = (fdb_kvs_handle *)0x10ec9e;
    sVar8 = strlen(acStack_3388);
    pfStack_3740 = (fdb_kvs_handle *)0x10eca9;
    sVar10 = strlen(acStack_3488);
    pfStack_3740 = (fdb_kvs_handle *)0x10ecb4;
    sVar12 = strlen((char *)pbVar17);
    pfStack_3740 = (fdb_kvs_handle *)0x10ecd4;
    fdb_doc_create((fdb_doc **)(auStack_3710 + 8),acStack_3388,sVar8,acStack_3488,sVar10,pbVar17,
                   sVar12);
    pfStack_3740 = (fdb_kvs_handle *)0x10ece2;
    fdb_set(pfStack_3730,(fdb_doc *)auStack_3710._8_8_);
    pfStack_3740 = (fdb_kvs_handle *)0x10ecf8;
    sprintf(acStack_3388,"key%d",1);
    pfStack_3740 = (fdb_kvs_handle *)0x10ed0e;
    sprintf(acStack_3488,"meta%d",1);
    pfStack_3740 = (fdb_kvs_handle *)0x10ed24;
    sprintf((char *)pbVar17,"body%d",1);
    pfStack_3740 = (fdb_kvs_handle *)0x10ed2c;
    sVar8 = strlen(acStack_3388);
    pfStack_3740 = (fdb_kvs_handle *)0x10ed37;
    sVar10 = strlen(acStack_3488);
    pfStack_3740 = (fdb_kvs_handle *)0x10ed42;
    sVar12 = strlen((char *)pbVar17);
    pfStack_3740 = (fdb_kvs_handle *)0x10ed5f;
    fdb_doc_create((fdb_doc **)(auStack_3710 + 0x10),acStack_3388,sVar8,acStack_3488,sVar10,pbVar17,
                   sVar12);
    pfStack_3740 = (fdb_kvs_handle *)0x10ed6e;
    fdb_set(pfStack_3730,(fdb_doc *)auStack_3710._16_8_);
    pfStack_3740 = (fdb_kvs_handle *)0x10ed9a;
    fdb_doc_create((fdb_doc **)&pfStack_3728,
                   *(_func_size_t_bnode_ptr_void_ptr_void_ptr_void_ptr_size_t **)
                    (auStack_3710._16_8_ + 0x20),
                   (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)auStack_3710._16_8_,
                   *(btree_print_func **)(auStack_3710._16_8_ + 0x38),
                   (size_t)*(_func_void_bnode_ptr_idx_t_void_ptr_void_ptr **)
                            (auStack_3710._16_8_ + 8),(void *)0x0,0);
    *(bool *)&pfStack_3728->file = true;
    pfStack_3740 = (fdb_kvs_handle *)0x10edac;
    fdb_set(pfStack_3730,(fdb_doc *)pfStack_3728);
    pfStack_3740 = (fdb_kvs_handle *)0x10edb5;
    fdb_doc_free((fdb_doc *)pfStack_3728);
    pfStack_3740 = (fdb_kvs_handle *)0x10edc4;
    fdb_commit(pfStack_3720,'\x01');
    pfStack_3740 = (fdb_kvs_handle *)0x10edd5;
    fdb_compact(pfStack_3720,"./compact_test2");
    pfStack_3740 = (fdb_kvs_handle *)0x10ede1;
    system("cp  compact_test1 compact_test11 > errorlog.txt");
    pfStack_3740 = (fdb_kvs_handle *)0x10edf7;
    sprintf(acStack_3388,"key%d",2);
    pfStack_3740 = (fdb_kvs_handle *)0x10ee0d;
    sprintf(acStack_3488,"meta%d",2);
    pfStack_3740 = (fdb_kvs_handle *)0x10ee23;
    sprintf((char *)pbVar17,"body%d",2);
    pfVar11 = (fdb_kvs_handle *)(auStack_3710 + 0x18);
    pfStack_3740 = (fdb_kvs_handle *)0x10ee30;
    doc._M_i = strlen(acStack_3388);
    pfStack_3740 = (fdb_kvs_handle *)0x10ee3b;
    pfVar9 = (fdb_kvs_handle *)strlen(acStack_3488);
    pfStack_3740 = (fdb_kvs_handle *)0x10ee46;
    sVar8 = strlen((char *)pbVar17);
    pfStack_3740 = (fdb_kvs_handle *)0x10ee61;
    fdb_doc_create((fdb_doc **)pfVar11,acStack_3388,doc._M_i,acStack_3488,(size_t)pfVar9,pbVar17,
                   sVar8);
    pfStack_3740 = (fdb_kvs_handle *)0x10ee6f;
    fdb_set(pfStack_3730,(fdb_doc *)auStack_3710._24_8_);
    pfStack_3740 = (fdb_kvs_handle *)0x10ee7e;
    fdb_commit(pfStack_3720,'\x01');
    pfStack_3740 = (fdb_kvs_handle *)0x10ee88;
    fdb_kvs_close(pfStack_3730);
    ppfVar22 = &pfStack_3718;
    pfStack_3740 = (fdb_kvs_handle *)0x10ee95;
    fdb_kvs_close(pfStack_3718);
    pfStack_3740 = (fdb_kvs_handle *)0x10ee9f;
    fdb_close(pfStack_3720);
    pfVar16 = (fdb_kvs_handle *)auStack_3710;
    pfStack_3740 = (fdb_kvs_handle *)0x10eeac;
    fdb_close((fdb_file_handle *)auStack_3710._0_8_);
    pfStack_3740 = (fdb_kvs_handle *)0x10eeb8;
    system("mv  compact_test11 compact_test1 > errorlog.txt");
    pfStack_3740 = (fdb_kvs_handle *)0x10eecf;
    fdb_open((fdb_file_handle **)pfVar16,"./compact_test1",&fStack_3680);
    pfStack_3740 = (fdb_kvs_handle *)0x10eedf;
    fdb_kvs_open_default
              ((fdb_file_handle *)auStack_3710._0_8_,ppfVar22,(fdb_kvs_config *)auStack_36f0);
    pfStack_3740 = (fdb_kvs_handle *)0x10eef5;
    fVar5 = fdb_set_log_callback(pfStack_3718,logCallbackFunc,"auto_recover_compact_ok_test");
    if (fVar5 == FDB_RESULT_SUCCESS) {
      doc._M_i = 0;
      ppfVar22 = &pfStack_3728;
      while( true ) {
        pfStack_3740 = (fdb_kvs_handle *)0x10ef29;
        fdb_doc_create((fdb_doc **)ppfVar22,
                       (void *)(*(size_t **)(auStack_3710 + doc._M_i * 8 + 8))[4],
                       **(size_t **)(auStack_3710 + doc._M_i * 8 + 8),(void *)0x0,0,(void *)0x0,0);
        pfStack_3740 = (fdb_kvs_handle *)0x10ef38;
        fVar5 = fdb_get(pfStack_3718,(fdb_doc *)pfStack_3728);
        pfVar28 = pfStack_3728;
        if ((fdb_kvs_handle *)doc._M_i != (fdb_kvs_handle *)0x1) break;
        if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0010f073;
LAB_0010ef9e:
        pfStack_3740 = (fdb_kvs_handle *)0x10efa6;
        fdb_doc_free((fdb_doc *)pfVar28);
        doc._M_i = (__int_type_conflict)&(((fdb_kvs_handle *)doc._M_i)->kvs_config).field_0x1;
        pfVar16 = pfVar28;
        if ((undefined1 *)doc._M_i == (undefined1 *)0x3) {
          pfStack_3740 = (fdb_kvs_handle *)0x10efc5;
          fdb_get_file_info((fdb_file_handle *)auStack_3710._0_8_,&fStack_36c8);
          pfStack_3740 = (fdb_kvs_handle *)0x10efd4;
          iVar6 = strcmp("./compact_test2",fStack_36c8.filename);
          if (iVar6 != 0) {
            pfStack_3740 = (fdb_kvs_handle *)0x10efe2;
            auto_recover_compact_ok_test();
          }
          pfStack_3740 = (fdb_kvs_handle *)0x10efec;
          fdb_kvs_close(pfStack_3718);
          pfStack_3740 = (fdb_kvs_handle *)0x10eff6;
          fdb_close((fdb_file_handle *)auStack_3710._0_8_);
          lVar20 = 0;
          do {
            pfStack_3740 = (fdb_kvs_handle *)0x10f002;
            fdb_doc_free(*(fdb_doc **)(auStack_3710 + lVar20 * 8 + 8));
            lVar20 = lVar20 + 1;
          } while (lVar20 != 3);
          pfStack_3740 = (fdb_kvs_handle *)0x10f010;
          fdb_shutdown();
          pfStack_3740 = (fdb_kvs_handle *)0x10f015;
          memleak_end();
          pcVar27 = "%s PASSED\n";
          if (auto_recover_compact_ok_test()::__test_pass != '\0') {
            pcVar27 = "%s FAILED\n";
          }
          pfStack_3740 = (fdb_kvs_handle *)0x10f046;
          fprintf(_stderr,pcVar27,"auto recovery after compaction test");
          return;
        }
      }
      if (fVar5 == FDB_RESULT_SUCCESS) {
        pbVar17 = pfStack_3728->staletree;
        pfVar9 = *(fdb_kvs_handle **)(auStack_3710 + doc._M_i * 8 + 8);
        pfVar11 = (fdb_kvs_handle *)pfVar9->staletree;
        pfStack_3740 = (fdb_kvs_handle *)0x10ef77;
        iVar6 = bcmp(pbVar17,pfVar11,(size_t)(pfStack_3728->kvs_config).custom_cmp);
        if (iVar6 == 0) {
          pbVar17 = (pfVar28->field_6).seqtree;
          pfVar11 = (fdb_kvs_handle *)(pfVar9->field_6).seqtree;
          pfStack_3740 = (fdb_kvs_handle *)0x10ef96;
          iVar6 = bcmp(pbVar17,pfVar11,(size_t)(pfVar28->kvs_config).custom_cmp_param);
          if (iVar6 == 0) goto LAB_0010ef9e;
          pfStack_3740 = (fdb_kvs_handle *)0x10f063;
          auto_recover_compact_ok_test();
          pfVar16 = pfVar28;
          goto LAB_0010f063;
        }
      }
      else {
LAB_0010f063:
        pfVar28 = pfVar16;
        pfStack_3740 = (fdb_kvs_handle *)0x10f068;
        auto_recover_compact_ok_test();
      }
      pfStack_3740 = (fdb_kvs_handle *)0x10f073;
      auto_recover_compact_ok_test();
      pfVar16 = pfVar28;
LAB_0010f073:
      pfStack_3740 = (fdb_kvs_handle *)0x10f078;
      auto_recover_compact_ok_test();
      goto LAB_0010f078;
    }
  }
  else {
LAB_0010f078:
    pfStack_3740 = (fdb_kvs_handle *)0x10f07d;
    auto_recover_compact_ok_test();
LAB_0010f07d:
    pfStack_3740 = (fdb_kvs_handle *)0x10f082;
    auto_recover_compact_ok_test();
  }
  pfStack_3740 = (fdb_kvs_handle *)unlink_after_compaction_test;
  auto_recover_compact_ok_test();
  pfStack_3ca8 = (fdb_kvs_handle *)0x10f0a7;
  ppfStack_3768 = ppfVar22;
  pfStack_3760 = pfVar11;
  pfStack_3758 = (fdb_kvs_handle *)doc._M_i;
  pfStack_3750 = pfVar16;
  pbStack_3748 = pbVar17;
  pfStack_3740 = pfVar9;
  gettimeofday(&tStack_3c18,(__timezone_ptr_t)0x0);
  pfStack_3ca8 = (fdb_kvs_handle *)0x10f0ac;
  memleak_start();
  pfStack_3ca8 = (fdb_kvs_handle *)0x10f0b8;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_3ca8 = (fdb_kvs_handle *)0x10f0c8;
  fdb_get_default_config();
  pfVar16 = (fdb_kvs_handle *)auStack_3c08;
  pfStack_3ca8 = (fdb_kvs_handle *)0x10f0d8;
  fdb_get_default_kvs_config();
  fStack_3860.buffercache_size = 0x1000000;
  fStack_3860.wal_threshold = 0x400;
  fStack_3860.flags = 1;
  fStack_3860.compaction_threshold = '\0';
  ppfVar38 = &pfStack_3c80;
  pfStack_3ca8 = (fdb_kvs_handle *)0x10f10a;
  fdb_open((fdb_file_handle **)ppfVar38,"./compact_test1",&fStack_3860);
  ptr_handle = (list *)(auStack_3c90 + 8);
  pfStack_3ca8 = (fdb_kvs_handle *)0x10f11d;
  fdb_kvs_open_default
            ((fdb_file_handle *)pfStack_3c80,(fdb_kvs_handle **)ptr_handle,(fdb_kvs_config *)pfVar16
            );
  pfStack_3ca8 = (fdb_kvs_handle *)0x10f133;
  fVar5 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_3c90._8_8_,logCallbackFunc,
                     "unlink_after_compaction_test");
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfVar11 = (fdb_kvs_handle *)0x0;
    uVar19 = 0;
    do {
      pfStack_3ca8 = (fdb_kvs_handle *)0x10f15b;
      sprintf(acStack_39f0,"key%d",uVar19 & 0xffffffff);
      pfStack_3ca8 = (fdb_kvs_handle *)0x10f173;
      sprintf(auStack_3c08 + 0x118,"meta%d",uVar19 & 0xffffffff);
      pfStack_3ca8 = (fdb_kvs_handle *)0x10f18b;
      sprintf(auStack_3c08 + 0x18,"body%d",uVar19 & 0xffffffff);
      ppfVar38 = (fdb_doc **)((long)apfStack_3c70 + (long)pfVar11);
      pfStack_3ca8 = (fdb_kvs_handle *)0x10f19b;
      doc._M_i = strlen(acStack_39f0);
      pfVar9 = (fdb_kvs_handle *)(auStack_3c08 + 0x118);
      pfStack_3ca8 = (fdb_kvs_handle *)0x10f1ae;
      pfVar16 = (fdb_kvs_handle *)strlen((char *)pfVar9);
      pfStack_3ca8 = (fdb_kvs_handle *)0x10f1be;
      sVar8 = strlen(auStack_3c08 + 0x18);
      pfStack_3ca8 = (fdb_kvs_handle *)0x10f1e3;
      fdb_doc_create(ppfVar38,acStack_39f0,doc._M_i,pfVar9,(size_t)pfVar16,auStack_3c08 + 0x18,sVar8
                    );
      pfStack_3ca8 = (fdb_kvs_handle *)0x10f1f2;
      fdb_set((fdb_kvs_handle *)auStack_3c90._8_8_,apfStack_3c70[uVar19]);
      uVar19 = uVar19 + 1;
      pfVar11 = (fdb_kvs_handle *)((long)pfVar11 + 8);
    } while (uVar19 != 10);
    pfStack_3ca8 = (fdb_kvs_handle *)0x10f212;
    fdb_commit((fdb_file_handle *)pfStack_3c80,'\x01');
    pfStack_3ca8 = (fdb_kvs_handle *)0x10f226;
    fVar5 = fdb_snapshot_open((fdb_kvs_handle *)auStack_3c90._8_8_,&pfStack_3c78,10);
    ptr_handle = (list *)0xa;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010f38b;
    pfStack_3ca8 = (fdb_kvs_handle *)0x10f23f;
    fVar5 = fdb_compact((fdb_file_handle *)pfStack_3c80,"./compact_test2");
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfVar16 = (fdb_kvs_handle *)0x0;
      do {
        pfStack_3ca8 = (fdb_kvs_handle *)0x10f273;
        fdb_doc_create((fdb_doc **)auStack_3c90,apfStack_3c70[(long)pfVar16]->key,
                       apfStack_3c70[(long)pfVar16]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_3ca8 = (fdb_kvs_handle *)0x10f282;
        fVar5 = fdb_get((fdb_kvs_handle *)auStack_3c90._8_8_,(fdb_doc *)auStack_3c90._0_8_);
        if (fVar5 != FDB_RESULT_SUCCESS) {
          pfStack_3ca8 = (fdb_kvs_handle *)0x10f381;
          unlink_after_compaction_test();
          goto LAB_0010f381;
        }
        pfStack_3ca8 = (fdb_kvs_handle *)0x10f294;
        fdb_doc_free((fdb_doc *)auStack_3c90._0_8_);
        pfVar16 = (fdb_kvs_handle *)&(pfVar16->kvs_config).field_0x1;
      } while (pfVar16 != (fdb_kvs_handle *)0xa);
      pfStack_3ca8 = (fdb_kvs_handle *)0x10f2b1;
      iVar6 = stat("./compact_test1",&sStack_38f0);
      if (iVar6 == 0) {
        pfStack_3ca8 = (fdb_kvs_handle *)0x10f2ba;
        unlink_after_compaction_test();
      }
      pfVar16 = (fdb_kvs_handle *)0x0;
      while( true ) {
        pfStack_3ca8 = (fdb_kvs_handle *)0x10f2e6;
        fdb_doc_create((fdb_doc **)auStack_3c90,apfStack_3c70[(long)pfVar16]->key,
                       apfStack_3c70[(long)pfVar16]->keylen,(void *)0x0,0,(void *)0x0,0);
        pfStack_3ca8 = (fdb_kvs_handle *)0x10f2f5;
        fVar5 = fdb_get(pfStack_3c78,(fdb_doc *)auStack_3c90._0_8_);
        if (fVar5 != FDB_RESULT_SUCCESS) break;
        pfStack_3ca8 = (fdb_kvs_handle *)0x10f307;
        fdb_doc_free((fdb_doc *)auStack_3c90._0_8_);
        pfVar16 = (fdb_kvs_handle *)&(pfVar16->kvs_config).field_0x1;
        if (pfVar16 == (fdb_kvs_handle *)0xa) {
          pfStack_3ca8 = (fdb_kvs_handle *)0x10f31a;
          fdb_close((fdb_file_handle *)pfStack_3c80);
          pfStack_3ca8 = (fdb_kvs_handle *)0x10f31f;
          fdb_shutdown();
          lVar20 = 0;
          do {
            pfStack_3ca8 = (fdb_kvs_handle *)0x10f32b;
            fdb_doc_free(apfStack_3c70[lVar20]);
            lVar20 = lVar20 + 1;
          } while (lVar20 != 10);
          pfStack_3ca8 = (fdb_kvs_handle *)0x10f339;
          memleak_end();
          pcVar27 = "%s PASSED\n";
          if (unlink_after_compaction_test()::__test_pass != '\0') {
            pcVar27 = "%s FAILED\n";
          }
          pfStack_3ca8 = (fdb_kvs_handle *)0x10f36a;
          fprintf(_stderr,pcVar27,"unlink after compaction test");
          return;
        }
      }
LAB_0010f381:
      ptr_handle = (list *)auStack_3c90;
      pfStack_3ca8 = (fdb_kvs_handle *)0x10f386;
      unlink_after_compaction_test();
      goto LAB_0010f386;
    }
  }
  else {
LAB_0010f386:
    pfStack_3ca8 = (fdb_kvs_handle *)0x10f38b;
    unlink_after_compaction_test();
LAB_0010f38b:
    pfStack_3ca8 = (fdb_kvs_handle *)0x10f390;
    unlink_after_compaction_test();
  }
  pfStack_3ca8 = (fdb_kvs_handle *)db_compact_overwrite;
  unlink_after_compaction_test();
  pfStack_4450 = (fdb_kvs_handle *)0x10f3b5;
  fStack_3eb8.bub_ctx.entries = ptr_handle;
  fStack_3eb8.bub_ctx.num_entries = (uint64_t)pfVar11;
  fStack_3eb8.bub_ctx.space_used = doc._M_i;
  fStack_3eb8.bub_ctx.handle = pfVar16;
  ppfStack_3cb0 = ppfVar38;
  pfStack_3ca8 = pfVar9;
  gettimeofday(&tStack_43b8,(__timezone_ptr_t)0x0);
  pfStack_4450 = (fdb_kvs_handle *)0x10f3ba;
  memleak_start();
  pfStack_4450 = (fdb_kvs_handle *)0x10f3c6;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_4450 = (fdb_kvs_handle *)0x10f3d6;
  fdb_get_default_config();
  kvs_config_00 = &fStack_4400;
  pfStack_4450 = (fdb_kvs_handle *)0x10f3e3;
  fdb_get_default_kvs_config();
  auStack_42a8._256_8_ = 0x1000000;
  auStack_42a8._264_8_ = 0x400;
  auStack_42a8._284_4_ = 1;
  auStack_42a8[0x127] = 0;
  pfVar16 = (fdb_kvs_handle *)(auStack_4428 + 0x18);
  pfStack_4450 = (fdb_kvs_handle *)0x10f415;
  fdb_open((fdb_file_handle **)pfVar16,"./compact_test1",(fdb_config *)(auStack_42a8 + 0xf8));
  ppfVar22 = (fdb_kvs_handle **)(auStack_4428 + 8);
  pfStack_4450 = (fdb_kvs_handle *)0x10f42a;
  fdb_kvs_open((fdb_file_handle *)auStack_4428._24_8_,ppfVar22,(char *)0x0,kvs_config_00);
  pfStack_4450 = (fdb_kvs_handle *)0x10f440;
  pfVar28 = (fdb_kvs_handle *)auStack_4428._8_8_;
  fVar5 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_4428._8_8_,logCallbackFunc,"db_destroy_test");
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfVar11 = (fdb_kvs_handle *)0x0;
    uVar19 = 0;
    do {
      pfStack_4450 = (fdb_kvs_handle *)0x10f468;
      sprintf(acStack_3fb8,"key%d",uVar19 & 0xffffffff);
      pfStack_4450 = (fdb_kvs_handle *)0x10f480;
      sprintf(auStack_42a8 + 0x1f0,"meta%d",uVar19 & 0xffffffff);
      pfStack_4450 = (fdb_kvs_handle *)0x10f498;
      sprintf(acStack_43a8,"body%d",uVar19 & 0xffffffff);
      pfVar16 = (fdb_kvs_handle *)(auStack_42a8 + (long)pfVar11);
      pfStack_4450 = (fdb_kvs_handle *)0x10f4ab;
      doc._M_i = strlen(acStack_3fb8);
      pfVar9 = (fdb_kvs_handle *)(auStack_42a8 + 0x1f0);
      pfStack_4450 = (fdb_kvs_handle *)0x10f4be;
      kvs_config_00 = (fdb_kvs_config *)strlen((char *)pfVar9);
      pfStack_4450 = (fdb_kvs_handle *)0x10f4ce;
      sVar8 = strlen(acStack_43a8);
      pfStack_4450 = (fdb_kvs_handle *)0x10f4f3;
      fdb_doc_create((fdb_doc **)pfVar16,acStack_3fb8,doc._M_i,pfVar9,(size_t)kvs_config_00,
                     acStack_43a8,sVar8);
      pfStack_4450 = (fdb_kvs_handle *)0x10f505;
      fdb_set((fdb_kvs_handle *)auStack_4428._8_8_,*(fdb_doc **)(auStack_42a8 + uVar19 * 8));
      uVar19 = uVar19 + 1;
      pfVar11 = (fdb_kvs_handle *)((long)pfVar11 + 8);
    } while (uVar19 != 0x1e);
    pfStack_4450 = (fdb_kvs_handle *)0x10f522;
    fdb_commit((fdb_file_handle *)auStack_4428._24_8_,'\0');
    pfStack_4450 = (fdb_kvs_handle *)0x10f53e;
    fdb_open((fdb_file_handle **)(auStack_4428 + 0x10),"./compact_test1.1",
             (fdb_config *)(auStack_42a8 + 0xf8));
    ppfVar22 = (fdb_kvs_handle **)auStack_4438;
    pfStack_4450 = (fdb_kvs_handle *)0x10f555;
    fdb_kvs_open((fdb_file_handle *)auStack_4428._16_8_,ppfVar22,(char *)0x0,&fStack_4400);
    pfStack_4450 = (fdb_kvs_handle *)0x10f56b;
    pfVar28 = (fdb_kvs_handle *)auStack_4438._0_8_;
    fVar5 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_4438._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010f9da;
    pfVar11 = (fdb_kvs_handle *)0x0;
    uVar19 = 0;
    do {
      pfStack_4450 = (fdb_kvs_handle *)0x10f593;
      sprintf(acStack_3fb8,"k2ey%d",uVar19 & 0xffffffff);
      pfStack_4450 = (fdb_kvs_handle *)0x10f5ab;
      sprintf(auStack_42a8 + 0x1f0,"m2eta%d",uVar19 & 0xffffffff);
      pfStack_4450 = (fdb_kvs_handle *)0x10f5c3;
      sprintf(acStack_43a8,"b2ody%d",uVar19 & 0xffffffff);
      pfVar16 = (fdb_kvs_handle *)(&fStack_3eb8.kvs_config.create_if_missing + (long)pfVar11);
      pfStack_4450 = (fdb_kvs_handle *)0x10f5d6;
      doc._M_i = strlen(acStack_3fb8);
      pfVar9 = (fdb_kvs_handle *)(auStack_42a8 + 0x1f0);
      pfStack_4450 = (fdb_kvs_handle *)0x10f5e9;
      kvs_config_00 = (fdb_kvs_config *)strlen((char *)pfVar9);
      pfStack_4450 = (fdb_kvs_handle *)0x10f5f9;
      sVar8 = strlen(acStack_43a8);
      pfStack_4450 = (fdb_kvs_handle *)0x10f61e;
      fdb_doc_create((fdb_doc **)pfVar16,acStack_3fb8,doc._M_i,pfVar9,(size_t)kvs_config_00,
                     acStack_43a8,sVar8);
      pfStack_4450 = (fdb_kvs_handle *)0x10f630;
      fdb_set((fdb_kvs_handle *)auStack_4438._0_8_,
              *(fdb_doc **)(&fStack_3eb8.kvs_config.create_if_missing + uVar19 * 8));
      uVar19 = uVar19 + 1;
      pfVar11 = (fdb_kvs_handle *)((long)pfVar11 + 8);
    } while (uVar19 != 0x3c);
    pfStack_4450 = (fdb_kvs_handle *)0x10f64d;
    fdb_commit((fdb_file_handle *)auStack_4428._16_8_,'\0');
    pfStack_4450 = (fdb_kvs_handle *)0x10f65c;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_4438._0_8_,&fStack_43e8);
    if ((filemgr *)fStack_43e8.last_seqnum != (filemgr *)0x3c) {
      pfStack_4450 = (fdb_kvs_handle *)0x10f66c;
      db_compact_overwrite();
    }
    pfStack_4450 = (fdb_kvs_handle *)0x10f676;
    fdb_kvs_close((fdb_kvs_handle *)auStack_4438._0_8_);
    pfStack_4450 = (fdb_kvs_handle *)0x10f680;
    fdb_close((fdb_file_handle *)auStack_4428._16_8_);
    pfStack_4450 = (fdb_kvs_handle *)0x10f68c;
    pfVar28 = (fdb_kvs_handle *)auStack_4428._24_8_;
    fVar5 = fdb_compact((fdb_file_handle *)auStack_4428._24_8_,(char *)0x0);
    ppfVar22 = (fdb_kvs_handle **)0x3c;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010f9df;
    kvs_config_00 = (fdb_kvs_config *)(auStack_4428 + 8);
    pfStack_4450 = (fdb_kvs_handle *)0x10f6a1;
    fdb_kvs_close((fdb_kvs_handle *)auStack_4428._8_8_);
    pfVar16 = (fdb_kvs_handle *)(auStack_4428 + 0x18);
    pfStack_4450 = (fdb_kvs_handle *)0x10f6ae;
    fdb_close((fdb_file_handle *)auStack_4428._24_8_);
    pfStack_4450 = (fdb_kvs_handle *)0x10f6c5;
    fdb_open((fdb_file_handle **)pfVar16,"./compact_test1",(fdb_config *)(auStack_42a8 + 0xf8));
    pfStack_4450 = (fdb_kvs_handle *)0x10f6d7;
    fdb_kvs_open((fdb_file_handle *)auStack_4428._24_8_,(fdb_kvs_handle **)kvs_config_00,(char *)0x0
                 ,&fStack_4400);
    pfStack_4450 = (fdb_kvs_handle *)0x10f6ed;
    pfVar28 = (fdb_kvs_handle *)auStack_4428._8_8_;
    fVar5 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_4428._8_8_,logCallbackFunc,"db_destroy_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010f9e4;
    ppfVar22 = (fdb_kvs_handle **)0x0;
    kvs_config_00 = (fdb_kvs_config *)(auStack_4438 + 8);
    pfVar16 = (fdb_kvs_handle *)auStack_4428;
    do {
      pfStack_4450 = (fdb_kvs_handle *)0x10f728;
      fdb_doc_create((fdb_doc **)kvs_config_00,
                     (void *)(*(size_t **)(auStack_42a8 + (long)ppfVar22))[4],
                     **(size_t **)(auStack_42a8 + (long)ppfVar22),(void *)0x0,0,(void *)0x0,0);
      pfStack_4450 = (fdb_kvs_handle *)0x10f737;
      pfVar28 = (fdb_kvs_handle *)auStack_4428._8_8_;
      fVar5 = fdb_get((fdb_kvs_handle *)auStack_4428._8_8_,(fdb_doc *)auStack_4438._8_8_);
      pfVar25 = (fdb_kvs_handle *)auStack_4438._8_8_;
      if (fVar5 != FDB_RESULT_SUCCESS) {
        pfStack_4450 = (fdb_kvs_handle *)0x10f9d0;
        db_compact_overwrite();
        goto LAB_0010f9d0;
      }
      doc._M_i = (__int_type_conflict)(auStack_42a8 + (long)ppfVar22);
      pfVar11 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)doc._M_i)->kvs_config;
      pfStack_4450 = (fdb_kvs_handle *)0x10f765;
      iVar6 = bcmp(*(btree **)(auStack_4438._8_8_ + 0x38),pfVar11->staletree,
                   (size_t)((fdb_kvs_config *)auStack_4438._8_8_)->custom_cmp);
      if (iVar6 != 0) {
        pfStack_4450 = (fdb_kvs_handle *)0x10f7ad;
        db_compact_overwrite();
        pfVar25 = pfStack_4408;
        pfVar11 = (fdb_kvs_handle *)auStack_4428._0_8_;
      }
      pfStack_4450 = (fdb_kvs_handle *)0x10f77b;
      iVar6 = bcmp((pfVar25->field_6).seqtree,(pfVar11->field_6).seqtree,
                   (size_t)(pfVar25->kvs_config).custom_cmp_param);
      pfVar9 = pfVar25;
      if (iVar6 != 0) {
        pfStack_4450 = (fdb_kvs_handle *)0x10f7c7;
        db_compact_overwrite();
        pfVar9 = (fdb_kvs_handle *)auStack_4428._0_8_;
      }
      pfStack_4450 = (fdb_kvs_handle *)0x10f787;
      fdb_doc_free((fdb_doc *)pfVar9);
      ppfVar22 = ppfVar22 + 1;
    } while (ppfVar22 != (fdb_kvs_handle **)0xf0);
    pfStack_4450 = (fdb_kvs_handle *)0x10f7ea;
    fdb_open((fdb_file_handle **)(auStack_4428 + 0x10),"./compact_test1.1",
             (fdb_config *)(auStack_42a8 + 0xf8));
    kvs_config_00 = (fdb_kvs_config *)auStack_4438;
    pfStack_4450 = (fdb_kvs_handle *)0x10f801;
    fdb_kvs_open((fdb_file_handle *)auStack_4428._16_8_,(fdb_kvs_handle **)kvs_config_00,(char *)0x0
                 ,&fStack_4400);
    pfStack_4450 = (fdb_kvs_handle *)0x10f817;
    pfVar28 = (fdb_kvs_handle *)auStack_4438._0_8_;
    fVar5 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_4438._0_8_,logCallbackFunc,"db_destroy_test");
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_4450 = (fdb_kvs_handle *)0x10f831;
      fdb_get_kvs_info((fdb_kvs_handle *)auStack_4438._0_8_,&fStack_43e8);
      if ((filemgr *)fStack_43e8.last_seqnum != (filemgr *)0x3c) {
        pfStack_4450 = (fdb_kvs_handle *)0x10f842;
        db_compact_overwrite();
      }
      pfVar9 = (fdb_kvs_handle *)0x0;
      ppfVar22 = (fdb_kvs_handle **)(auStack_4438 + 8);
      kvs_config_00 = (fdb_kvs_config *)auStack_4428;
      while( true ) {
        psVar4 = *(size_t **)
                  (&fStack_3eb8.kvs_config.create_if_missing +
                  (long)&(pfVar9->kvs_config).create_if_missing);
        pfStack_4450 = (fdb_kvs_handle *)0x10f875;
        fdb_doc_create((fdb_doc **)ppfVar22,(void *)psVar4[4],*psVar4,(void *)0x0,0,(void *)0x0,0);
        pfStack_4450 = (fdb_kvs_handle *)0x10f884;
        pfVar28 = (fdb_kvs_handle *)auStack_4438._0_8_;
        fVar5 = fdb_get((fdb_kvs_handle *)auStack_4438._0_8_,(fdb_doc *)auStack_4438._8_8_);
        pfVar25 = (fdb_kvs_handle *)auStack_4438._8_8_;
        if (fVar5 != FDB_RESULT_SUCCESS) break;
        pfVar11 = (fdb_kvs_handle *)
                  (&fStack_3eb8.kvs_config.create_if_missing +
                  (long)&(pfVar9->kvs_config).create_if_missing);
        pfVar16 = *(fdb_kvs_handle **)&pfVar11->kvs_config;
        pfStack_4450 = (fdb_kvs_handle *)0x10f8b1;
        iVar6 = bcmp(*(btree **)(auStack_4438._8_8_ + 0x38),pfVar16->staletree,
                     (size_t)((fdb_kvs_config *)auStack_4438._8_8_)->custom_cmp);
        if (iVar6 != 0) {
          pfStack_4450 = (fdb_kvs_handle *)0x10f8f8;
          db_compact_overwrite();
          pfVar25 = pfStack_4408;
          pfVar16 = (fdb_kvs_handle *)auStack_4428._0_8_;
        }
        pfStack_4450 = (fdb_kvs_handle *)0x10f8c6;
        iVar6 = bcmp((pfVar25->field_6).seqtree,(pfVar16->field_6).seqtree,
                     (size_t)(pfVar25->kvs_config).custom_cmp_param);
        doc._M_i = (__int_type_conflict)pfVar25;
        if (iVar6 != 0) {
          pfStack_4450 = (fdb_kvs_handle *)0x10f912;
          db_compact_overwrite();
          doc._M_i = auStack_4428._0_8_;
        }
        pfStack_4450 = (fdb_kvs_handle *)0x10f8d2;
        fdb_doc_free((fdb_doc *)doc._M_i);
        pfVar9 = (fdb_kvs_handle *)&(pfVar9->kvs_config).custom_cmp;
        if (pfVar9 == (fdb_kvs_handle *)0x1e0) {
          lVar20 = 0;
          do {
            pfStack_4450 = (fdb_kvs_handle *)0x10f928;
            fdb_doc_free(*(fdb_doc **)(auStack_42a8 + lVar20 * 8));
            pfStack_4450 = (fdb_kvs_handle *)0x10f935;
            fdb_doc_free(*(fdb_doc **)(&fStack_3eb8.kvs_config.create_if_missing + lVar20 * 8));
            lVar20 = lVar20 + 1;
          } while (lVar20 != 0x1e);
          lVar20 = 0;
          do {
            pfStack_4450 = (fdb_kvs_handle *)0x10f94d;
            fdb_doc_free(*(fdb_doc **)(fStack_3eb8.config.encryption_key.bytes + lVar20 * 8 + -0x14)
                        );
            lVar20 = lVar20 + 1;
          } while (lVar20 != 0x1e);
          pfStack_4450 = (fdb_kvs_handle *)0x10f960;
          fdb_kvs_close((fdb_kvs_handle *)auStack_4428._8_8_);
          pfStack_4450 = (fdb_kvs_handle *)0x10f96a;
          fdb_close((fdb_file_handle *)auStack_4428._24_8_);
          pfStack_4450 = (fdb_kvs_handle *)0x10f974;
          fdb_kvs_close((fdb_kvs_handle *)auStack_4438._0_8_);
          pfStack_4450 = (fdb_kvs_handle *)0x10f97e;
          fdb_close((fdb_file_handle *)auStack_4428._16_8_);
          pfStack_4450 = (fdb_kvs_handle *)0x10f983;
          fdb_shutdown();
          pfStack_4450 = (fdb_kvs_handle *)0x10f988;
          memleak_end();
          pcVar27 = "%s PASSED\n";
          if (db_compact_overwrite()::__test_pass != '\0') {
            pcVar27 = "%s FAILED\n";
          }
          pfStack_4450 = (fdb_kvs_handle *)0x10f9b9;
          fprintf(_stderr,pcVar27,"compact overwrite");
          return;
        }
      }
LAB_0010f9d0:
      pfStack_4450 = (fdb_kvs_handle *)0x10f9d5;
      db_compact_overwrite();
      goto LAB_0010f9d5;
    }
  }
  else {
LAB_0010f9d5:
    pfStack_4450 = (fdb_kvs_handle *)0x10f9da;
    db_compact_overwrite();
LAB_0010f9da:
    pfStack_4450 = (fdb_kvs_handle *)0x10f9df;
    db_compact_overwrite();
LAB_0010f9df:
    pfStack_4450 = (fdb_kvs_handle *)0x10f9e4;
    db_compact_overwrite();
LAB_0010f9e4:
    pfStack_4450 = (fdb_kvs_handle *)0x10f9e9;
    db_compact_overwrite();
  }
  pfStack_4450 = (fdb_kvs_handle *)db_compact_during_doc_delete;
  db_compact_overwrite();
  ppfStack_4478 = ppfVar22;
  pfStack_4470 = pfVar11;
  pfStack_4468 = (fdb_kvs_handle *)doc._M_i;
  pfStack_4460 = kvs_config_00;
  pfStack_4458 = pfVar16;
  pfStack_4450 = pfVar9;
  gettimeofday(&tStack_4ba8,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fStack_4b98.buffercache_size = 0;
  fStack_4b98.wal_threshold = 0x400;
  fStack_4b98.compaction_threshold = '\0';
  if (pfVar28 == (fdb_kvs_handle *)0x0) {
    system("rm -rf  compact_test* > errorlog.txt");
    _Var33._M_i = (__int_type_conflict)&pfStack_4c10;
    fVar5 = fdb_open((fdb_file_handle **)_Var33._M_i,"./compact_test1",&fStack_4b98);
    if (fVar5 == FDB_RESULT_SUCCESS) {
      _Var33._M_i = (__int_type_conflict)pfStack_4c10;
      fVar5 = fdb_kvs_open_default((fdb_file_handle *)pfStack_4c10,&pfStack_4c08,&fStack_4bf0);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010fd42;
      lVar20 = 0;
      uVar19 = 0;
      do {
        pfVar2 = &afStack_49a0[0].config.encryption_key;
        sprintf((char *)pfVar2,"key%d",uVar19 & 0xffffffff);
        sprintf((char *)afStack_49a0,"meta%d",uVar19 & 0xffffffff);
        sprintf(acStack_4aa0,"body%d",uVar19 & 0xffffffff);
        doc._M_i = strlen((char *)pfVar2);
        pfVar9 = afStack_49a0;
        sVar8 = strlen((char *)pfVar9);
        sVar10 = strlen(acStack_4aa0);
        fdb_doc_create((fdb_doc **)((long)&afStack_49a0[0].bub_ctx.handle + lVar20),
                       &afStack_49a0[0].config.encryption_key,doc._M_i,pfVar9,sVar8,acStack_4aa0,
                       sVar10);
        fdb_set(pfStack_4c08,(fdb_doc *)(&afStack_49a0[0].bub_ctx.handle)[uVar19]);
        uVar19 = uVar19 + 1;
        lVar20 = lVar20 + 8;
      } while (uVar19 != 100);
      fdb_commit((fdb_file_handle *)pfStack_4c10,'\0');
      fdb_get_kvs_info(pfStack_4c08,&fStack_4bd8);
      if ((filemgr *)fStack_4bd8.doc_count != (filemgr *)0x64) {
        db_compact_during_doc_delete();
      }
      lVar20 = 0;
      pfVar16 = (fdb_kvs_handle *)&plStack_4c00;
      do {
        fdb_del(pfStack_4c08,(fdb_doc *)(&afStack_49a0[0].bub_ctx.handle)[lVar20]);
        if (lVar20 == 0x32) {
          pthread_create((pthread_t *)pfVar16,(pthread_attr_t *)0x0,db_compact_during_doc_delete,
                         pfStack_4c10);
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 != 100);
      pthread_join((pthread_t)plStack_4c00,&pvStack_4bf8);
      fdb_commit((fdb_file_handle *)pfStack_4c10,'\x01');
      fdb_get_kvs_info(pfStack_4c08,&fStack_4bd8);
      if ((filemgr *)fStack_4bd8.doc_count != (filemgr *)0x0) {
        db_compact_during_doc_delete();
      }
      fdb_kvs_close(pfStack_4c08);
      _Var33._M_i = (__int_type_conflict)&pfStack_4c10;
      fdb_close((fdb_file_handle *)pfStack_4c10);
      fVar5 = fdb_open((fdb_file_handle **)_Var33._M_i,"./compact_test1",&fStack_4b98);
      pfVar11 = (fdb_kvs_handle *)0x64;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010fd47;
      _Var33._M_i = (__int_type_conflict)pfStack_4c10;
      fVar5 = fdb_kvs_open_default((fdb_file_handle *)pfStack_4c10,&pfStack_4c08,&fStack_4bf0);
      if (fVar5 == FDB_RESULT_SUCCESS) {
        fdb_get_kvs_info(pfStack_4c08,&fStack_4bd8);
        if ((filemgr *)fStack_4bd8.doc_count != (filemgr *)0x0) {
          db_compact_during_doc_delete();
        }
        lVar20 = 0;
        do {
          fdb_doc_free((fdb_doc *)(&afStack_49a0[0].bub_ctx.handle)[lVar20]);
          lVar20 = lVar20 + 1;
        } while (lVar20 != 100);
        fdb_kvs_close(pfStack_4c08);
        fdb_close((fdb_file_handle *)pfStack_4c10);
        fdb_shutdown();
        memleak_end();
        pcVar27 = "%s PASSED\n";
        if (db_compact_during_doc_delete(void*)::__test_pass != '\0') {
          pcVar27 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar27,"multi thread client shutdown");
        return;
      }
    }
    else {
      db_compact_during_doc_delete();
LAB_0010fd42:
      db_compact_during_doc_delete();
LAB_0010fd47:
      db_compact_during_doc_delete();
    }
    db_compact_during_doc_delete();
LAB_0010fd51:
    db_compact_during_doc_delete();
  }
  else {
    _Var33._M_i = (__int_type_conflict)&pfStack_4c10;
    fVar5 = fdb_open((fdb_file_handle **)_Var33._M_i,"./compact_test1",&fStack_4b98);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0010fd51;
    _Var33._M_i = (__int_type_conflict)pfStack_4c10;
    fVar5 = fdb_compact((fdb_file_handle *)pfStack_4c10,(char *)0x0);
    if (fVar5 == FDB_RESULT_SUCCESS) {
      fdb_close((fdb_file_handle *)pfStack_4c10);
      pthread_exit((void *)0x0);
    }
  }
  db_compact_during_doc_delete();
  ptr_fhandle = (filemgr *)0x0;
  pfStack_189d0 = (fdb_kvs_handle *)0x10fd83;
  auStack_18998._8_8_ = _Var33._M_i;
  gettimeofday(&tStack_18830,(__timezone_ptr_t)0x0);
  pfStack_189d0 = (fdb_kvs_handle *)0x10fd88;
  memleak_start();
  pfStack_189d0 = (fdb_kvs_handle *)0x10fd94;
  system("rm -rf  compact_test* > errorlog.txt");
  pcVar27 = auStack_18938;
  pfStack_189d0 = (fdb_kvs_handle *)0x10fda4;
  fdb_get_default_config();
  pfStack_189d0 = (fdb_kvs_handle *)0x10fdae;
  fdb_get_default_kvs_config();
  auStack_18938._8_8_ = 0;
  aStack_18928.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x400;
  fStack_18914 = 1;
  uStack_1890a = 0x1e01;
  pfStack_18900 = (filemgr *)0x1;
  aStack_188c0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  pcVar7 = auStack_189c0;
  pfStack_189d0 = (fdb_kvs_handle *)0x10fde7;
  fVar5 = fdb_open((fdb_file_handle **)pcVar7,"compact_test",(fdb_config *)pcVar27);
  if (fVar5 == FDB_RESULT_INVALID_CONFIG) {
    aStack_188c0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)4;
    pfStack_189d0 = (fdb_kvs_handle *)0x10fe14;
    fdb_open((fdb_file_handle **)auStack_189c0,"compact_test",(fdb_config *)auStack_18938);
    pcVar27 = auStack_189b8;
    pfStack_189d0 = (fdb_kvs_handle *)0x10fe29;
    fdb_kvs_open_default((fdb_file_handle *)auStack_189c0,(fdb_kvs_handle **)pcVar27,&fStack_18988);
    pfStack_189d0 = (fdb_kvs_handle *)0x10fe3f;
    pcVar7 = (char *)auStack_189b8;
    fVar5 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_189b8,logCallbackFunc,"compaction_daemon_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001108c8;
    pfStack_189d0 = (fdb_kvs_handle *)0x10fe53;
    puts("Initialize..");
    doc._M_i = 0;
    uVar19 = 0;
    do {
      pfStack_189d0 = (fdb_kvs_handle *)0x10fe75;
      sprintf(auStack_18820 + 0x48,"key%04d",uVar19 & 0xffffffff);
      pfStack_189d0 = (fdb_kvs_handle *)0x10fe8e;
      sprintf(acStack_185d8,"meta%04d",uVar19 & 0xffffffff);
      pfStack_189d0 = (fdb_kvs_handle *)0x10fea7;
      sprintf(acStack_186d8,"body%04d",uVar19 & 0xffffffff);
      pfVar11 = (fdb_kvs_handle *)(&afStack_184d8[0].kvs_config.create_if_missing + doc._M_i);
      pfStack_189d0 = (fdb_kvs_handle *)0x10feba;
      sVar8 = strlen(auStack_18820 + 0x48);
      pfVar9 = (fdb_kvs_handle *)(sVar8 + 1);
      pfStack_189d0 = (fdb_kvs_handle *)0x10fece;
      sVar8 = strlen(acStack_185d8);
      pfVar16 = (fdb_kvs_handle *)(sVar8 + 1);
      pfStack_189d0 = (fdb_kvs_handle *)0x10fedf;
      sVar8 = strlen(acStack_186d8);
      pfStack_189d0 = (fdb_kvs_handle *)0x10ff07;
      fdb_doc_create((fdb_doc **)pfVar11,auStack_18820 + 0x48,(size_t)pfVar9,acStack_185d8,
                     (size_t)pfVar16,acStack_186d8,sVar8 + 1);
      pfStack_189d0 = (fdb_kvs_handle *)0x10ff19;
      fdb_set((fdb_kvs_handle *)auStack_189b8,
              *(fdb_doc **)(&afStack_184d8[0].kvs_config.create_if_missing + uVar19 * 8));
      uVar19 = uVar19 + 1;
      doc._M_i = doc._M_i + 8;
    } while (uVar19 != 10000);
    pcVar27 = auStack_189c0;
    pfStack_189d0 = (fdb_kvs_handle *)0x10ff3c;
    fdb_commit((fdb_file_handle *)auStack_189c0,'\0');
    pfStack_189d0 = (fdb_kvs_handle *)0x10ff44;
    fdb_close((fdb_file_handle *)auStack_189c0);
    pfStack_189d0 = (fdb_kvs_handle *)0x10ff5b;
    pcVar7 = pcVar27;
    fVar5 = fdb_open((fdb_file_handle **)pcVar27,"compact_test",(fdb_config *)auStack_18938);
    ptr_fhandle = (filemgr *)0x2710;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001108cd;
    pfStack_189d0 = (fdb_kvs_handle *)0x10ff77;
    pcVar7 = (char *)auStack_189c0;
    fVar5 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_189c0,(fdb_kvs_handle **)auStack_189b8,
                       &fStack_18988);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001108d2;
    pfStack_189d0 = (fdb_kvs_handle *)0x10ff97;
    pcVar7 = (char *)auStack_189b8;
    fVar5 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_189b8,logCallbackFunc,"compaction_daemon_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001108d7;
    pcVar27 = auStack_18820;
    pfStack_189d0 = (fdb_kvs_handle *)0x10ffb4;
    fdb_get_file_info((fdb_file_handle *)auStack_189c0,(fdb_file_info *)pcVar27);
    pfStack_189d0 = (fdb_kvs_handle *)0x10ffc3;
    iVar6 = strcmp((char *)auStack_18820._0_8_,"compact_test");
    if (iVar6 != 0) {
      pfStack_189d0 = (fdb_kvs_handle *)0x10ffd4;
      compaction_daemon_test();
    }
    ptr_fhandle = (filemgr *)(auStack_18820 + 0x48);
    pfVar16 = (fdb_kvs_handle *)auStack_189a8;
    pfVar11 = (fdb_kvs_handle *)0x0;
    _Var33._M_i = doc._M_i;
    do {
      pfStack_189d0 = (fdb_kvs_handle *)0x10fff8;
      sprintf((char *)ptr_fhandle,"key%04d",(ulong)pfVar11 & 0xffffffff);
      pfStack_189d0 = (fdb_kvs_handle *)0x110000;
      sVar8 = strlen((char *)ptr_fhandle);
      pfStack_189d0 = (fdb_kvs_handle *)0x11001f;
      fdb_doc_create((fdb_doc **)pfVar16,ptr_fhandle,sVar8 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_189d0 = (fdb_kvs_handle *)0x11002e;
      fVar5 = fdb_get((fdb_kvs_handle *)auStack_189b8,(fdb_doc *)auStack_189a8._0_8_);
      doc._M_i = auStack_189a8._0_8_;
      if (fVar5 != FDB_RESULT_SUCCESS) {
LAB_0011089e:
        pfStack_189d0 = (fdb_kvs_handle *)0x1108a3;
        compaction_daemon_test();
        goto LAB_001108a3;
      }
      pfVar9 = (fdb_kvs_handle *)
               ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_189a8._0_8_ + 0x40))->
               seqtree;
      pcVar27 = *(char **)(*(long *)(&afStack_184d8[0].kvs_config.create_if_missing +
                                    (long)pfVar11 * 8) + 0x40);
      pfStack_189d0 = (fdb_kvs_handle *)0x11005a;
      iVar6 = bcmp(pfVar9,pcVar27,(size_t)*(void **)(auStack_189a8._0_8_ + 0x10));
      _Var33._M_i = doc._M_i;
      if (iVar6 != 0) {
        pfStack_189d0 = (fdb_kvs_handle *)0x11089e;
        compaction_daemon_test();
        goto LAB_0011089e;
      }
      pfStack_189d0 = (fdb_kvs_handle *)0x11006a;
      fdb_doc_free((fdb_doc *)doc._M_i);
      pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
    } while (pfVar11 != (fdb_kvs_handle *)0x2710);
    pfStack_189d0 = (fdb_kvs_handle *)0x11008e;
    pcVar7 = (char *)auStack_189b8;
    fVar5 = fdb_snapshot_open((fdb_kvs_handle *)auStack_189b8,(fdb_kvs_handle **)&aStack_18970,10000
                             );
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001108dc;
    pfStack_189d0 = (fdb_kvs_handle *)0x1100a0;
    fdb_kvs_close((fdb_kvs_handle *)aStack_18970.super___atomic_base<unsigned_long>._M_i);
    pcVar27 = auStack_189c0;
    pfStack_189d0 = (fdb_kvs_handle *)0x1100ad;
    fdb_close((fdb_file_handle *)auStack_189c0);
    pfStack_189d0 = (fdb_kvs_handle *)0x1100b9;
    system("rm -rf  compact_test.meta > errorlog.txt");
    pfStack_189d0 = (fdb_kvs_handle *)0x1100d0;
    pcVar7 = pcVar27;
    fVar5 = fdb_open((fdb_file_handle **)pcVar27,"compact_test",(fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001108e1;
    pfStack_189d0 = (fdb_kvs_handle *)0x1100ec;
    pcVar7 = (char *)auStack_189c0;
    fVar5 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_189c0,(fdb_kvs_handle **)auStack_189b8,
                       &fStack_18988);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001108e6;
    pfStack_189d0 = (fdb_kvs_handle *)0x11010c;
    pcVar7 = (char *)auStack_189b8;
    fVar5 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_189b8,logCallbackFunc,"compaction_daemon_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001108eb;
    ptr_fhandle = (filemgr *)(auStack_18820 + 0x48);
    pfVar16 = (fdb_kvs_handle *)auStack_189a8;
    pfVar11 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_189d0 = (fdb_kvs_handle *)0x110138;
      sprintf((char *)ptr_fhandle,"key%04d",(ulong)pfVar11 & 0xffffffff);
      pfStack_189d0 = (fdb_kvs_handle *)0x110140;
      sVar8 = strlen((char *)ptr_fhandle);
      pfStack_189d0 = (fdb_kvs_handle *)0x11015f;
      fdb_doc_create((fdb_doc **)pfVar16,ptr_fhandle,sVar8 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_189d0 = (fdb_kvs_handle *)0x11016e;
      fVar5 = fdb_get((fdb_kvs_handle *)auStack_189b8,(fdb_doc *)auStack_189a8._0_8_);
      _Var33._M_i = auStack_189a8._0_8_;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001108ae;
      pfVar9 = (fdb_kvs_handle *)
               ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_189a8._0_8_ + 0x40))->
               seqtree;
      pcVar27 = *(char **)(*(long *)(&afStack_184d8[0].kvs_config.create_if_missing +
                                    (long)pfVar11 * 8) + 0x40);
      pfStack_189d0 = (fdb_kvs_handle *)0x11019a;
      iVar6 = bcmp(pfVar9,pcVar27,(size_t)*(void **)(auStack_189a8._0_8_ + 0x10));
      if (iVar6 != 0) goto LAB_001108a3;
      pfStack_189d0 = (fdb_kvs_handle *)0x1101aa;
      fdb_doc_free((fdb_doc *)_Var33._M_i);
      pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
      doc._M_i = _Var33._M_i;
    } while (pfVar11 != (fdb_kvs_handle *)0x2710);
    pcVar27 = auStack_189c0;
    pfStack_189d0 = (fdb_kvs_handle *)0x1101c7;
    fdb_close((fdb_file_handle *)auStack_189c0);
    pfStack_189d0 = (fdb_kvs_handle *)0x1101d3;
    system("mv  compact_test.0 compact_test.23 > errorlog.txt");
    pfStack_189d0 = (fdb_kvs_handle *)0x1101ea;
    pcVar7 = pcVar27;
    fVar5 = fdb_open((fdb_file_handle **)pcVar27,"compact_test",(fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001108f0;
    pfStack_189d0 = (fdb_kvs_handle *)0x110206;
    pcVar7 = (char *)auStack_189c0;
    fVar5 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_189c0,(fdb_kvs_handle **)auStack_189b8,
                       &fStack_18988);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001108f5;
    pfStack_189d0 = (fdb_kvs_handle *)0x110226;
    pcVar7 = (char *)auStack_189b8;
    fVar5 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_189b8,logCallbackFunc,"compaction_daemon_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001108fa;
    ptr_fhandle = (filemgr *)(auStack_18820 + 0x48);
    pfVar16 = (fdb_kvs_handle *)auStack_189a8;
    pfVar11 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_189d0 = (fdb_kvs_handle *)0x110252;
      sprintf((char *)ptr_fhandle,"key%04d",(ulong)pfVar11 & 0xffffffff);
      pfStack_189d0 = (fdb_kvs_handle *)0x11025a;
      sVar8 = strlen((char *)ptr_fhandle);
      pfStack_189d0 = (fdb_kvs_handle *)0x110279;
      fdb_doc_create((fdb_doc **)pfVar16,ptr_fhandle,sVar8 + 1,(void *)0x0,0,(void *)0x0,0);
      pfStack_189d0 = (fdb_kvs_handle *)0x110288;
      pcVar7 = (char *)auStack_189b8;
      fVar5 = fdb_get((fdb_kvs_handle *)auStack_189b8,(fdb_doc *)auStack_189a8._0_8_);
      _Var33._M_i = auStack_189a8._0_8_;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001108be;
      pfVar9 = (fdb_kvs_handle *)
               ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_189a8._0_8_ + 0x40))->
               seqtree;
      pcVar27 = *(char **)(*(long *)(&afStack_184d8[0].kvs_config.create_if_missing +
                                    (long)pfVar11 * 8) + 0x40);
      pfStack_189d0 = (fdb_kvs_handle *)0x1102b4;
      iVar6 = bcmp(pfVar9,pcVar27,(size_t)*(void **)(auStack_189a8._0_8_ + 0x10));
      if (iVar6 != 0) goto LAB_001108b3;
      pfStack_189d0 = (fdb_kvs_handle *)0x1102c4;
      fdb_doc_free((fdb_doc *)_Var33._M_i);
      pfVar11 = (fdb_kvs_handle *)&(pfVar11->kvs_config).field_0x1;
      doc._M_i = _Var33._M_i;
    } while (pfVar11 != (fdb_kvs_handle *)0x2710);
    pfStack_189d0 = (fdb_kvs_handle *)0x1102de;
    fdb_close((fdb_file_handle *)auStack_189c0);
    pcVar7 = auStack_18998;
    pfStack_189d0 = (fdb_kvs_handle *)0x1102f7;
    fVar5 = fdb_open((fdb_file_handle **)pcVar7,"compact_test_less",(fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001108ff;
    pfStack_189d0 = (fdb_kvs_handle *)0x110313;
    pcVar7 = (char *)auStack_18998._0_8_;
    fVar5 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_18998._0_8_,
                       (fdb_kvs_handle **)&aStack_18958.seqtree,&fStack_18988);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110904;
    uStack_1890a = uStack_1890a & 0xff;
    pcVar7 = auStack_189a8 + 8;
    pfStack_189d0 = (fdb_kvs_handle *)0x110338;
    fVar5 = fdb_open((fdb_file_handle **)pcVar7,"compact_test_non",(fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110909;
    pfStack_189d0 = (fdb_kvs_handle *)0x110354;
    pcVar7 = (char *)auStack_189a8._8_8_;
    fVar5 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_189a8._8_8_,(fdb_kvs_handle **)&_Stack_18960,
                       &fStack_18988);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011090e;
    uStack_1890a = uStack_1890a & 0xff00;
    pcVar7 = auStack_189b0;
    pfStack_189d0 = (fdb_kvs_handle *)0x110379;
    fVar5 = fdb_open((fdb_file_handle **)pcVar7,"compact_test_manual",(fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110913;
    pfStack_189d0 = (fdb_kvs_handle *)0x110395;
    pcVar7 = (char *)auStack_189b0;
    fVar5 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_189b0,(fdb_kvs_handle **)&aStack_18968.seqtree,
                       &fStack_18988);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110918;
    uStack_1890a = 0x1e01;
    pcVar7 = auStack_189c0;
    pfStack_189d0 = (fdb_kvs_handle *)0x1103bc;
    fVar5 = fdb_open((fdb_file_handle **)pcVar7,"compact_test",(fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011091d;
    pfStack_189d0 = (fdb_kvs_handle *)0x1103d8;
    pcVar7 = (char *)auStack_189c0;
    fVar5 = fdb_kvs_open_default
                      ((fdb_file_handle *)auStack_189c0,(fdb_kvs_handle **)auStack_189b8,
                       &fStack_18988);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110922;
    pfStack_189d0 = (fdb_kvs_handle *)0x1103f8;
    pcVar7 = (char *)auStack_189b8;
    fVar5 = fdb_set_log_callback
                      ((fdb_kvs_handle *)auStack_189b8,logCallbackFunc,"compaction_daemon_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110927;
    _Var33._M_i = 0;
    pfStack_189d0 = (fdb_kvs_handle *)0x110416;
    printf("wait for %d seconds..\n");
    pcVar27 = auStack_18840;
    pfStack_189d0 = (fdb_kvs_handle *)0x110428;
    gettimeofday((timeval *)pcVar27,(__timezone_ptr_t)0x0);
    tVar40.tv_usec = auStack_18840._8_8_;
    tVar40.tv_sec = auStack_18840._0_8_;
    pfVar11 = (fdb_kvs_handle *)auStack_18948;
    while( true ) {
      pfStack_189d0 = (fdb_kvs_handle *)0x110449;
      fdb_set((fdb_kvs_handle *)auStack_189b8,
              *(fdb_doc **)(&afStack_184d8[0].kvs_config.create_if_missing + _Var33._M_i * 8));
      pfStack_189d0 = (fdb_kvs_handle *)0x110455;
      fdb_commit((fdb_file_handle *)auStack_189c0,'\0');
      if ((ushort)((ushort)((short)_Var33._M_i * 0x5c29) >> 2 | (short)_Var33._M_i * 0x4000) < 0x290
         ) {
        pfStack_189d0 = (fdb_kvs_handle *)0x11047c;
        fdb_set((fdb_kvs_handle *)aStack_18958.seqtree,
                *(fdb_doc **)(&afStack_184d8[0].kvs_config.create_if_missing + _Var33._M_i * 8));
        pfStack_189d0 = (fdb_kvs_handle *)0x110488;
        fdb_commit((fdb_file_handle *)auStack_18998._0_8_,'\0');
      }
      pfStack_189d0 = (fdb_kvs_handle *)0x11049a;
      fdb_set((fdb_kvs_handle *)_Stack_18960._M_i,
              *(fdb_doc **)(&afStack_184d8[0].kvs_config.create_if_missing + _Var33._M_i * 8));
      pfStack_189d0 = (fdb_kvs_handle *)0x1104a6;
      fdb_commit((fdb_file_handle *)auStack_189a8._8_8_,'\0');
      pfStack_189d0 = (fdb_kvs_handle *)0x1104b8;
      fdb_set((fdb_kvs_handle *)aStack_18968.seqtree,
              *(fdb_doc **)(&afStack_184d8[0].kvs_config.create_if_missing + _Var33._M_i * 8));
      pfStack_189d0 = (fdb_kvs_handle *)0x1104c4;
      fdb_commit((fdb_file_handle *)auStack_189b0,'\0');
      pfStack_189d0 = (fdb_kvs_handle *)0x1104ce;
      gettimeofday((timeval *)pfVar11,(__timezone_ptr_t)0x0);
      pfStack_189d0 = (fdb_kvs_handle *)0x1104e9;
      tVar39 = _utime_gap(tVar40,(timeval)auStack_18948);
      if ((ulong)auStack_18998._8_8_ <= (fdb_kvs_handle *)tVar39.tv_sec) break;
      _Var33._M_i = (__int_type_conflict)&(((fdb_kvs_handle *)_Var33._M_i)->kvs_config).field_0x1;
      if ((undefined1 *)_Var33._M_i == (undefined1 *)0x2710) {
        _Var33._M_i = 0;
      }
    }
    pfStack_189d0 = (fdb_kvs_handle *)0x110517;
    pcVar7 = (char *)auStack_189c0;
    fVar5 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_189c0,0x3c);
    ptr_fhandle = (filemgr *)auStack_18840._0_8_;
    pfVar16 = (fdb_kvs_handle *)auStack_18840._8_8_;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011092c;
    pfStack_189d0 = (fdb_kvs_handle *)0x11052e;
    pcVar7 = (char *)auStack_189c0;
    fVar5 = fdb_set_daemon_compaction_interval((fdb_file_handle *)auStack_189c0,1);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110931;
    pfStack_189d0 = (fdb_kvs_handle *)0x110542;
    pcVar7 = (char *)auStack_189a8._8_8_;
    fVar5 = fdb_compact((fdb_file_handle *)auStack_189a8._8_8_,(char *)0x0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110936;
    pfStack_189d0 = (fdb_kvs_handle *)0x11055b;
    pcVar7 = (char *)auStack_189b0;
    fVar5 = fdb_compact((fdb_file_handle *)auStack_189b0,"compact_test_manual_compacted");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011093b;
    uStack_1890a = uStack_1890a & 0xff00;
    pcVar7 = auStack_18950;
    pfStack_189d0 = (fdb_kvs_handle *)0x110580;
    fVar5 = fdb_open((fdb_file_handle **)pcVar7,"compact_test_manual_compacted",
                     (fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110940;
    pfStack_189d0 = (fdb_kvs_handle *)0x11059c;
    pcVar7 = (char *)auStack_189b0;
    fVar5 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_189b0,'\x01',0x1e);
    if (fVar5 != FDB_RESULT_FILE_IS_BUSY) goto LAB_00110945;
    pfStack_189d0 = (fdb_kvs_handle *)0x1105af;
    fVar5 = fdb_close((fdb_file_handle *)auStack_18950);
    pcVar7 = (char *)auStack_18950;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011094a;
    pfStack_189d0 = (fdb_kvs_handle *)0x1105cb;
    pcVar7 = (char *)auStack_189b0;
    fVar5 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_189b0,'\x01',10);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011094f;
    pfStack_189d0 = (fdb_kvs_handle *)0x1105e7;
    pcVar7 = (char *)auStack_189b0;
    fVar5 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_189b0,'\x01',0x1e);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110954;
    pfStack_189d0 = (fdb_kvs_handle *)0x1105f9;
    pcVar7 = (char *)auStack_189b0;
    fVar5 = fdb_close((fdb_file_handle *)auStack_189b0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110959;
    uStack_1890a = CONCAT11(uStack_1890a._1_1_,1);
    pcVar7 = auStack_189b0;
    pfStack_189d0 = (fdb_kvs_handle *)0x11061e;
    fVar5 = fdb_open((fdb_file_handle **)pcVar7,"compact_test_manual_compacted",
                     (fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011095e;
    pfStack_189d0 = (fdb_kvs_handle *)0x110634;
    pcVar7 = (char *)auStack_189a8._8_8_;
    fVar5 = fdb_switch_compaction_mode((fdb_file_handle *)auStack_189a8._8_8_,'\0',0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110963;
    pfStack_189d0 = (fdb_kvs_handle *)0x110646;
    pcVar7 = (char *)auStack_189a8._8_8_;
    fVar5 = fdb_close((fdb_file_handle *)auStack_189a8._8_8_);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110968;
    uStack_1890a = uStack_1890a & 0xff00;
    pcVar7 = auStack_189a8 + 8;
    pfStack_189d0 = (fdb_kvs_handle *)0x11066b;
    fVar5 = fdb_open((fdb_file_handle **)pcVar7,"compact_test_non",(fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011096d;
    pcVar27 = "compact_test_non.manual";
    pfStack_189d0 = (fdb_kvs_handle *)0x110687;
    fdb_compact((fdb_file_handle *)auStack_189a8._8_8_,"compact_test_non.manual");
    ptr_fhandle = (filemgr *)auStack_189c0;
    pfStack_189d0 = (fdb_kvs_handle *)0x110694;
    fdb_close((fdb_file_handle *)auStack_189c0);
    pfStack_189d0 = (fdb_kvs_handle *)0x11069e;
    fdb_close((fdb_file_handle *)auStack_18998._0_8_);
    pfStack_189d0 = (fdb_kvs_handle *)0x1106a8;
    fdb_close((fdb_file_handle *)auStack_189b0);
    uStack_1890a = CONCAT11(uStack_1890a._1_1_,1);
    pfStack_189d0 = (fdb_kvs_handle *)0x1106bf;
    pcVar7 = (char *)ptr_fhandle;
    fVar5 = fdb_open((fdb_file_handle **)ptr_fhandle,"compact_test_non.manual",
                     (fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110972;
    pcVar7 = "compact_test_non.manual";
    pfStack_189d0 = (fdb_kvs_handle *)0x1106dc;
    fVar5 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110977;
    uStack_1890a = uStack_1890a & 0xff00;
    pcVar7 = auStack_189c0;
    pfStack_189d0 = (fdb_kvs_handle *)0x110702;
    fVar5 = fdb_open((fdb_file_handle **)pcVar7,"compact_test_manual_compacted",
                     (fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_0011097c;
    pcVar7 = "compact_test_manual_compacted";
    pfStack_189d0 = (fdb_kvs_handle *)0x11071f;
    fVar5 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_INVALID_COMPACTION_MODE) goto LAB_00110981;
    uStack_1890a = CONCAT11(uStack_1890a._1_1_,1);
    pcVar7 = "compact_test_manual_compacted";
    pfStack_189d0 = (fdb_kvs_handle *)0x110740;
    fVar5 = fdb_destroy("compact_test_manual_compacted",(fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110986;
    uStack_1890a = uStack_1890a & 0xff00;
    pcVar7 = "compact_test_non.manual";
    pfStack_189d0 = (fdb_kvs_handle *)0x110760;
    fVar5 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_FILE_IS_BUSY) goto LAB_0011098b;
    pfStack_189d0 = (fdb_kvs_handle *)0x110773;
    fdb_close((fdb_file_handle *)auStack_189a8._8_8_);
    pfStack_189d0 = (fdb_kvs_handle *)0x110778;
    fVar5 = fdb_shutdown();
    pcVar7 = (char *)auStack_189a8._8_8_;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110990;
    pcVar7 = "compact_test_non.manual";
    pfStack_189d0 = (fdb_kvs_handle *)0x110794;
    fVar5 = fdb_destroy("compact_test_non.manual",(fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110995;
    fStack_18914 = 2;
    pcVar7 = auStack_189c0;
    pfStack_189d0 = (fdb_kvs_handle *)0x1107bc;
    fVar5 = fdb_open((fdb_file_handle **)pcVar7,"./compact_test_manual_compacted",
                     (fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_NO_SUCH_FILE) goto LAB_0011099a;
    pcVar7 = auStack_189c0;
    pfStack_189d0 = (fdb_kvs_handle *)0x1107de;
    fVar5 = fdb_open((fdb_file_handle **)pcVar7,"./compact_test_manual_compacted.meta",
                     (fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_NO_SUCH_FILE) goto LAB_0011099f;
    pcVar7 = auStack_189c0;
    pfStack_189d0 = (fdb_kvs_handle *)0x110800;
    fVar5 = fdb_open((fdb_file_handle **)pcVar7,"compact_test_non",(fdb_config *)auStack_18938);
    if (fVar5 != FDB_RESULT_NO_SUCH_FILE) goto LAB_001109a4;
    pcVar7 = auStack_189c0;
    pfStack_189d0 = (fdb_kvs_handle *)0x110822;
    fVar5 = fdb_open((fdb_file_handle **)pcVar7,"compact_test_non.manual",
                     (fdb_config *)auStack_18938);
    if (fVar5 == FDB_RESULT_NO_SUCH_FILE) {
      lVar20 = 0;
      do {
        pfStack_189d0 = (fdb_kvs_handle *)0x11083a;
        fdb_doc_free(*(fdb_doc **)(&afStack_184d8[0].kvs_config.create_if_missing + lVar20 * 8));
        lVar20 = lVar20 + 1;
      } while (lVar20 != 10000);
      pfStack_189d0 = (fdb_kvs_handle *)0x11084b;
      fdb_shutdown();
      pfStack_189d0 = (fdb_kvs_handle *)0x110850;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (compaction_daemon_test(unsigned_long)::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      pfStack_189d0 = (fdb_kvs_handle *)0x110881;
      fprintf(_stderr,pcVar27,"compaction daemon test");
      return;
    }
  }
  else {
LAB_001108c3:
    pfStack_189d0 = (fdb_kvs_handle *)0x1108c8;
    compaction_daemon_test();
LAB_001108c8:
    pfStack_189d0 = (fdb_kvs_handle *)0x1108cd;
    compaction_daemon_test();
LAB_001108cd:
    pfStack_189d0 = (fdb_kvs_handle *)0x1108d2;
    compaction_daemon_test();
LAB_001108d2:
    pfStack_189d0 = (fdb_kvs_handle *)0x1108d7;
    compaction_daemon_test();
LAB_001108d7:
    pfStack_189d0 = (fdb_kvs_handle *)0x1108dc;
    compaction_daemon_test();
LAB_001108dc:
    pfStack_189d0 = (fdb_kvs_handle *)0x1108e1;
    compaction_daemon_test();
LAB_001108e1:
    pfStack_189d0 = (fdb_kvs_handle *)0x1108e6;
    compaction_daemon_test();
LAB_001108e6:
    pfStack_189d0 = (fdb_kvs_handle *)0x1108eb;
    compaction_daemon_test();
    _Var33._M_i = doc._M_i;
LAB_001108eb:
    pfStack_189d0 = (fdb_kvs_handle *)0x1108f0;
    compaction_daemon_test();
LAB_001108f0:
    pfStack_189d0 = (fdb_kvs_handle *)0x1108f5;
    compaction_daemon_test();
LAB_001108f5:
    pfStack_189d0 = (fdb_kvs_handle *)0x1108fa;
    compaction_daemon_test();
LAB_001108fa:
    pfStack_189d0 = (fdb_kvs_handle *)0x1108ff;
    compaction_daemon_test();
LAB_001108ff:
    pfStack_189d0 = (fdb_kvs_handle *)0x110904;
    compaction_daemon_test();
LAB_00110904:
    pfStack_189d0 = (fdb_kvs_handle *)0x110909;
    compaction_daemon_test();
LAB_00110909:
    pfStack_189d0 = (fdb_kvs_handle *)0x11090e;
    compaction_daemon_test();
LAB_0011090e:
    pfStack_189d0 = (fdb_kvs_handle *)0x110913;
    compaction_daemon_test();
LAB_00110913:
    pfStack_189d0 = (fdb_kvs_handle *)0x110918;
    compaction_daemon_test();
LAB_00110918:
    pfStack_189d0 = (fdb_kvs_handle *)0x11091d;
    compaction_daemon_test();
LAB_0011091d:
    pfStack_189d0 = (fdb_kvs_handle *)0x110922;
    compaction_daemon_test();
LAB_00110922:
    pfStack_189d0 = (fdb_kvs_handle *)0x110927;
    compaction_daemon_test();
LAB_00110927:
    pfStack_189d0 = (fdb_kvs_handle *)0x11092c;
    compaction_daemon_test();
LAB_0011092c:
    pfStack_189d0 = (fdb_kvs_handle *)0x110931;
    compaction_daemon_test();
LAB_00110931:
    pfStack_189d0 = (fdb_kvs_handle *)0x110936;
    compaction_daemon_test();
LAB_00110936:
    pfStack_189d0 = (fdb_kvs_handle *)0x11093b;
    compaction_daemon_test();
LAB_0011093b:
    pfStack_189d0 = (fdb_kvs_handle *)0x110940;
    compaction_daemon_test();
LAB_00110940:
    pfStack_189d0 = (fdb_kvs_handle *)0x110945;
    compaction_daemon_test();
LAB_00110945:
    pfStack_189d0 = (fdb_kvs_handle *)0x11094a;
    compaction_daemon_test();
LAB_0011094a:
    pfStack_189d0 = (fdb_kvs_handle *)0x11094f;
    compaction_daemon_test();
LAB_0011094f:
    pfStack_189d0 = (fdb_kvs_handle *)0x110954;
    compaction_daemon_test();
LAB_00110954:
    pfStack_189d0 = (fdb_kvs_handle *)0x110959;
    compaction_daemon_test();
LAB_00110959:
    pfStack_189d0 = (fdb_kvs_handle *)0x11095e;
    compaction_daemon_test();
LAB_0011095e:
    pfStack_189d0 = (fdb_kvs_handle *)0x110963;
    compaction_daemon_test();
LAB_00110963:
    pfStack_189d0 = (fdb_kvs_handle *)0x110968;
    compaction_daemon_test();
LAB_00110968:
    pfStack_189d0 = (fdb_kvs_handle *)0x11096d;
    compaction_daemon_test();
LAB_0011096d:
    pfStack_189d0 = (fdb_kvs_handle *)0x110972;
    compaction_daemon_test();
LAB_00110972:
    pfStack_189d0 = (fdb_kvs_handle *)0x110977;
    compaction_daemon_test();
LAB_00110977:
    pfStack_189d0 = (fdb_kvs_handle *)0x11097c;
    compaction_daemon_test();
LAB_0011097c:
    pfStack_189d0 = (fdb_kvs_handle *)0x110981;
    compaction_daemon_test();
LAB_00110981:
    pfStack_189d0 = (fdb_kvs_handle *)0x110986;
    compaction_daemon_test();
LAB_00110986:
    pfStack_189d0 = (fdb_kvs_handle *)0x11098b;
    compaction_daemon_test();
LAB_0011098b:
    pfStack_189d0 = (fdb_kvs_handle *)0x110990;
    compaction_daemon_test();
LAB_00110990:
    pfStack_189d0 = (fdb_kvs_handle *)0x110995;
    compaction_daemon_test();
LAB_00110995:
    pfStack_189d0 = (fdb_kvs_handle *)0x11099a;
    compaction_daemon_test();
LAB_0011099a:
    pfStack_189d0 = (fdb_kvs_handle *)0x11099f;
    compaction_daemon_test();
LAB_0011099f:
    pfStack_189d0 = (fdb_kvs_handle *)0x1109a4;
    compaction_daemon_test();
LAB_001109a4:
    pfStack_189d0 = (fdb_kvs_handle *)0x1109a9;
    compaction_daemon_test();
  }
  pfStack_189d0 = (fdb_kvs_handle *)auto_compaction_with_concurrent_insert_test;
  compaction_daemon_test();
  pfStack_18b68 = (fdb_kvs_handle *)0x1109ce;
  pfStack_189f8 = (filemgr *)pcVar27;
  pfStack_189f0 = pfVar11;
  pfStack_189e8 = (fdb_kvs_handle *)_Var33._M_i;
  pfStack_189e0 = ptr_fhandle;
  pfStack_189d8 = pfVar16;
  pfStack_189d0 = pfVar9;
  gettimeofday(&tStack_18b18,(__timezone_ptr_t)0x0);
  pfStack_18b68 = (fdb_kvs_handle *)0x1109d3;
  memleak_start();
  pfStack_18b68 = (fdb_kvs_handle *)0x1109df;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_18b68 = (fdb_kvs_handle *)0x1109ec;
  fdb_get_default_config();
  uStack_18ac2 = 1;
  uStack_18ab8._0_2_ = 1;
  uStack_18ab8._2_2_ = 0;
  uStack_18ab8._4_4_ = 0;
  pfStack_18b68 = (fdb_kvs_handle *)0x110a0d;
  fVar5 = fdb_open(&pfStack_18b58,"compact_test",(fdb_config *)(auStack_18b08 + 0x18));
  pfVar34 = (fdb_config *)(auStack_18b08 + 0x18);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfVar34 = (fdb_config *)auStack_18b08;
    pfStack_18b68 = (fdb_kvs_handle *)0x110a22;
    fdb_get_default_kvs_config();
    pfStack_18b68 = (fdb_kvs_handle *)0x110a34;
    fVar5 = fdb_kvs_open_default(pfStack_18b58,&pfStack_18b50,(fdb_kvs_config *)pfVar34);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110b65;
    pfStack_18b68 = (fdb_kvs_handle *)0x110a4b;
    gettimeofday(&tStack_18b28,(__timezone_ptr_t)0x0);
    pfStack_18b68 = (fdb_kvs_handle *)0x110a5b;
    printf("wait for %d seconds..\n",(ulong)pcVar7 & 0xffffffff);
    tVar39.tv_usec = tStack_18b28.tv_usec;
    tVar39.tv_sec = tStack_18b28.tv_sec;
    _Var33._M_i = (long)&atStack_18b48[1].tv_sec + 1;
    pfVar9 = (fdb_kvs_handle *)0x0;
    do {
      iVar6 = (int)pfVar9;
      pfStack_18b68 = (fdb_kvs_handle *)0x110a7c;
      sprintf((char *)_Var33._M_i,"%d",pfVar9);
      pfVar11 = pfStack_18b50;
      pfStack_18b68 = (fdb_kvs_handle *)0x110a89;
      sVar8 = strlen((char *)_Var33._M_i);
      pfStack_18b68 = (fdb_kvs_handle *)0x110aa4;
      fVar5 = fdb_set_kv(pfVar11,(void *)_Var33._M_i,sVar8,"value",5);
      pfVar34 = (fdb_config *)tStack_18b28.tv_sec;
      pfVar16 = (fdb_kvs_handle *)tStack_18b28.tv_usec;
      if (fVar5 != FDB_RESULT_SUCCESS) {
LAB_00110b5b:
        pfStack_18b68 = (fdb_kvs_handle *)0x110b60;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110b60;
      }
      pfStack_18b68 = (fdb_kvs_handle *)0x110ab8;
      fVar5 = fdb_commit(pfStack_18b58,'\0');
      if (fVar5 != FDB_RESULT_SUCCESS) {
        pfStack_18b68 = (fdb_kvs_handle *)0x110b5b;
        auto_compaction_with_concurrent_insert_test();
        goto LAB_00110b5b;
      }
      pfStack_18b68 = (fdb_kvs_handle *)0x110acc;
      gettimeofday((timeval *)atStack_18b48,(__timezone_ptr_t)0x0);
      pfStack_18b68 = (fdb_kvs_handle *)0x110ae1;
      tVar40 = _utime_gap(tVar39,atStack_18b48[0]);
    } while (((filemgr *)tVar40.tv_sec < pcVar7) &&
            (pfVar9 = (fdb_kvs_handle *)(ulong)(iVar6 + 1), iVar6 != 99999));
    pfStack_18b68 = (fdb_kvs_handle *)0x110b01;
    fVar5 = fdb_close(pfStack_18b58);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110b6a;
    pfStack_18b68 = (fdb_kvs_handle *)0x110b0a;
    fVar5 = fdb_shutdown();
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_18b68 = (fdb_kvs_handle *)0x110b13;
      memleak_end();
      pcVar27 = "%s PASSED\n";
      if (auto_compaction_with_concurrent_insert_test(unsigned_long)::__test_pass != '\0') {
        pcVar27 = "%s FAILED\n";
      }
      pfStack_18b68 = (fdb_kvs_handle *)0x110b44;
      fprintf(_stderr,pcVar27,"auto compaction with concurrent insert test");
      return;
    }
  }
  else {
LAB_00110b60:
    pfStack_18b68 = (fdb_kvs_handle *)0x110b65;
    auto_compaction_with_concurrent_insert_test();
LAB_00110b65:
    pfStack_18b68 = (fdb_kvs_handle *)0x110b6a;
    auto_compaction_with_concurrent_insert_test();
LAB_00110b6a:
    pfStack_18b68 = (fdb_kvs_handle *)0x110b6f;
    auto_compaction_with_concurrent_insert_test();
  }
  pfStack_18b68 = (fdb_kvs_handle *)auto_compaction_with_custom_cmp_function;
  auto_compaction_with_concurrent_insert_test();
  pfStack_18b90 = (filemgr *)pcVar7;
  pfStack_18b88 = pfVar11;
  pfStack_18b80 = (fdb_kvs_handle *)_Var33._M_i;
  pfStack_18b78 = pfVar34;
  pfStack_18b70 = pfVar16;
  pfStack_18b68 = pfVar9;
  gettimeofday(&tStack_18e98,(__timezone_ptr_t)0x0);
  memleak_start();
  auStack_18f08._32_8_ = (btree *)0x0;
  auStack_18f08._24_8_ = _compact_test_keycmp;
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fStack_18c88.wal_threshold = 0x1000;
  fStack_18c88.compaction_mode = '\x01';
  fStack_18c88.compaction_threshold = '\n';
  fStack_18c88.compactor_sleep_duration = 1;
  info = (fdb_file_info *)0x14d0c5;
  pfVar9 = (fdb_kvs_handle *)&pfStack_18f28;
  kvs_config_01 = (fdb_file_info *)0x1;
  fVar5 = fdb_open_custom_cmp((fdb_file_handle **)pfVar9,"compact_test",&fStack_18c88,1,
                              (char **)(auStack_18f08 + 0x20),
                              (fdb_custom_cmp_variable *)(auStack_18f08 + 0x18),(void **)0x0);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    fdb_get_default_kvs_config();
    auStack_18f08._16_8_ = afStack_18e88[0].doc_count;
    auStack_18f08._0_8_ = afStack_18e88[0].filename;
    auStack_18f08._8_8_ = afStack_18e88[0].new_filename;
    info = (fdb_file_info *)auStack_18f20;
    pfVar9 = pfStack_18f28;
    fVar5 = fdb_kvs_open_default
                      ((fdb_file_handle *)pfStack_18f28,(fdb_kvs_handle **)info,
                       (fdb_kvs_config *)auStack_18f08);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110f6c;
    info = (fdb_file_info *)auStack_18f10;
    kvs_config_01 = (fdb_file_info *)auStack_18f08;
    pfVar9 = pfStack_18f28;
    fVar5 = fdb_kvs_open((fdb_file_handle *)pfStack_18f28,(fdb_kvs_handle **)info,"db",
                         (fdb_kvs_config *)kvs_config_01);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110f71;
    uVar19 = 0;
    do {
      sprintf((char *)afStack_18e88,"key%06d",uVar19);
      sprintf((char *)afStack_18d88,"body%06d",uVar19);
      pfVar9 = (fdb_kvs_handle *)auStack_18f20._0_8_;
      sVar8 = strlen((char *)afStack_18e88);
      sVar10 = strlen((char *)afStack_18d88);
      kvs_config_01 = afStack_18d88;
      info = afStack_18e88;
      fVar5 = fdb_set_kv(pfVar9,afStack_18e88,sVar8,afStack_18d88,sVar10);
      handle = auStack_18f10;
      if (fVar5 != FDB_RESULT_SUCCESS) {
LAB_00110f53:
        auto_compaction_with_custom_cmp_function();
        goto LAB_00110f58;
      }
      sVar8 = strlen((char *)afStack_18e88);
      sVar10 = strlen((char *)afStack_18d88);
      kvs_config_01 = afStack_18d88;
      info = afStack_18e88;
      fVar5 = fdb_set_kv((fdb_kvs_handle *)handle,afStack_18e88,sVar8,afStack_18d88,sVar10);
      if (fVar5 != FDB_RESULT_SUCCESS) {
        auto_compaction_with_custom_cmp_function();
        pfVar9 = (fdb_kvs_handle *)handle;
        goto LAB_00110f53;
      }
      uVar24 = (int)uVar19 + 1;
      uVar19 = (ulong)uVar24;
    } while (uVar24 != 10000);
    kvs_config_01 = (fdb_file_info *)auStack_18f08;
    auStack_18f08._8_8_ = _compact_test_keycmp;
    info = (fdb_file_info *)(auStack_18f20 + 8);
    pfVar9 = pfStack_18f28;
    fVar5 = fdb_kvs_open((fdb_file_handle *)pfStack_18f28,(fdb_kvs_handle **)info,"db_custom",
                         (fdb_kvs_config *)kvs_config_01);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110f76;
    info = afStack_18e88;
    sprintf((char *)info,"key%06d",0);
    kvs_config_01 = afStack_18d88;
    sprintf((char *)kvs_config_01,"body%06d",0);
    sVar8 = strlen((char *)info);
    sVar10 = strlen((char *)kvs_config_01);
    fVar5 = fdb_set_kv((fdb_kvs_handle *)auStack_18f20._8_8_,info,sVar8,kvs_config_01,sVar10);
    pfVar9 = (fdb_kvs_handle *)auStack_18f20._8_8_;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110f7b;
    info = (fdb_file_info *)0x0;
    pfVar9 = pfStack_18f28;
    fVar5 = fdb_commit((fdb_file_handle *)pfStack_18f28,'\0');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110f80;
    uVar19 = 0;
    uVar35 = 0;
    do {
      sprintf((char *)afStack_18e88,"key%06d",uVar35);
      sprintf((char *)afStack_18d88,"body%06d",uVar35);
      pfVar9 = (fdb_kvs_handle *)auStack_18f20._0_8_;
      sVar8 = strlen((char *)afStack_18e88);
      sVar10 = strlen((char *)afStack_18d88);
      kvs_config_01 = afStack_18d88;
      info = afStack_18e88;
      fVar5 = fdb_set_kv(pfVar9,afStack_18e88,sVar8,afStack_18d88,sVar10);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110f5d;
      info = (fdb_file_info *)(auStack_18f08 + 0x28);
      pfVar9 = pfStack_18f28;
      fVar5 = fdb_get_file_info((fdb_file_handle *)pfStack_18f28,info);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110f58;
      if (uVar19 < uStack_18eb8) {
        uVar19 = uStack_18eb8;
      }
      uVar24 = (int)uVar35 + 1;
      uVar35 = (ulong)uVar24;
    } while (uVar24 != 10000);
    info = (fdb_file_info *)0x0;
    pfVar9 = pfStack_18f28;
    fVar5 = fdb_commit((fdb_file_handle *)pfStack_18f28,'\0');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110f85;
    info = (fdb_file_info *)(auStack_18f08 + 0x28);
    pfVar9 = pfStack_18f28;
    fVar5 = fdb_get_file_info((fdb_file_handle *)pfStack_18f28,info);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110f8a;
    if (uVar19 < uStack_18eb8) {
      uVar19 = uStack_18eb8;
    }
    printf("wait for daemon compaction completion... (max file size: %lu)\n",uVar19);
    do {
      sleep(1);
      info = (fdb_file_info *)(auStack_18f08 + 0x28);
      pfVar9 = pfStack_18f28;
      fVar5 = fdb_get_file_info((fdb_file_handle *)pfStack_18f28,
                                (fdb_file_info *)(auStack_18f08 + 0x28));
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110f62;
    } while (uVar19 <= uStack_18eb8);
    fVar5 = fdb_close((fdb_file_handle *)pfStack_18f28);
    pfVar9 = pfStack_18f28;
    if (fVar5 == FDB_RESULT_SUCCESS) {
      fVar5 = fdb_shutdown();
      pfVar9 = pfStack_18f28;
      if (fVar5 == FDB_RESULT_SUCCESS) {
        memleak_end();
        pcVar27 = "%s PASSED\n";
        if (auto_compaction_with_custom_cmp_function()::__test_pass != '\0') {
          pcVar27 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar27,"auto compaction with custom comparison function");
        return;
      }
      goto LAB_00110f94;
    }
  }
  else {
LAB_00110f67:
    auto_compaction_with_custom_cmp_function();
LAB_00110f6c:
    auto_compaction_with_custom_cmp_function();
LAB_00110f71:
    auto_compaction_with_custom_cmp_function();
LAB_00110f76:
    auto_compaction_with_custom_cmp_function();
LAB_00110f7b:
    auto_compaction_with_custom_cmp_function();
LAB_00110f80:
    auto_compaction_with_custom_cmp_function();
LAB_00110f85:
    auto_compaction_with_custom_cmp_function();
LAB_00110f8a:
    auto_compaction_with_custom_cmp_function();
  }
  auto_compaction_with_custom_cmp_function();
LAB_00110f94:
  auto_compaction_with_custom_cmp_function();
  if (info != kvs_config_01) {
    if (info < kvs_config_01) {
      kvs_config_01 = info;
    }
    memcmp(pfVar9,__s2,(size_t)kvs_config_01);
    return;
  }
  memcmp(pfVar9,__s2,(size_t)info);
  return;
}

Assistant:

void compaction_callback_test(bool multi_kv)
{
    TEST_INIT();
    memleak_start();

    int i, r;
    int n = 1000;
    char keybuf[256], bodybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status s;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    struct cb_args cb_args;

    memset(&cb_args, 0x0, sizeof(struct cb_args));
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_cb = compaction_cb;
    fconfig.compaction_cb_ctx = &cb_args;
    fconfig.compaction_cb_mask = FDB_CS_BEGIN |
                                 FDB_CS_MOVE_DOC |
                                 FDB_CS_FLUSH_WAL |
                                 FDB_CS_END;
    fconfig.multi_kv_instances = multi_kv;

    // remove all previous compact_test files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./compact_test1", &fconfig);
    if (multi_kv) {
        fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    } else {
        fdb_kvs_open_default(dbfile, &db, &kvs_config);
    }
    cb_args.handle = db;

    // write docs
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%04d", i);
        sprintf(bodybuf, "body%04d", i);
        s = fdb_set_kv(db, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }
    s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    s = fdb_compact(dbfile, "./compact_test2");
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    TEST_CHK(cb_args.n_moved_docs == n);
    TEST_CHK(cb_args.begin);
    TEST_CHK(cb_args.end);
    TEST_CHK(cb_args.wal_flush);
    fdb_close(dbfile);

    // open db without move doc
    memset(&cb_args, 0x0, sizeof(struct cb_args));
    fconfig.compaction_cb_mask = FDB_CS_BEGIN |
                                 FDB_CS_FLUSH_WAL |
                                 FDB_CS_END;
    fdb_open(&dbfile, "./compact_test2", &fconfig);

    if (multi_kv) {
        fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    } else {
        fdb_kvs_open_default(dbfile, &db, &kvs_config);
    }
    cb_args.handle = db;
    s = fdb_compact(dbfile, "./compact_test3");
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(cb_args.n_moved_docs == 0);
    TEST_CHK(cb_args.begin);
    TEST_CHK(cb_args.end);
    TEST_CHK(cb_args.wal_flush);
    fdb_close(dbfile);

    // open db without wal_flush
    memset(&cb_args, 0x0, sizeof(struct cb_args));
    fconfig.compaction_cb_mask = FDB_CS_BEGIN |
                                 FDB_CS_MOVE_DOC |
                                 FDB_CS_END;
    fdb_open(&dbfile, "./compact_test3", &fconfig);
    if (multi_kv) {
        fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    } else {
        fdb_kvs_open_default(dbfile, &db, &kvs_config);
    }
    cb_args.handle = db;
    s = fdb_compact(dbfile, "./compact_test4");
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(cb_args.n_moved_docs == n);
    TEST_CHK(cb_args.begin);
    TEST_CHK(cb_args.end);
    TEST_CHK(!cb_args.wal_flush);
    fdb_close(dbfile);

    // open db without begin/end
    memset(&cb_args, 0x0, sizeof(struct cb_args));
    fconfig.compaction_cb_mask = FDB_CS_MOVE_DOC |
                                 FDB_CS_FLUSH_WAL;
    fdb_open(&dbfile, "./compact_test4", &fconfig);
    if (multi_kv) {
        fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    } else {
        fdb_kvs_open_default(dbfile, &db, &kvs_config);
    }
    cb_args.handle = db;
    s = fdb_compact(dbfile, "./compact_test5");
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(cb_args.n_moved_docs == n);
    TEST_CHK(!cb_args.begin);
    TEST_CHK(!cb_args.end);
    TEST_CHK(cb_args.wal_flush);
    fdb_close(dbfile);

    // open db with batch move
    memset(&cb_args, 0x0, sizeof(struct cb_args));
    fconfig.compaction_cb_mask = FDB_CS_BATCH_MOVE;
    fdb_open(&dbfile, "./compact_test5", &fconfig);
    if (multi_kv) {
        fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    } else {
        fdb_kvs_open_default(dbfile, &db, &kvs_config);
    }
    cb_args.handle = db;
    s = fdb_compact(dbfile, "./compact_test6");
    TEST_CHK(s == FDB_RESULT_SUCCESS);
    TEST_CHK(cb_args.n_moved_docs == 0);
    TEST_CHK(cb_args.n_batch_move && cb_args.n_batch_move <= n);
    TEST_CHK(!cb_args.begin);
    TEST_CHK(!cb_args.end);
    TEST_CHK(!cb_args.wal_flush);
    fdb_close(dbfile);

    fdb_shutdown();

    memleak_end();
    if (multi_kv) {
        TEST_RESULT("compaction callback function multi kv mode test");
    } else {
        TEST_RESULT("compaction callback function single kv mode test");
    }
}